

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [28];
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  uint uVar9;
  Primitive PVar10;
  uint uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  long lVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  undefined1 auVar124 [12];
  undefined1 auVar125 [28];
  undefined1 auVar126 [28];
  undefined1 auVar127 [28];
  undefined8 uVar128;
  undefined8 uVar129;
  bool bVar130;
  int iVar131;
  long lVar132;
  uint uVar133;
  ulong uVar134;
  uint uVar135;
  byte bVar136;
  long lVar137;
  ulong uVar138;
  bool bVar139;
  float fVar140;
  float fVar141;
  float fVar158;
  float fVar160;
  vint4 bi_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar162;
  float fVar164;
  float fVar166;
  float fVar168;
  float fVar170;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar159;
  float fVar161;
  float fVar163;
  float fVar165;
  float fVar167;
  float fVar169;
  float fVar171;
  float fVar172;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  float fVar173;
  float fVar188;
  float fVar189;
  vint4 bi_2;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar191;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar190;
  undefined1 auVar187 [64];
  vint4 ai;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar201;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar202;
  float fVar214;
  float fVar216;
  vint4 bi;
  undefined1 auVar203 [16];
  float fVar217;
  undefined1 auVar204 [16];
  float fVar215;
  float fVar218;
  undefined1 auVar206 [16];
  undefined1 auVar205 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  float fVar223;
  float fVar237;
  float fVar238;
  vint4 ai_2;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar240;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar239;
  float fVar241;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar242;
  float fVar253;
  float fVar256;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar243;
  float fVar244;
  undefined1 auVar248 [16];
  float fVar254;
  float fVar255;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar263;
  float fVar269;
  float fVar270;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar271;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar272;
  float fVar273;
  undefined1 auVar268 [32];
  float fVar274;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar287;
  float fVar288;
  float fVar296;
  float fVar297;
  float fVar298;
  vint4 ai_1;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar299;
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  float fVar300;
  float fVar301;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  undefined1 auVar302 [16];
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar303 [32];
  float fVar313;
  float fVar318;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [64];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [64];
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar324 [32];
  undefined1 auVar333 [16];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  float fVar339;
  float fVar343;
  float fVar344;
  undefined1 auVar340 [16];
  float fVar345;
  float fVar346;
  float fVar347;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  float fVar348;
  float fVar349;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar350 [32];
  float fVar357;
  float fVar361;
  float fVar362;
  float fVar363;
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  float local_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  ulong local_920;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  uint local_8e0;
  undefined4 uStack_8dc;
  undefined1 local_800 [8];
  undefined8 uStack_7f8;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 *local_788;
  undefined1 (*local_780) [16];
  undefined1 (*local_778) [32];
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 auStack_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_670 [16];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined4 uStack_504;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  uint local_480;
  uint local_47c;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined1 local_420 [32];
  float local_400 [4];
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  RTCHitN local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar179 [24];
  
  PVar10 = prim[1];
  uVar134 = (ulong)(byte)PVar10;
  lVar100 = uVar134 * 0x19;
  fVar202 = *(float *)(prim + lVar100 + 0x12);
  auVar230 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar230 = vinsertps_avx(auVar230,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar231 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar231 = vinsertps_avx(auVar231,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar230 = vsubps_avx(auVar230,*(undefined1 (*) [16])(prim + lVar100 + 6));
  auVar174._0_4_ = fVar202 * auVar230._0_4_;
  auVar174._4_4_ = fVar202 * auVar230._4_4_;
  auVar174._8_4_ = fVar202 * auVar230._8_4_;
  auVar174._12_4_ = fVar202 * auVar230._12_4_;
  auVar245._0_4_ = fVar202 * auVar231._0_4_;
  auVar245._4_4_ = fVar202 * auVar231._4_4_;
  auVar245._8_4_ = fVar202 * auVar231._8_4_;
  auVar245._12_4_ = fVar202 * auVar231._12_4_;
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 4 + 6)));
  auVar231 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 5 + 6)));
  auVar230 = vcvtdq2ps_avx(auVar230);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 6 + 6)));
  auVar231 = vcvtdq2ps_avx(auVar231);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar10 * 0xc + uVar134 + 6)));
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar206 = vcvtdq2ps_avx(auVar206);
  uVar138 = (ulong)(uint)((int)(uVar134 * 9) * 2);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + uVar134 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  uVar138 = (ulong)(uint)((int)(uVar134 * 5) << 2);
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 6)));
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar142 = vshufps_avx(auVar245,auVar245,0);
  auVar175 = vshufps_avx(auVar245,auVar245,0x55);
  auVar192 = vshufps_avx(auVar245,auVar245,0xaa);
  fVar202 = auVar192._0_4_;
  fVar223 = auVar192._4_4_;
  fVar242 = auVar192._8_4_;
  fVar214 = auVar192._12_4_;
  fVar256 = auVar175._0_4_;
  fVar217 = auVar175._4_4_;
  fVar240 = auVar175._8_4_;
  fVar259 = auVar175._12_4_;
  fVar237 = auVar142._0_4_;
  fVar253 = auVar142._4_4_;
  fVar216 = auVar142._8_4_;
  fVar238 = auVar142._12_4_;
  auVar333._0_4_ = fVar237 * auVar230._0_4_ + fVar256 * auVar231._0_4_ + fVar202 * auVar17._0_4_;
  auVar333._4_4_ = fVar253 * auVar230._4_4_ + fVar217 * auVar231._4_4_ + fVar223 * auVar17._4_4_;
  auVar333._8_4_ = fVar216 * auVar230._8_4_ + fVar240 * auVar231._8_4_ + fVar242 * auVar17._8_4_;
  auVar333._12_4_ = fVar238 * auVar230._12_4_ + fVar259 * auVar231._12_4_ + fVar214 * auVar17._12_4_
  ;
  auVar340._0_4_ = fVar237 * auVar18._0_4_ + fVar256 * auVar248._0_4_ + auVar206._0_4_ * fVar202;
  auVar340._4_4_ = fVar253 * auVar18._4_4_ + fVar217 * auVar248._4_4_ + auVar206._4_4_ * fVar223;
  auVar340._8_4_ = fVar216 * auVar18._8_4_ + fVar240 * auVar248._8_4_ + auVar206._8_4_ * fVar242;
  auVar340._12_4_ = fVar238 * auVar18._12_4_ + fVar259 * auVar248._12_4_ + auVar206._12_4_ * fVar214
  ;
  auVar246._0_4_ = fVar237 * auVar143._0_4_ + fVar256 * auVar144._0_4_ + auVar176._0_4_ * fVar202;
  auVar246._4_4_ = fVar253 * auVar143._4_4_ + fVar217 * auVar144._4_4_ + auVar176._4_4_ * fVar223;
  auVar246._8_4_ = fVar216 * auVar143._8_4_ + fVar240 * auVar144._8_4_ + auVar176._8_4_ * fVar242;
  auVar246._12_4_ =
       fVar238 * auVar143._12_4_ + fVar259 * auVar144._12_4_ + auVar176._12_4_ * fVar214;
  auVar142 = vshufps_avx(auVar174,auVar174,0);
  auVar175 = vshufps_avx(auVar174,auVar174,0x55);
  auVar192 = vshufps_avx(auVar174,auVar174,0xaa);
  fVar202 = auVar192._0_4_;
  fVar223 = auVar192._4_4_;
  fVar242 = auVar192._8_4_;
  fVar214 = auVar192._12_4_;
  fVar256 = auVar175._0_4_;
  fVar217 = auVar175._4_4_;
  fVar240 = auVar175._8_4_;
  fVar259 = auVar175._12_4_;
  fVar237 = auVar142._0_4_;
  fVar253 = auVar142._4_4_;
  fVar216 = auVar142._8_4_;
  fVar238 = auVar142._12_4_;
  auVar264._0_4_ = fVar237 * auVar230._0_4_ + fVar256 * auVar231._0_4_ + fVar202 * auVar17._0_4_;
  auVar264._4_4_ = fVar253 * auVar230._4_4_ + fVar217 * auVar231._4_4_ + fVar223 * auVar17._4_4_;
  auVar264._8_4_ = fVar216 * auVar230._8_4_ + fVar240 * auVar231._8_4_ + fVar242 * auVar17._8_4_;
  auVar264._12_4_ = fVar238 * auVar230._12_4_ + fVar259 * auVar231._12_4_ + fVar214 * auVar17._12_4_
  ;
  auVar142._0_4_ = fVar237 * auVar18._0_4_ + auVar206._0_4_ * fVar202 + fVar256 * auVar248._0_4_;
  auVar142._4_4_ = fVar253 * auVar18._4_4_ + auVar206._4_4_ * fVar223 + fVar217 * auVar248._4_4_;
  auVar142._8_4_ = fVar216 * auVar18._8_4_ + auVar206._8_4_ * fVar242 + fVar240 * auVar248._8_4_;
  auVar142._12_4_ = fVar238 * auVar18._12_4_ + auVar206._12_4_ * fVar214 + fVar259 * auVar248._12_4_
  ;
  auVar289._8_4_ = 0x7fffffff;
  auVar289._0_8_ = 0x7fffffff7fffffff;
  auVar289._12_4_ = 0x7fffffff;
  auVar230 = vandps_avx(auVar333,auVar289);
  auVar224._8_4_ = 0x219392ef;
  auVar224._0_8_ = 0x219392ef219392ef;
  auVar224._12_4_ = 0x219392ef;
  auVar230 = vcmpps_avx(auVar230,auVar224,1);
  auVar231 = vblendvps_avx(auVar333,auVar224,auVar230);
  auVar230 = vandps_avx(auVar340,auVar289);
  auVar230 = vcmpps_avx(auVar230,auVar224,1);
  auVar17 = vblendvps_avx(auVar340,auVar224,auVar230);
  auVar230 = vandps_avx(auVar289,auVar246);
  auVar230 = vcmpps_avx(auVar230,auVar224,1);
  auVar230 = vblendvps_avx(auVar246,auVar224,auVar230);
  auVar175._0_4_ = fVar237 * auVar143._0_4_ + fVar256 * auVar144._0_4_ + auVar176._0_4_ * fVar202;
  auVar175._4_4_ = fVar253 * auVar143._4_4_ + fVar217 * auVar144._4_4_ + auVar176._4_4_ * fVar223;
  auVar175._8_4_ = fVar216 * auVar143._8_4_ + fVar240 * auVar144._8_4_ + auVar176._8_4_ * fVar242;
  auVar175._12_4_ =
       fVar238 * auVar143._12_4_ + fVar259 * auVar144._12_4_ + auVar176._12_4_ * fVar214;
  auVar18 = vrcpps_avx(auVar231);
  fVar202 = auVar18._0_4_;
  auVar203._0_4_ = fVar202 * auVar231._0_4_;
  fVar214 = auVar18._4_4_;
  auVar203._4_4_ = fVar214 * auVar231._4_4_;
  fVar216 = auVar18._8_4_;
  auVar203._8_4_ = fVar216 * auVar231._8_4_;
  fVar217 = auVar18._12_4_;
  auVar203._12_4_ = fVar217 * auVar231._12_4_;
  auVar290._8_4_ = 0x3f800000;
  auVar290._0_8_ = &DAT_3f8000003f800000;
  auVar290._12_4_ = 0x3f800000;
  auVar231 = vsubps_avx(auVar290,auVar203);
  fVar202 = fVar202 + fVar202 * auVar231._0_4_;
  fVar214 = fVar214 + fVar214 * auVar231._4_4_;
  fVar216 = fVar216 + fVar216 * auVar231._8_4_;
  fVar217 = fVar217 + fVar217 * auVar231._12_4_;
  auVar231 = vrcpps_avx(auVar17);
  fVar223 = auVar231._0_4_;
  auVar225._0_4_ = fVar223 * auVar17._0_4_;
  fVar237 = auVar231._4_4_;
  auVar225._4_4_ = fVar237 * auVar17._4_4_;
  fVar238 = auVar231._8_4_;
  auVar225._8_4_ = fVar238 * auVar17._8_4_;
  fVar240 = auVar231._12_4_;
  auVar225._12_4_ = fVar240 * auVar17._12_4_;
  auVar231 = vsubps_avx(auVar290,auVar225);
  fVar223 = fVar223 + fVar223 * auVar231._0_4_;
  fVar237 = fVar237 + fVar237 * auVar231._4_4_;
  fVar238 = fVar238 + fVar238 * auVar231._8_4_;
  fVar240 = fVar240 + fVar240 * auVar231._12_4_;
  auVar231 = vrcpps_avx(auVar230);
  fVar242 = auVar231._0_4_;
  auVar247._0_4_ = fVar242 * auVar230._0_4_;
  fVar253 = auVar231._4_4_;
  auVar247._4_4_ = fVar253 * auVar230._4_4_;
  fVar256 = auVar231._8_4_;
  auVar247._8_4_ = fVar256 * auVar230._8_4_;
  fVar259 = auVar231._12_4_;
  auVar247._12_4_ = fVar259 * auVar230._12_4_;
  auVar231 = vsubps_avx(auVar290,auVar247);
  auVar230._8_8_ = 0;
  auVar230._0_8_ = *(ulong *)(prim + uVar134 * 7 + 6);
  auVar230 = vpmovsxwd_avx(auVar230);
  fVar242 = fVar242 + fVar242 * auVar231._0_4_;
  fVar253 = fVar253 + fVar253 * auVar231._4_4_;
  fVar256 = fVar256 + fVar256 * auVar231._8_4_;
  fVar259 = fVar259 + fVar259 * auVar231._12_4_;
  auVar230 = vcvtdq2ps_avx(auVar230);
  auVar230 = vsubps_avx(auVar230,auVar264);
  auVar192._0_4_ = fVar202 * auVar230._0_4_;
  auVar192._4_4_ = fVar214 * auVar230._4_4_;
  auVar192._8_4_ = fVar216 * auVar230._8_4_;
  auVar192._12_4_ = fVar217 * auVar230._12_4_;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar134 * 9 + 6);
  auVar230 = vpmovsxwd_avx(auVar231);
  auVar230 = vcvtdq2ps_avx(auVar230);
  auVar230 = vsubps_avx(auVar230,auVar264);
  auVar204._0_4_ = fVar202 * auVar230._0_4_;
  auVar204._4_4_ = fVar214 * auVar230._4_4_;
  auVar204._8_4_ = fVar216 * auVar230._8_4_;
  auVar204._12_4_ = fVar217 * auVar230._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar231 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar134 * -2 + 6);
  auVar230 = vpmovsxwd_avx(auVar18);
  auVar230 = vcvtdq2ps_avx(auVar230);
  auVar230 = vsubps_avx(auVar230,auVar142);
  auVar291._0_4_ = auVar230._0_4_ * fVar223;
  auVar291._4_4_ = auVar230._4_4_ * fVar237;
  auVar291._8_4_ = auVar230._8_4_ * fVar238;
  auVar291._12_4_ = auVar230._12_4_ * fVar240;
  auVar230 = vcvtdq2ps_avx(auVar231);
  auVar230 = vsubps_avx(auVar230,auVar142);
  auVar143._0_4_ = fVar223 * auVar230._0_4_;
  auVar143._4_4_ = fVar237 * auVar230._4_4_;
  auVar143._8_4_ = fVar238 * auVar230._8_4_;
  auVar143._12_4_ = fVar240 * auVar230._12_4_;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar138 + uVar134 + 6);
  auVar230 = vpmovsxwd_avx(auVar248);
  auVar230 = vcvtdq2ps_avx(auVar230);
  auVar230 = vsubps_avx(auVar230,auVar175);
  auVar226._0_4_ = auVar230._0_4_ * fVar242;
  auVar226._4_4_ = auVar230._4_4_ * fVar253;
  auVar226._8_4_ = auVar230._8_4_ * fVar256;
  auVar226._12_4_ = auVar230._12_4_ * fVar259;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar134 * 0x17 + 6);
  auVar230 = vpmovsxwd_avx(auVar206);
  auVar230 = vcvtdq2ps_avx(auVar230);
  auVar230 = vsubps_avx(auVar230,auVar175);
  auVar176._0_4_ = auVar230._0_4_ * fVar242;
  auVar176._4_4_ = auVar230._4_4_ * fVar253;
  auVar176._8_4_ = auVar230._8_4_ * fVar256;
  auVar176._12_4_ = auVar230._12_4_ * fVar259;
  auVar230 = vpminsd_avx(auVar192,auVar204);
  auVar231 = vpminsd_avx(auVar291,auVar143);
  auVar230 = vmaxps_avx(auVar230,auVar231);
  auVar231 = vpminsd_avx(auVar226,auVar176);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar302._4_4_ = uVar8;
  auVar302._0_4_ = uVar8;
  auVar302._8_4_ = uVar8;
  auVar302._12_4_ = uVar8;
  auVar231 = vmaxps_avx(auVar231,auVar302);
  auVar230 = vmaxps_avx(auVar230,auVar231);
  local_4f0._0_4_ = auVar230._0_4_ * 0.99999964;
  local_4f0._4_4_ = auVar230._4_4_ * 0.99999964;
  local_4f0._8_4_ = auVar230._8_4_ * 0.99999964;
  local_4f0._12_4_ = auVar230._12_4_ * 0.99999964;
  auVar230 = vpmaxsd_avx(auVar192,auVar204);
  auVar231 = vpmaxsd_avx(auVar291,auVar143);
  auVar230 = vminps_avx(auVar230,auVar231);
  auVar231 = vpmaxsd_avx(auVar226,auVar176);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar193._4_4_ = uVar8;
  auVar193._0_4_ = uVar8;
  auVar193._8_4_ = uVar8;
  auVar193._12_4_ = uVar8;
  auVar231 = vminps_avx(auVar231,auVar193);
  auVar230 = vminps_avx(auVar230,auVar231);
  auVar144._0_4_ = auVar230._0_4_ * 1.0000004;
  auVar144._4_4_ = auVar230._4_4_ * 1.0000004;
  auVar144._8_4_ = auVar230._8_4_ * 1.0000004;
  auVar144._12_4_ = auVar230._12_4_ * 1.0000004;
  auVar230 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar231 = vpcmpgtd_avx(auVar230,_DAT_01ff0cf0);
  auVar230 = vcmpps_avx(local_4f0,auVar144,2);
  auVar230 = vandps_avx(auVar230,auVar231);
  uVar133 = vmovmskps_avx(auVar230);
  bVar139 = uVar133 != 0;
  if (bVar139) {
    uVar133 = uVar133 & 0xff;
    local_660 = mm_lookupmask_ps._16_8_;
    uStack_658 = mm_lookupmask_ps._24_8_;
    uStack_650 = mm_lookupmask_ps._16_8_;
    uStack_648 = mm_lookupmask_ps._24_8_;
    uVar135 = 1 << ((byte)k & 0x1f);
    local_778 = (undefined1 (*) [32])&local_1a0;
    local_780 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar135 & 0xf) << 4));
    local_788 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar135 >> 4) * 0x10);
    do {
      uVar138 = (ulong)uVar133;
      lVar132 = 0;
      if (uVar138 != 0) {
        for (; (uVar133 >> lVar132 & 1) == 0; lVar132 = lVar132 + 1) {
        }
      }
      uVar138 = uVar138 - 1 & uVar138;
      uVar133 = *(uint *)(prim + lVar132 * 4 + 6);
      local_5e0._0_4_ = uVar133;
      lVar132 = lVar132 * 0x40;
      lVar137 = 0;
      if (uVar138 != 0) {
        for (; (uVar138 >> lVar137 & 1) == 0; lVar137 = lVar137 + 1) {
        }
      }
      uVar135 = *(uint *)(prim + 2);
      pGVar12 = (context->scene->geometries).items[uVar135].ptr;
      auVar230 = *(undefined1 (*) [16])(prim + lVar132 + lVar100 + 0x16);
      if (((uVar138 != 0) && (uVar134 = uVar138 - 1 & uVar138, uVar134 != 0)) &&
         (lVar137 = 0, uVar134 != 0)) {
        for (; (uVar134 >> lVar137 & 1) == 0; lVar137 = lVar137 + 1) {
        }
      }
      auVar231 = *(undefined1 (*) [16])(prim + lVar132 + lVar100 + 0x26);
      auVar17 = *(undefined1 (*) [16])(prim + lVar132 + lVar100 + 0x36);
      auVar18 = *(undefined1 (*) [16])(prim + lVar132 + lVar100 + 0x46);
      uVar11 = (uint)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar248 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar144 = vinsertps_avx(auVar248,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar143 = vsubps_avx(auVar230,auVar144);
      auVar248 = vshufps_avx(auVar143,auVar143,0);
      auVar206 = vshufps_avx(auVar143,auVar143,0x55);
      auVar143 = vshufps_avx(auVar143,auVar143,0xaa);
      fVar202 = pre->ray_space[k].vx.field_0.m128[0];
      fVar223 = pre->ray_space[k].vx.field_0.m128[1];
      fVar242 = pre->ray_space[k].vx.field_0.m128[2];
      fVar214 = pre->ray_space[k].vx.field_0.m128[3];
      fVar237 = pre->ray_space[k].vy.field_0.m128[0];
      fVar253 = pre->ray_space[k].vy.field_0.m128[1];
      fVar216 = pre->ray_space[k].vy.field_0.m128[2];
      fVar238 = pre->ray_space[k].vy.field_0.m128[3];
      fVar256 = pre->ray_space[k].vz.field_0.m128[0];
      fVar217 = pre->ray_space[k].vz.field_0.m128[1];
      fVar240 = pre->ray_space[k].vz.field_0.m128[2];
      fVar259 = pre->ray_space[k].vz.field_0.m128[3];
      auVar227._0_8_ =
           CONCAT44(auVar248._4_4_ * fVar223 + auVar206._4_4_ * fVar253 + fVar217 * auVar143._4_4_,
                    auVar248._0_4_ * fVar202 + auVar206._0_4_ * fVar237 + fVar256 * auVar143._0_4_);
      auVar227._8_4_ =
           auVar248._8_4_ * fVar242 + auVar206._8_4_ * fVar216 + fVar240 * auVar143._8_4_;
      auVar227._12_4_ =
           auVar248._12_4_ * fVar214 + auVar206._12_4_ * fVar238 + fVar259 * auVar143._12_4_;
      auVar248 = vblendps_avx(auVar227,auVar230,8);
      auVar176 = vsubps_avx(auVar231,auVar144);
      auVar206 = vshufps_avx(auVar176,auVar176,0);
      auVar143 = vshufps_avx(auVar176,auVar176,0x55);
      auVar176 = vshufps_avx(auVar176,auVar176,0xaa);
      auVar228._0_4_ =
           auVar206._0_4_ * fVar202 + auVar143._0_4_ * fVar237 + fVar256 * auVar176._0_4_;
      auVar228._4_4_ =
           auVar206._4_4_ * fVar223 + auVar143._4_4_ * fVar253 + fVar217 * auVar176._4_4_;
      auVar228._8_4_ =
           auVar206._8_4_ * fVar242 + auVar143._8_4_ * fVar216 + fVar240 * auVar176._8_4_;
      auVar228._12_4_ =
           auVar206._12_4_ * fVar214 + auVar143._12_4_ * fVar238 + fVar259 * auVar176._12_4_;
      auVar206 = vblendps_avx(auVar228,auVar231,8);
      auVar142 = vsubps_avx(auVar17,auVar144);
      auVar143 = vshufps_avx(auVar142,auVar142,0);
      auVar176 = vshufps_avx(auVar142,auVar142,0x55);
      auVar142 = vshufps_avx(auVar142,auVar142,0xaa);
      auVar229._0_4_ =
           auVar143._0_4_ * fVar202 + auVar176._0_4_ * fVar237 + fVar256 * auVar142._0_4_;
      auVar229._4_4_ =
           auVar143._4_4_ * fVar223 + auVar176._4_4_ * fVar253 + fVar217 * auVar142._4_4_;
      auVar229._8_4_ =
           auVar143._8_4_ * fVar242 + auVar176._8_4_ * fVar216 + fVar240 * auVar142._8_4_;
      auVar229._12_4_ =
           auVar143._12_4_ * fVar214 + auVar176._12_4_ * fVar238 + fVar259 * auVar142._12_4_;
      auVar143 = vblendps_avx(auVar229,auVar17,8);
      auVar142 = vsubps_avx(auVar18,auVar144);
      auVar144 = vshufps_avx(auVar142,auVar142,0);
      auVar176 = vshufps_avx(auVar142,auVar142,0x55);
      auVar142 = vshufps_avx(auVar142,auVar142,0xaa);
      auVar265._0_4_ =
           auVar144._0_4_ * fVar202 + auVar176._0_4_ * fVar237 + fVar256 * auVar142._0_4_;
      auVar265._4_4_ =
           auVar144._4_4_ * fVar223 + auVar176._4_4_ * fVar253 + fVar217 * auVar142._4_4_;
      auVar265._8_4_ =
           auVar144._8_4_ * fVar242 + auVar176._8_4_ * fVar216 + fVar240 * auVar142._8_4_;
      auVar265._12_4_ =
           auVar144._12_4_ * fVar214 + auVar176._12_4_ * fVar238 + fVar259 * auVar142._12_4_;
      auVar144 = vblendps_avx(auVar265,auVar18,8);
      auVar205._8_4_ = 0x7fffffff;
      auVar205._0_8_ = 0x7fffffff7fffffff;
      auVar205._12_4_ = 0x7fffffff;
      auVar248 = vandps_avx(auVar248,auVar205);
      auVar206 = vandps_avx(auVar206,auVar205);
      auVar176 = vmaxps_avx(auVar248,auVar206);
      auVar248 = vandps_avx(auVar143,auVar205);
      auVar206 = vandps_avx(auVar144,auVar205);
      auVar248 = vmaxps_avx(auVar248,auVar206);
      auVar248 = vmaxps_avx(auVar176,auVar248);
      auVar206 = vmovshdup_avx(auVar248);
      auVar206 = vmaxss_avx(auVar206,auVar248);
      auVar248 = vshufpd_avx(auVar248,auVar248,1);
      auVar248 = vmaxss_avx(auVar248,auVar206);
      lVar132 = (long)(int)uVar11 * 0x44;
      fVar202 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar132 + 0x908);
      fVar223 = *(float *)(bezier_basis0 + lVar132 + 0x90c);
      fVar242 = *(float *)(bezier_basis0 + lVar132 + 0x910);
      fVar214 = *(float *)(bezier_basis0 + lVar132 + 0x914);
      fVar237 = *(float *)(bezier_basis0 + lVar132 + 0x918);
      fVar253 = *(float *)(bezier_basis0 + lVar132 + 0x91c);
      fVar216 = *(float *)(bezier_basis0 + lVar132 + 0x920);
      auVar123 = *(undefined1 (*) [28])(bezier_basis0 + lVar132 + 0x908);
      auVar206 = vshufps_avx(auVar229,auVar229,0);
      register0x00001250 = auVar206;
      _local_6a0 = auVar206;
      auVar143 = vshufps_avx(auVar229,auVar229,0x55);
      fVar238 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar132 + 0xd8c);
      fVar256 = *(float *)(bezier_basis0 + lVar132 + 0xd90);
      fVar217 = *(float *)(bezier_basis0 + lVar132 + 0xd94);
      fVar240 = *(float *)(bezier_basis0 + lVar132 + 0xd98);
      fVar259 = *(float *)(bezier_basis0 + lVar132 + 0xd9c);
      fVar323 = *(float *)(bezier_basis0 + lVar132 + 0xda0);
      fVar215 = *(float *)(bezier_basis0 + lVar132 + 0xda4);
      auVar122 = *(undefined1 (*) [28])(bezier_basis0 + lVar132 + 0xd8c);
      auVar144 = vshufps_avx(auVar265,auVar265,0);
      register0x000015d0 = auVar144;
      _local_5a0 = auVar144;
      auVar176 = vshufps_avx(auVar265,auVar265,0x55);
      local_720._16_16_ = auVar176;
      local_720._0_16_ = auVar176;
      fVar357 = auVar144._0_4_;
      fVar361 = auVar144._4_4_;
      fVar362 = auVar144._8_4_;
      fVar363 = auVar144._12_4_;
      fVar173 = auVar206._0_4_;
      fVar188 = auVar206._4_4_;
      fVar189 = auVar206._8_4_;
      fVar190 = auVar206._12_4_;
      fVar263 = auVar176._0_4_;
      fVar269 = auVar176._4_4_;
      fVar270 = auVar176._8_4_;
      fVar271 = auVar176._12_4_;
      fVar243 = auVar143._0_4_;
      fVar254 = auVar143._4_4_;
      fVar257 = auVar143._8_4_;
      fVar260 = auVar143._12_4_;
      auVar206 = vshufps_avx(auVar17,auVar17,0xff);
      register0x00001490 = auVar206;
      _local_2e0 = auVar206;
      auVar143 = vshufps_avx(auVar18,auVar18,0xff);
      register0x00001410 = auVar143;
      _local_80 = auVar143;
      fVar287 = auVar143._0_4_;
      fVar296 = auVar143._4_4_;
      fVar274 = auVar143._8_4_;
      fVar281 = auVar143._12_4_;
      fVar285 = auVar206._0_4_;
      fVar286 = auVar206._4_4_;
      fVar301 = auVar206._8_4_;
      auVar143 = vshufps_avx(auVar228,auVar228,0);
      register0x00001550 = auVar143;
      _local_340 = auVar143;
      fVar325 = *(float *)(bezier_basis0 + lVar132 + 0x484);
      fVar218 = *(float *)(bezier_basis0 + lVar132 + 0x488);
      fVar326 = *(float *)(bezier_basis0 + lVar132 + 0x48c);
      fVar221 = *(float *)(bezier_basis0 + lVar132 + 0x490);
      fVar328 = *(float *)(bezier_basis0 + lVar132 + 0x494);
      fVar262 = *(float *)(bezier_basis0 + lVar132 + 0x498);
      fVar329 = *(float *)(bezier_basis0 + lVar132 + 0x49c);
      fVar316 = auVar143._0_4_;
      fVar317 = auVar143._4_4_;
      fVar344 = auVar143._8_4_;
      fVar346 = auVar143._12_4_;
      auVar143 = vshufps_avx(auVar228,auVar228,0x55);
      register0x00001350 = auVar143;
      _local_2a0 = auVar143;
      fVar244 = auVar143._0_4_;
      fVar255 = auVar143._4_4_;
      fVar258 = auVar143._8_4_;
      fVar261 = auVar143._12_4_;
      auVar143 = vpermilps_avx(auVar231,0xff);
      register0x00001590 = auVar143;
      _local_300 = auVar143;
      fVar348 = auVar143._0_4_;
      fVar351 = auVar143._4_4_;
      fVar353 = auVar143._8_4_;
      fVar355 = auVar143._12_4_;
      auVar106._8_4_ = auVar227._8_4_;
      auVar106._0_8_ = auVar227._0_8_;
      auVar106._12_4_ = auVar227._12_4_;
      auVar143 = vshufps_avx(auVar106,auVar106,0);
      register0x00001310 = auVar143;
      _local_580 = auVar143;
      pauVar1 = (undefined1 (*) [16])(bezier_basis0 + lVar132);
      fVar327 = *(float *)*pauVar1;
      fVar330 = *(float *)(bezier_basis0 + lVar132 + 4);
      fVar219 = *(float *)(bezier_basis0 + lVar132 + 8);
      auVar124 = *(undefined1 (*) [12])*pauVar1;
      fVar332 = *(float *)(bezier_basis0 + lVar132 + 0xc);
      fStack_510 = *(float *)(bezier_basis0 + lVar132 + 0x10);
      fStack_50c = *(float *)(bezier_basis0 + lVar132 + 0x14);
      fStack_508 = *(float *)(bezier_basis0 + lVar132 + 0x18);
      uStack_504 = *(undefined4 *)(bezier_basis0 + lVar132 + 0x1c);
      fVar172 = auVar143._0_4_;
      fVar273 = auVar143._4_4_;
      fVar239 = auVar143._8_4_;
      fVar241 = auVar143._12_4_;
      auVar324._0_4_ = fVar172 * fVar327 + fVar316 * fVar325 + fVar173 * fVar202 + fVar357 * fVar238
      ;
      auVar324._4_4_ = fVar273 * fVar330 + fVar317 * fVar218 + fVar188 * fVar223 + fVar361 * fVar256
      ;
      auVar324._8_4_ = fVar239 * fVar219 + fVar344 * fVar326 + fVar189 * fVar242 + fVar362 * fVar217
      ;
      auVar324._12_4_ =
           fVar241 * fVar332 + fVar346 * fVar221 + fVar190 * fVar214 + fVar363 * fVar240;
      auVar324._16_4_ =
           fVar172 * fStack_510 + fVar316 * fVar328 + fVar173 * fVar237 + fVar357 * fVar259;
      auVar324._20_4_ =
           fVar273 * fStack_50c + fVar317 * fVar262 + fVar188 * fVar253 + fVar361 * fVar323;
      auVar324._24_4_ =
           fVar239 * fStack_508 + fVar344 * fVar329 + fVar189 * fVar216 + fVar362 * fVar215;
      auVar324._28_4_ = fVar190 + 0.0 + 0.0 + 0.0;
      auVar143 = vshufps_avx(auVar106,auVar106,0x55);
      register0x00001510 = auVar143;
      _local_2c0 = auVar143;
      fVar310 = auVar143._0_4_;
      fVar312 = auVar143._4_4_;
      fVar314 = auVar143._8_4_;
      fVar315 = auVar143._12_4_;
      auVar266._0_4_ = fVar310 * fVar327 + fVar244 * fVar325 + fVar243 * fVar202 + fVar263 * fVar238
      ;
      auVar266._4_4_ = fVar312 * fVar330 + fVar255 * fVar218 + fVar254 * fVar223 + fVar269 * fVar256
      ;
      auVar266._8_4_ = fVar314 * fVar219 + fVar258 * fVar326 + fVar257 * fVar242 + fVar270 * fVar217
      ;
      auVar266._12_4_ =
           fVar315 * fVar332 + fVar261 * fVar221 + fVar260 * fVar214 + fVar271 * fVar240;
      auVar266._16_4_ =
           fVar310 * fStack_510 + fVar244 * fVar328 + fVar243 * fVar237 + fVar263 * fVar259;
      auVar266._20_4_ =
           fVar312 * fStack_50c + fVar255 * fVar262 + fVar254 * fVar253 + fVar269 * fVar323;
      auVar266._24_4_ =
           fVar314 * fStack_508 + fVar258 * fVar329 + fVar257 * fVar216 + fVar270 * fVar215;
      auVar266._28_4_ = fVar190 + 0.0 + 0.0 + 0.0;
      auVar143 = vpermilps_avx(auVar230,0xff);
      register0x00001450 = auVar143;
      _local_320 = auVar143;
      fVar282 = auVar143._0_4_;
      fVar283 = auVar143._4_4_;
      fVar284 = auVar143._8_4_;
      fVar140 = fVar282 * fVar327 + fVar348 * fVar325 + fVar285 * fVar202 + fVar287 * fVar238;
      fVar158 = fVar283 * fVar330 + fVar351 * fVar218 + fVar286 * fVar223 + fVar296 * fVar256;
      fVar160 = fVar284 * fVar219 + fVar353 * fVar326 + fVar301 * fVar242 + fVar274 * fVar217;
      fVar162 = auVar143._12_4_ * fVar332 +
                fVar355 * fVar221 + auVar206._12_4_ * fVar214 + fVar281 * fVar240;
      fVar164 = fVar282 * fStack_510 + fVar348 * fVar328 + fVar285 * fVar237 + fVar287 * fVar259;
      fVar166 = fVar283 * fStack_50c + fVar351 * fVar262 + fVar286 * fVar253 + fVar296 * fVar323;
      fVar168 = fVar284 * fStack_508 + fVar353 * fVar329 + fVar301 * fVar216 + fVar274 * fVar215;
      fVar170 = *(float *)(bezier_basis0 + lVar132 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar238 = *(float *)(bezier_basis1 + lVar132 + 0x908);
      fVar256 = *(float *)(bezier_basis1 + lVar132 + 0x90c);
      fVar217 = *(float *)(bezier_basis1 + lVar132 + 0x910);
      fVar240 = *(float *)(bezier_basis1 + lVar132 + 0x914);
      fVar259 = *(float *)(bezier_basis1 + lVar132 + 0x918);
      fVar323 = *(float *)(bezier_basis1 + lVar132 + 0x91c);
      fVar215 = *(float *)(bezier_basis1 + lVar132 + 0x920);
      fVar327 = *(float *)(bezier_basis1 + lVar132 + 0xd8c);
      fVar330 = *(float *)(bezier_basis1 + lVar132 + 0xd90);
      fVar219 = *(float *)(bezier_basis1 + lVar132 + 0xd94);
      fVar331 = *(float *)(bezier_basis1 + lVar132 + 0xd98);
      fVar288 = *(float *)(bezier_basis1 + lVar132 + 0xd9c);
      fVar220 = *(float *)(bezier_basis1 + lVar132 + 0xda0);
      fVar299 = *(float *)(bezier_basis1 + lVar132 + 0xda4);
      fVar297 = *(float *)(bezier_basis1 + lVar132 + 0x484);
      fVar298 = *(float *)(bezier_basis1 + lVar132 + 0x488);
      fVar222 = *(float *)(bezier_basis1 + lVar132 + 0x48c);
      fVar191 = *(float *)(bezier_basis1 + lVar132 + 0x490);
      fVar141 = *(float *)(bezier_basis1 + lVar132 + 0x494);
      fVar159 = *(float *)(bezier_basis1 + lVar132 + 0x498);
      fVar161 = *(float *)(bezier_basis1 + lVar132 + 0x49c);
      fVar202 = fVar346 + 0.0;
      fVar163 = *(float *)(bezier_basis1 + lVar132);
      fVar165 = *(float *)(bezier_basis1 + lVar132 + 4);
      fVar167 = *(float *)(bezier_basis1 + lVar132 + 8);
      fVar169 = *(float *)(bezier_basis1 + lVar132 + 0xc);
      fVar171 = *(float *)(bezier_basis1 + lVar132 + 0x10);
      fVar201 = *(float *)(bezier_basis1 + lVar132 + 0x14);
      fVar272 = *(float *)(bezier_basis1 + lVar132 + 0x18);
      auVar232._0_4_ = fVar163 * fVar172 + fVar316 * fVar297 + fVar238 * fVar173 + fVar357 * fVar327
      ;
      auVar232._4_4_ = fVar165 * fVar273 + fVar317 * fVar298 + fVar256 * fVar188 + fVar361 * fVar330
      ;
      auVar232._8_4_ = fVar167 * fVar239 + fVar344 * fVar222 + fVar217 * fVar189 + fVar362 * fVar219
      ;
      auVar232._12_4_ =
           fVar169 * fVar241 + fVar346 * fVar191 + fVar240 * fVar190 + fVar363 * fVar331;
      auVar232._16_4_ =
           fVar171 * fVar172 + fVar316 * fVar141 + fVar259 * fVar173 + fVar357 * fVar288;
      auVar232._20_4_ =
           fVar201 * fVar273 + fVar317 * fVar159 + fVar323 * fVar188 + fVar361 * fVar220;
      auVar232._24_4_ =
           fVar272 * fVar239 + fVar344 * fVar161 + fVar215 * fVar189 + fVar362 * fVar299;
      auVar232._28_4_ = fVar355 + fVar202;
      auVar207._0_4_ = fVar310 * fVar163 + fVar244 * fVar297 + fVar238 * fVar243 + fVar327 * fVar263
      ;
      auVar207._4_4_ = fVar312 * fVar165 + fVar255 * fVar298 + fVar256 * fVar254 + fVar330 * fVar269
      ;
      auVar207._8_4_ = fVar314 * fVar167 + fVar258 * fVar222 + fVar217 * fVar257 + fVar219 * fVar270
      ;
      auVar207._12_4_ =
           fVar315 * fVar169 + fVar261 * fVar191 + fVar240 * fVar260 + fVar331 * fVar271;
      auVar207._16_4_ =
           fVar310 * fVar171 + fVar244 * fVar141 + fVar259 * fVar243 + fVar288 * fVar263;
      auVar207._20_4_ =
           fVar312 * fVar201 + fVar255 * fVar159 + fVar323 * fVar254 + fVar220 * fVar269;
      auVar207._24_4_ =
           fVar314 * fVar272 + fVar258 * fVar161 + fVar215 * fVar257 + fVar299 * fVar270;
      auVar207._28_4_ = fVar202 + fVar346 + 0.0;
      auVar358._0_4_ = fVar348 * fVar297 + fVar285 * fVar238 + fVar287 * fVar327 + fVar282 * fVar163
      ;
      auVar358._4_4_ = fVar351 * fVar298 + fVar286 * fVar256 + fVar296 * fVar330 + fVar283 * fVar165
      ;
      auVar358._8_4_ = fVar353 * fVar222 + fVar301 * fVar217 + fVar274 * fVar219 + fVar284 * fVar167
      ;
      auVar358._12_4_ =
           fVar355 * fVar191 + auVar206._12_4_ * fVar240 + fVar281 * fVar331 +
           auVar143._12_4_ * fVar169;
      auVar358._16_4_ =
           fVar348 * fVar141 + fVar285 * fVar259 + fVar287 * fVar288 + fVar282 * fVar171;
      auVar358._20_4_ =
           fVar351 * fVar159 + fVar286 * fVar323 + fVar296 * fVar220 + fVar283 * fVar201;
      auVar358._24_4_ =
           fVar353 * fVar161 + fVar301 * fVar215 + fVar274 * fVar299 + fVar284 * fVar272;
      auVar358._28_4_ = fVar346 + fVar281 + 0.0 + fVar202;
      auVar19 = vsubps_avx(auVar232,auVar324);
      auVar20 = vsubps_avx(auVar207,auVar266);
      fVar287 = auVar19._0_4_;
      fVar296 = auVar19._4_4_;
      auVar185._4_4_ = fVar296 * auVar266._4_4_;
      auVar185._0_4_ = fVar287 * auVar266._0_4_;
      fVar274 = auVar19._8_4_;
      auVar185._8_4_ = fVar274 * auVar266._8_4_;
      fVar281 = auVar19._12_4_;
      auVar185._12_4_ = fVar281 * auVar266._12_4_;
      fVar282 = auVar19._16_4_;
      auVar185._16_4_ = fVar282 * auVar266._16_4_;
      fVar283 = auVar19._20_4_;
      auVar185._20_4_ = fVar283 * auVar266._20_4_;
      fVar284 = auVar19._24_4_;
      auVar185._24_4_ = fVar284 * auVar266._24_4_;
      auVar185._28_4_ = fVar202;
      fVar202 = auVar20._0_4_;
      fVar223 = auVar20._4_4_;
      auVar21._4_4_ = auVar324._4_4_ * fVar223;
      auVar21._0_4_ = auVar324._0_4_ * fVar202;
      fVar242 = auVar20._8_4_;
      auVar21._8_4_ = auVar324._8_4_ * fVar242;
      fVar214 = auVar20._12_4_;
      auVar21._12_4_ = auVar324._12_4_ * fVar214;
      fVar237 = auVar20._16_4_;
      auVar21._16_4_ = auVar324._16_4_ * fVar237;
      fVar253 = auVar20._20_4_;
      auVar21._20_4_ = auVar324._20_4_ * fVar253;
      fVar216 = auVar20._24_4_;
      auVar21._24_4_ = auVar324._24_4_ * fVar216;
      auVar21._28_4_ = auVar207._28_4_;
      auVar21 = vsubps_avx(auVar185,auVar21);
      auVar16._4_4_ = fVar158;
      auVar16._0_4_ = fVar140;
      auVar16._8_4_ = fVar160;
      auVar16._12_4_ = fVar162;
      auVar16._16_4_ = fVar164;
      auVar16._20_4_ = fVar166;
      auVar16._24_4_ = fVar168;
      auVar16._28_4_ = fVar170;
      auVar185 = vmaxps_avx(auVar16,auVar358);
      auVar26._4_4_ = auVar185._4_4_ * auVar185._4_4_ * (fVar296 * fVar296 + fVar223 * fVar223);
      auVar26._0_4_ = auVar185._0_4_ * auVar185._0_4_ * (fVar287 * fVar287 + fVar202 * fVar202);
      auVar26._8_4_ = auVar185._8_4_ * auVar185._8_4_ * (fVar274 * fVar274 + fVar242 * fVar242);
      auVar26._12_4_ = auVar185._12_4_ * auVar185._12_4_ * (fVar281 * fVar281 + fVar214 * fVar214);
      auVar26._16_4_ = auVar185._16_4_ * auVar185._16_4_ * (fVar282 * fVar282 + fVar237 * fVar237);
      auVar26._20_4_ = auVar185._20_4_ * auVar185._20_4_ * (fVar283 * fVar283 + fVar253 * fVar253);
      auVar26._24_4_ = auVar185._24_4_ * auVar185._24_4_ * (fVar284 * fVar284 + fVar216 * fVar216);
      auVar26._28_4_ = auVar20._28_4_ + auVar207._28_4_;
      auVar15._4_4_ = auVar21._4_4_ * auVar21._4_4_;
      auVar15._0_4_ = auVar21._0_4_ * auVar21._0_4_;
      auVar15._8_4_ = auVar21._8_4_ * auVar21._8_4_;
      auVar15._12_4_ = auVar21._12_4_ * auVar21._12_4_;
      auVar15._16_4_ = auVar21._16_4_ * auVar21._16_4_;
      auVar15._20_4_ = auVar21._20_4_ * auVar21._20_4_;
      auVar15._24_4_ = auVar21._24_4_ * auVar21._24_4_;
      auVar15._28_4_ = auVar21._28_4_;
      auVar185 = vcmpps_avx(auVar15,auVar26,2);
      local_5c0 = (float)(int)uVar11;
      fStack_5bc = 0.0;
      fStack_5b8 = 0.0;
      fStack_5b4 = 0.0;
      auVar206 = vshufps_avx(ZEXT416((uint)local_5c0),ZEXT416((uint)local_5c0),0);
      auVar208._16_16_ = auVar206;
      auVar208._0_16_ = auVar206;
      auVar21 = vcmpps_avx(_DAT_02020f40,auVar208,1);
      auVar213 = ZEXT3264(auVar21);
      auVar107._8_4_ = auVar227._8_4_;
      auVar107._0_8_ = auVar227._0_8_;
      auVar107._12_4_ = auVar227._12_4_;
      auVar206 = vpermilps_avx(auVar107,0xaa);
      auVar303._16_16_ = auVar206;
      auVar303._0_16_ = auVar206;
      auVar143 = vpermilps_avx(auVar228,0xaa);
      register0x00001550 = auVar143;
      _local_a0 = auVar143;
      auVar144 = vpermilps_avx(auVar229,0xaa);
      register0x00001590 = auVar144;
      _local_c0 = auVar144;
      auVar176 = vpermilps_avx(auVar265,0xaa);
      auVar26 = auVar21 & auVar185;
      uVar9 = *(uint *)(ray + k * 4 + 0x60);
      auVar248 = ZEXT416((uint)(auVar248._0_4_ * 4.7683716e-07));
      local_970 = auVar230._0_4_;
      fStack_96c = auVar230._4_4_;
      fStack_968 = auVar230._8_4_;
      fStack_964 = auVar230._12_4_;
      local_470 = auVar230._0_8_;
      uVar128 = local_470;
      uStack_468 = auVar230._8_8_;
      uVar129 = uStack_468;
      fVar202 = auVar176._0_4_;
      fVar223 = auVar176._4_4_;
      fVar242 = auVar176._8_4_;
      fVar214 = auVar176._12_4_;
      local_670 = auVar231;
      local_600 = auVar18;
      local_5f0 = auVar17;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0x7f,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0xbf,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f])
      {
        bVar130 = false;
        auVar322 = ZEXT3264(local_720);
      }
      else {
        local_640._0_8_ = pGVar12;
        auVar185 = vandps_avx(auVar185,auVar21);
        fVar300 = auVar206._0_4_;
        fVar309 = auVar206._4_4_;
        fVar311 = auVar206._8_4_;
        fVar313 = auVar206._12_4_;
        fVar339 = auVar143._0_4_;
        fVar343 = auVar143._4_4_;
        fVar345 = auVar143._8_4_;
        fVar347 = auVar143._12_4_;
        fVar349 = auVar144._0_4_;
        fVar352 = auVar144._4_4_;
        fVar354 = auVar144._8_4_;
        fVar356 = auVar144._12_4_;
        local_620 = fVar300 * fVar163 + fVar339 * fVar297 + fVar349 * fVar238 + fVar202 * fVar327;
        fStack_61c = fVar309 * fVar165 + fVar343 * fVar298 + fVar352 * fVar256 + fVar223 * fVar330;
        fStack_618 = fVar311 * fVar167 + fVar345 * fVar222 + fVar354 * fVar217 + fVar242 * fVar219;
        fStack_614 = fVar313 * fVar169 + fVar347 * fVar191 + fVar356 * fVar240 + fVar214 * fVar331;
        fStack_610 = fVar300 * fVar171 + fVar339 * fVar141 + fVar349 * fVar259 + fVar202 * fVar288;
        fStack_60c = fVar309 * fVar201 + fVar343 * fVar159 + fVar352 * fVar323 + fVar223 * fVar220;
        fStack_608 = fVar311 * fVar272 + fVar345 * fVar161 + fVar354 * fVar215 + fVar242 * fVar299;
        fStack_604 = auVar185._28_4_ +
                     auVar21._28_4_ + *(float *)(bezier_basis1 + lVar132 + 0x924) + 0.0;
        local_520._0_4_ = auVar124._0_4_;
        local_520._4_4_ = auVar124._4_4_;
        fStack_518 = auVar124._8_4_;
        local_7e0._0_4_ = auVar123._0_4_;
        local_7e0._4_4_ = auVar123._4_4_;
        fStack_7d8 = auVar123._8_4_;
        fStack_7d4 = auVar123._12_4_;
        fStack_7d0 = auVar123._16_4_;
        fStack_7cc = auVar123._20_4_;
        fStack_7c8 = auVar123._24_4_;
        local_900._0_4_ = auVar122._0_4_;
        local_900._4_4_ = auVar122._4_4_;
        fStack_8f8 = auVar122._8_4_;
        fStack_8f4 = auVar122._12_4_;
        fStack_8f0 = auVar122._16_4_;
        fStack_8ec = auVar122._20_4_;
        fStack_8e8 = auVar122._24_4_;
        local_7e0._0_4_ =
             fVar300 * (float)local_520._0_4_ +
             fVar339 * fVar325 + fVar349 * (float)local_7e0._0_4_ + fVar202 * (float)local_900._0_4_
        ;
        local_7e0._4_4_ =
             fVar309 * (float)local_520._4_4_ +
             fVar343 * fVar218 + fVar352 * (float)local_7e0._4_4_ + fVar223 * (float)local_900._4_4_
        ;
        fStack_7d8 = fVar311 * fStack_518 +
                     fVar345 * fVar326 + fVar354 * fStack_7d8 + fVar242 * fStack_8f8;
        fStack_7d4 = fVar313 * fVar332 +
                     fVar347 * fVar221 + fVar356 * fStack_7d4 + fVar214 * fStack_8f4;
        fStack_7d0 = fVar300 * fStack_510 +
                     fVar339 * fVar328 + fVar349 * fStack_7d0 + fVar202 * fStack_8f0;
        fStack_7cc = fVar309 * fStack_50c +
                     fVar343 * fVar262 + fVar352 * fStack_7cc + fVar223 * fStack_8ec;
        fStack_7c8 = fVar311 * fStack_508 +
                     fVar345 * fVar329 + fVar354 * fStack_7c8 + fVar242 * fStack_8e8;
        fStack_7c4 = fVar315 + fStack_604 + auVar185._28_4_ + auVar21._28_4_;
        fVar237 = *(float *)(bezier_basis0 + lVar132 + 0x1210);
        fVar253 = *(float *)(bezier_basis0 + lVar132 + 0x1214);
        fVar216 = *(float *)(bezier_basis0 + lVar132 + 0x1218);
        fVar238 = *(float *)(bezier_basis0 + lVar132 + 0x121c);
        fVar256 = *(float *)(bezier_basis0 + lVar132 + 0x1220);
        fVar217 = *(float *)(bezier_basis0 + lVar132 + 0x1224);
        fVar240 = *(float *)(bezier_basis0 + lVar132 + 0x1228);
        fVar259 = *(float *)(bezier_basis0 + lVar132 + 0x1694);
        fVar323 = *(float *)(bezier_basis0 + lVar132 + 0x1698);
        fVar215 = *(float *)(bezier_basis0 + lVar132 + 0x169c);
        fVar325 = *(float *)(bezier_basis0 + lVar132 + 0x16a0);
        fVar218 = *(float *)(bezier_basis0 + lVar132 + 0x16a4);
        fVar326 = *(float *)(bezier_basis0 + lVar132 + 0x16a8);
        fVar221 = *(float *)(bezier_basis0 + lVar132 + 0x16ac);
        fVar328 = *(float *)(bezier_basis0 + lVar132 + 0x1b18);
        fVar262 = *(float *)(bezier_basis0 + lVar132 + 0x1b1c);
        fVar329 = *(float *)(bezier_basis0 + lVar132 + 0x1b20);
        fVar327 = *(float *)(bezier_basis0 + lVar132 + 0x1b24);
        fVar330 = *(float *)(bezier_basis0 + lVar132 + 0x1b28);
        fVar219 = *(float *)(bezier_basis0 + lVar132 + 0x1b2c);
        fVar332 = *(float *)(bezier_basis0 + lVar132 + 0x1b30);
        fVar331 = *(float *)(bezier_basis0 + lVar132 + 0x1f9c);
        fVar288 = *(float *)(bezier_basis0 + lVar132 + 0x1fa0);
        fVar220 = *(float *)(bezier_basis0 + lVar132 + 0x1fa4);
        fVar299 = *(float *)(bezier_basis0 + lVar132 + 0x1fa8);
        fVar297 = *(float *)(bezier_basis0 + lVar132 + 0x1fac);
        fVar298 = *(float *)(bezier_basis0 + lVar132 + 0x1fb0);
        fVar222 = *(float *)(bezier_basis0 + lVar132 + 0x1fb4);
        fVar191 = *(float *)(bezier_basis0 + lVar132 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar132 + 0x1fb8);
        fVar318 = *(float *)(bezier_basis0 + lVar132 + 0x16b0) + fVar191;
        auVar180._0_4_ =
             fVar310 * fVar237 + fVar243 * fVar328 + fVar263 * fVar331 + fVar244 * fVar259;
        auVar180._4_4_ =
             fVar312 * fVar253 + fVar254 * fVar262 + fVar269 * fVar288 + fVar255 * fVar323;
        auVar180._8_4_ =
             fVar314 * fVar216 + fVar257 * fVar329 + fVar270 * fVar220 + fVar258 * fVar215;
        auVar180._12_4_ =
             fVar315 * fVar238 + fVar260 * fVar327 + fVar271 * fVar299 + fVar261 * fVar325;
        auVar180._16_4_ =
             fVar310 * fVar256 + fVar243 * fVar330 + fVar263 * fVar297 + fVar244 * fVar218;
        auVar180._20_4_ =
             fVar312 * fVar217 + fVar254 * fVar219 + fVar269 * fVar298 + fVar255 * fVar326;
        auVar180._24_4_ =
             fVar314 * fVar240 + fVar257 * fVar332 + fVar270 * fVar222 + fVar258 * fVar221;
        auVar180._28_4_ =
             fVar191 + fVar313 + *(float *)(bezier_basis1 + lVar132 + 0x1c) +
                       fVar313 + *(float *)(bezier_basis1 + lVar132 + 0x4a0);
        auVar275._0_4_ =
             fVar339 * fVar259 + fVar349 * fVar328 + fVar202 * fVar331 + fVar300 * fVar237;
        auVar275._4_4_ =
             fVar343 * fVar323 + fVar352 * fVar262 + fVar223 * fVar288 + fVar309 * fVar253;
        auVar275._8_4_ =
             fVar345 * fVar215 + fVar354 * fVar329 + fVar242 * fVar220 + fVar311 * fVar216;
        auVar275._12_4_ =
             fVar347 * fVar325 + fVar356 * fVar327 + fVar214 * fVar299 + fVar313 * fVar238;
        auVar275._16_4_ =
             fVar339 * fVar218 + fVar349 * fVar330 + fVar202 * fVar297 + fVar300 * fVar256;
        auVar275._20_4_ =
             fVar343 * fVar326 + fVar352 * fVar219 + fVar223 * fVar298 + fVar309 * fVar217;
        auVar275._24_4_ =
             fVar345 * fVar221 + fVar354 * fVar332 + fVar242 * fVar222 + fVar311 * fVar240;
        auVar275._28_4_ = fVar318 + *(float *)(bezier_basis0 + lVar132 + 0x122c);
        fVar191 = *(float *)(bezier_basis1 + lVar132 + 0x1b18);
        fVar141 = *(float *)(bezier_basis1 + lVar132 + 0x1b1c);
        fVar159 = *(float *)(bezier_basis1 + lVar132 + 0x1b20);
        fVar161 = *(float *)(bezier_basis1 + lVar132 + 0x1b24);
        fVar163 = *(float *)(bezier_basis1 + lVar132 + 0x1b28);
        fVar165 = *(float *)(bezier_basis1 + lVar132 + 0x1b2c);
        fVar167 = *(float *)(bezier_basis1 + lVar132 + 0x1b30);
        fVar169 = *(float *)(bezier_basis1 + lVar132 + 0x1f9c);
        fVar171 = *(float *)(bezier_basis1 + lVar132 + 0x1fa0);
        fVar201 = *(float *)(bezier_basis1 + lVar132 + 0x1fa4);
        fVar272 = *(float *)(bezier_basis1 + lVar132 + 0x1fa8);
        fVar287 = *(float *)(bezier_basis1 + lVar132 + 0x1fac);
        fVar296 = *(float *)(bezier_basis1 + lVar132 + 0x1fb0);
        fVar274 = *(float *)(bezier_basis1 + lVar132 + 0x1fb4);
        fVar281 = *(float *)(bezier_basis1 + lVar132 + 0x1694);
        fVar282 = *(float *)(bezier_basis1 + lVar132 + 0x1698);
        fVar283 = *(float *)(bezier_basis1 + lVar132 + 0x169c);
        fVar284 = *(float *)(bezier_basis1 + lVar132 + 0x16a0);
        fVar285 = *(float *)(bezier_basis1 + lVar132 + 0x16a4);
        fVar286 = *(float *)(bezier_basis1 + lVar132 + 0x16a8);
        fVar301 = *(float *)(bezier_basis1 + lVar132 + 0x16ac);
        fVar348 = *(float *)(bezier_basis1 + lVar132 + 0x1210);
        fVar351 = *(float *)(bezier_basis1 + lVar132 + 0x1214);
        fVar353 = *(float *)(bezier_basis1 + lVar132 + 0x1218);
        fVar355 = *(float *)(bezier_basis1 + lVar132 + 0x121c);
        fVar101 = *(float *)(bezier_basis1 + lVar132 + 0x1220);
        fVar102 = *(float *)(bezier_basis1 + lVar132 + 0x1224);
        fVar103 = *(float *)(bezier_basis1 + lVar132 + 0x1228);
        auVar292._0_4_ =
             fVar172 * fVar348 + fVar316 * fVar281 + fVar173 * fVar191 + fVar357 * fVar169;
        auVar292._4_4_ =
             fVar273 * fVar351 + fVar317 * fVar282 + fVar188 * fVar141 + fVar361 * fVar171;
        auVar292._8_4_ =
             fVar239 * fVar353 + fVar344 * fVar283 + fVar189 * fVar159 + fVar362 * fVar201;
        auVar292._12_4_ =
             fVar241 * fVar355 + fVar346 * fVar284 + fVar190 * fVar161 + fVar363 * fVar272;
        auVar292._16_4_ =
             fVar172 * fVar101 + fVar316 * fVar285 + fVar173 * fVar163 + fVar357 * fVar287;
        auVar292._20_4_ =
             fVar273 * fVar102 + fVar317 * fVar286 + fVar188 * fVar165 + fVar361 * fVar296;
        auVar292._24_4_ =
             fVar239 * fVar103 + fVar344 * fVar301 + fVar189 * fVar167 + fVar362 * fVar274;
        auVar292._28_4_ = fVar260 + fVar260 + fVar318 + fVar363;
        auVar304._0_4_ =
             fVar310 * fVar348 + fVar244 * fVar281 + fVar243 * fVar191 + fVar263 * fVar169;
        auVar304._4_4_ =
             fVar312 * fVar351 + fVar255 * fVar282 + fVar254 * fVar141 + fVar269 * fVar171;
        auVar304._8_4_ =
             fVar314 * fVar353 + fVar258 * fVar283 + fVar257 * fVar159 + fVar270 * fVar201;
        auVar304._12_4_ =
             fVar315 * fVar355 + fVar261 * fVar284 + fVar260 * fVar161 + fVar271 * fVar272;
        auVar304._16_4_ =
             fVar310 * fVar101 + fVar244 * fVar285 + fVar243 * fVar163 + fVar263 * fVar287;
        auVar304._20_4_ =
             fVar312 * fVar102 + fVar255 * fVar286 + fVar254 * fVar165 + fVar269 * fVar296;
        auVar304._24_4_ =
             fVar314 * fVar103 + fVar258 * fVar301 + fVar257 * fVar167 + fVar270 * fVar274;
        auVar304._28_4_ = fVar260 + fVar260 + fVar260 + fVar318;
        auVar197._0_4_ =
             fVar300 * fVar348 + fVar339 * fVar281 + fVar349 * fVar191 + fVar169 * fVar202;
        auVar197._4_4_ =
             fVar309 * fVar351 + fVar343 * fVar282 + fVar352 * fVar141 + fVar171 * fVar223;
        auVar197._8_4_ =
             fVar311 * fVar353 + fVar345 * fVar283 + fVar354 * fVar159 + fVar201 * fVar242;
        auVar197._12_4_ =
             fVar313 * fVar355 + fVar347 * fVar284 + fVar356 * fVar161 + fVar272 * fVar214;
        auVar197._16_4_ =
             fVar300 * fVar101 + fVar339 * fVar285 + fVar349 * fVar163 + fVar287 * fVar202;
        auVar197._20_4_ =
             fVar309 * fVar102 + fVar343 * fVar286 + fVar352 * fVar165 + fVar296 * fVar223;
        auVar197._24_4_ =
             fVar311 * fVar103 + fVar345 * fVar301 + fVar354 * fVar167 + fVar274 * fVar242;
        auVar197._28_4_ =
             *(float *)(bezier_basis1 + lVar132 + 0x122c) +
             *(float *)(bezier_basis1 + lVar132 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar132 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar132 + 0x1fb8);
        auVar233._8_4_ = 0x7fffffff;
        auVar233._0_8_ = 0x7fffffff7fffffff;
        auVar233._12_4_ = 0x7fffffff;
        auVar233._16_4_ = 0x7fffffff;
        auVar233._20_4_ = 0x7fffffff;
        auVar233._24_4_ = 0x7fffffff;
        auVar233._28_4_ = 0x7fffffff;
        auVar117._4_4_ =
             fVar273 * fVar253 + fVar317 * fVar323 + fVar188 * fVar262 + fVar361 * fVar288;
        auVar117._0_4_ =
             fVar172 * fVar237 + fVar316 * fVar259 + fVar173 * fVar328 + fVar357 * fVar331;
        auVar117._8_4_ =
             fVar239 * fVar216 + fVar344 * fVar215 + fVar189 * fVar329 + fVar362 * fVar220;
        auVar117._12_4_ =
             fVar241 * fVar238 + fVar346 * fVar325 + fVar190 * fVar327 + fVar363 * fVar299;
        auVar117._16_4_ =
             fVar172 * fVar256 + fVar316 * fVar218 + fVar173 * fVar330 + fVar357 * fVar297;
        auVar117._20_4_ =
             fVar273 * fVar217 + fVar317 * fVar326 + fVar188 * fVar219 + fVar361 * fVar298;
        auVar117._24_4_ =
             fVar239 * fVar240 + fVar344 * fVar221 + fVar189 * fVar332 + fVar362 * fVar222;
        auVar117._28_4_ =
             *(float *)(bezier_basis0 + lVar132 + 0x16b0) +
             *(float *)(bezier_basis0 + lVar132 + 0x1fb8) +
             fVar313 + *(float *)(bezier_basis1 + lVar132 + 0x4a0);
        auVar21 = vandps_avx(auVar117,auVar233);
        auVar26 = vandps_avx(auVar180,auVar233);
        auVar26 = vmaxps_avx(auVar21,auVar26);
        auVar21 = vandps_avx(auVar275,auVar233);
        auVar21 = vmaxps_avx(auVar26,auVar21);
        auVar230 = vpermilps_avx(auVar248,0);
        auVar276._16_16_ = auVar230;
        auVar276._0_16_ = auVar230;
        auVar21 = vcmpps_avx(auVar21,auVar276,1);
        auVar15 = vblendvps_avx(auVar117,auVar19,auVar21);
        auVar16 = vblendvps_avx(auVar180,auVar20,auVar21);
        auVar21 = vandps_avx(auVar292,auVar233);
        auVar26 = vandps_avx(auVar304,auVar233);
        auVar208 = vmaxps_avx(auVar21,auVar26);
        auVar21 = vandps_avx(auVar197,auVar233);
        auVar21 = vmaxps_avx(auVar208,auVar21);
        auVar208 = vcmpps_avx(auVar21,auVar276,1);
        auVar21 = vblendvps_avx(auVar292,auVar19,auVar208);
        auVar19 = vblendvps_avx(auVar304,auVar20,auVar208);
        fVar141 = auVar15._0_4_;
        fVar159 = auVar15._4_4_;
        fVar161 = auVar15._8_4_;
        fVar163 = auVar15._12_4_;
        fVar165 = auVar15._16_4_;
        fVar167 = auVar15._20_4_;
        fVar169 = auVar15._24_4_;
        fVar171 = auVar21._0_4_;
        fVar201 = auVar21._4_4_;
        fVar272 = auVar21._8_4_;
        fVar173 = auVar21._12_4_;
        fVar188 = auVar21._16_4_;
        fVar189 = auVar21._20_4_;
        fVar190 = auVar21._24_4_;
        fVar172 = -auVar21._28_4_;
        fVar237 = auVar16._0_4_;
        fVar256 = auVar16._4_4_;
        fVar323 = auVar16._8_4_;
        fVar326 = auVar16._12_4_;
        fVar329 = auVar16._16_4_;
        fVar332 = auVar16._20_4_;
        fVar299 = auVar16._24_4_;
        auVar147._0_4_ = fVar237 * fVar237 + fVar141 * fVar141;
        auVar147._4_4_ = fVar256 * fVar256 + fVar159 * fVar159;
        auVar147._8_4_ = fVar323 * fVar323 + fVar161 * fVar161;
        auVar147._12_4_ = fVar326 * fVar326 + fVar163 * fVar163;
        auVar147._16_4_ = fVar329 * fVar329 + fVar165 * fVar165;
        auVar147._20_4_ = fVar332 * fVar332 + fVar167 * fVar167;
        auVar147._24_4_ = fVar299 * fVar299 + fVar169 * fVar169;
        auVar147._28_4_ = auVar304._28_4_ + auVar15._28_4_;
        auVar20 = vrsqrtps_avx(auVar147);
        fVar253 = auVar20._0_4_;
        fVar216 = auVar20._4_4_;
        auVar22._4_4_ = fVar216 * 1.5;
        auVar22._0_4_ = fVar253 * 1.5;
        fVar238 = auVar20._8_4_;
        auVar22._8_4_ = fVar238 * 1.5;
        fVar217 = auVar20._12_4_;
        auVar22._12_4_ = fVar217 * 1.5;
        fVar240 = auVar20._16_4_;
        auVar22._16_4_ = fVar240 * 1.5;
        fVar259 = auVar20._20_4_;
        auVar22._20_4_ = fVar259 * 1.5;
        fVar215 = auVar20._24_4_;
        fVar191 = auVar26._28_4_;
        auVar22._24_4_ = fVar215 * 1.5;
        auVar22._28_4_ = fVar191;
        auVar20._4_4_ = fVar216 * fVar216 * fVar216 * auVar147._4_4_ * 0.5;
        auVar20._0_4_ = fVar253 * fVar253 * fVar253 * auVar147._0_4_ * 0.5;
        auVar20._8_4_ = fVar238 * fVar238 * fVar238 * auVar147._8_4_ * 0.5;
        auVar20._12_4_ = fVar217 * fVar217 * fVar217 * auVar147._12_4_ * 0.5;
        auVar20._16_4_ = fVar240 * fVar240 * fVar240 * auVar147._16_4_ * 0.5;
        auVar20._20_4_ = fVar259 * fVar259 * fVar259 * auVar147._20_4_ * 0.5;
        auVar20._24_4_ = fVar215 * fVar215 * fVar215 * auVar147._24_4_ * 0.5;
        auVar20._28_4_ = auVar147._28_4_;
        auVar20 = vsubps_avx(auVar22,auVar20);
        fVar253 = auVar20._0_4_;
        fVar217 = auVar20._4_4_;
        fVar215 = auVar20._8_4_;
        fVar221 = auVar20._12_4_;
        fVar327 = auVar20._16_4_;
        fVar331 = auVar20._20_4_;
        fVar297 = auVar20._24_4_;
        fVar216 = auVar19._0_4_;
        fVar240 = auVar19._4_4_;
        fVar325 = auVar19._8_4_;
        fVar328 = auVar19._12_4_;
        fVar330 = auVar19._16_4_;
        fVar288 = auVar19._20_4_;
        fVar298 = auVar19._24_4_;
        auVar148._0_4_ = fVar216 * fVar216 + fVar171 * fVar171;
        auVar148._4_4_ = fVar240 * fVar240 + fVar201 * fVar201;
        auVar148._8_4_ = fVar325 * fVar325 + fVar272 * fVar272;
        auVar148._12_4_ = fVar328 * fVar328 + fVar173 * fVar173;
        auVar148._16_4_ = fVar330 * fVar330 + fVar188 * fVar188;
        auVar148._20_4_ = fVar288 * fVar288 + fVar189 * fVar189;
        auVar148._24_4_ = fVar298 * fVar298 + fVar190 * fVar190;
        auVar148._28_4_ = auVar21._28_4_ + auVar20._28_4_;
        auVar21 = vrsqrtps_avx(auVar148);
        fVar238 = auVar21._0_4_;
        fVar259 = auVar21._4_4_;
        auVar23._4_4_ = fVar259 * 1.5;
        auVar23._0_4_ = fVar238 * 1.5;
        fVar218 = auVar21._8_4_;
        auVar23._8_4_ = fVar218 * 1.5;
        fVar262 = auVar21._12_4_;
        auVar23._12_4_ = fVar262 * 1.5;
        fVar219 = auVar21._16_4_;
        auVar23._16_4_ = fVar219 * 1.5;
        fVar220 = auVar21._20_4_;
        auVar23._20_4_ = fVar220 * 1.5;
        fVar222 = auVar21._24_4_;
        auVar23._24_4_ = fVar222 * 1.5;
        auVar23._28_4_ = fVar191;
        auVar24._4_4_ = fVar259 * fVar259 * fVar259 * auVar148._4_4_ * 0.5;
        auVar24._0_4_ = fVar238 * fVar238 * fVar238 * auVar148._0_4_ * 0.5;
        auVar24._8_4_ = fVar218 * fVar218 * fVar218 * auVar148._8_4_ * 0.5;
        auVar24._12_4_ = fVar262 * fVar262 * fVar262 * auVar148._12_4_ * 0.5;
        auVar24._16_4_ = fVar219 * fVar219 * fVar219 * auVar148._16_4_ * 0.5;
        auVar24._20_4_ = fVar220 * fVar220 * fVar220 * auVar148._20_4_ * 0.5;
        auVar24._24_4_ = fVar222 * fVar222 * fVar222 * auVar148._24_4_ * 0.5;
        auVar24._28_4_ = auVar148._28_4_;
        auVar21 = vsubps_avx(auVar23,auVar24);
        fVar238 = auVar21._0_4_;
        fVar259 = auVar21._4_4_;
        fVar218 = auVar21._8_4_;
        fVar262 = auVar21._12_4_;
        fVar219 = auVar21._16_4_;
        fVar220 = auVar21._20_4_;
        fVar222 = auVar21._24_4_;
        fVar237 = fVar140 * fVar237 * fVar253;
        fVar256 = fVar158 * fVar256 * fVar217;
        auVar25._4_4_ = fVar256;
        auVar25._0_4_ = fVar237;
        fVar323 = fVar160 * fVar323 * fVar215;
        auVar25._8_4_ = fVar323;
        fVar326 = fVar162 * fVar326 * fVar221;
        auVar25._12_4_ = fVar326;
        fVar329 = fVar164 * fVar329 * fVar327;
        auVar25._16_4_ = fVar329;
        fVar332 = fVar166 * fVar332 * fVar331;
        auVar25._20_4_ = fVar332;
        fVar299 = fVar168 * fVar299 * fVar297;
        auVar25._24_4_ = fVar299;
        auVar25._28_4_ = fVar172;
        local_900._4_4_ = fVar256 + auVar324._4_4_;
        local_900._0_4_ = fVar237 + auVar324._0_4_;
        fStack_8f8 = fVar323 + auVar324._8_4_;
        fStack_8f4 = fVar326 + auVar324._12_4_;
        fStack_8f0 = fVar329 + auVar324._16_4_;
        fStack_8ec = fVar332 + auVar324._20_4_;
        fStack_8e8 = fVar299 + auVar324._24_4_;
        fStack_8e4 = fVar172 + auVar324._28_4_;
        fVar237 = fVar140 * fVar253 * -fVar141;
        fVar256 = fVar158 * fVar217 * -fVar159;
        auVar27._4_4_ = fVar256;
        auVar27._0_4_ = fVar237;
        fVar323 = fVar160 * fVar215 * -fVar161;
        auVar27._8_4_ = fVar323;
        fVar326 = fVar162 * fVar221 * -fVar163;
        auVar27._12_4_ = fVar326;
        fVar329 = fVar164 * fVar327 * -fVar165;
        auVar27._16_4_ = fVar329;
        fVar332 = fVar166 * fVar331 * -fVar167;
        auVar27._20_4_ = fVar332;
        fVar299 = fVar168 * fVar297 * -fVar169;
        auVar27._24_4_ = fVar299;
        auVar27._28_4_ = fVar191;
        local_800._4_4_ = fVar256 + auVar266._4_4_;
        local_800._0_4_ = fVar237 + auVar266._0_4_;
        uStack_7f8._0_4_ = fVar323 + auVar266._8_4_;
        uStack_7f8._4_4_ = fVar326 + auVar266._12_4_;
        fStack_7f0 = fVar329 + auVar266._16_4_;
        fStack_7ec = fVar332 + auVar266._20_4_;
        fStack_7e8 = fVar299 + auVar266._24_4_;
        fStack_7e4 = fVar191 + auVar266._28_4_;
        fVar237 = fVar253 * 0.0 * fVar140;
        fVar253 = fVar217 * 0.0 * fVar158;
        auVar28._4_4_ = fVar253;
        auVar28._0_4_ = fVar237;
        fVar256 = fVar215 * 0.0 * fVar160;
        auVar28._8_4_ = fVar256;
        fVar217 = fVar221 * 0.0 * fVar162;
        auVar28._12_4_ = fVar217;
        fVar323 = fVar327 * 0.0 * fVar164;
        auVar28._16_4_ = fVar323;
        fVar215 = fVar331 * 0.0 * fVar166;
        auVar28._20_4_ = fVar215;
        fVar326 = fVar297 * 0.0 * fVar168;
        auVar28._24_4_ = fVar326;
        auVar28._28_4_ = fVar271;
        auVar277._0_4_ = fVar237 + (float)local_7e0._0_4_;
        auVar277._4_4_ = fVar253 + (float)local_7e0._4_4_;
        auVar277._8_4_ = fVar256 + fStack_7d8;
        auVar277._12_4_ = fVar217 + fStack_7d4;
        auVar277._16_4_ = fVar323 + fStack_7d0;
        auVar277._20_4_ = fVar215 + fStack_7cc;
        auVar277._24_4_ = fVar326 + fStack_7c8;
        auVar277._28_4_ = fVar271 + fStack_7c4;
        fVar237 = auVar358._0_4_ * fVar216 * fVar238;
        fVar253 = auVar358._4_4_ * fVar240 * fVar259;
        auVar29._4_4_ = fVar253;
        auVar29._0_4_ = fVar237;
        fVar216 = auVar358._8_4_ * fVar325 * fVar218;
        auVar29._8_4_ = fVar216;
        fVar256 = auVar358._12_4_ * fVar328 * fVar262;
        auVar29._12_4_ = fVar256;
        fVar217 = auVar358._16_4_ * fVar330 * fVar219;
        auVar29._16_4_ = fVar217;
        fVar240 = auVar358._20_4_ * fVar288 * fVar220;
        auVar29._20_4_ = fVar240;
        fVar323 = auVar358._24_4_ * fVar298 * fVar222;
        auVar29._24_4_ = fVar323;
        auVar29._28_4_ = auVar19._28_4_;
        auVar208 = vsubps_avx(auVar324,auVar25);
        auVar305._0_4_ = auVar232._0_4_ + fVar237;
        auVar305._4_4_ = auVar232._4_4_ + fVar253;
        auVar305._8_4_ = auVar232._8_4_ + fVar216;
        auVar305._12_4_ = auVar232._12_4_ + fVar256;
        auVar305._16_4_ = auVar232._16_4_ + fVar217;
        auVar305._20_4_ = auVar232._20_4_ + fVar240;
        auVar305._24_4_ = auVar232._24_4_ + fVar323;
        auVar305._28_4_ = auVar232._28_4_ + auVar19._28_4_;
        fVar237 = auVar358._0_4_ * -fVar171 * fVar238;
        fVar253 = auVar358._4_4_ * -fVar201 * fVar259;
        auVar19._4_4_ = fVar253;
        auVar19._0_4_ = fVar237;
        fVar216 = auVar358._8_4_ * -fVar272 * fVar218;
        auVar19._8_4_ = fVar216;
        fVar256 = auVar358._12_4_ * -fVar173 * fVar262;
        auVar19._12_4_ = fVar256;
        fVar217 = auVar358._16_4_ * -fVar188 * fVar219;
        auVar19._16_4_ = fVar217;
        fVar240 = auVar358._20_4_ * -fVar189 * fVar220;
        auVar19._20_4_ = fVar240;
        fVar323 = auVar358._24_4_ * -fVar190 * fVar222;
        auVar19._24_4_ = fVar323;
        auVar19._28_4_ = fVar347;
        auVar266 = vsubps_avx(auVar266,auVar27);
        auVar319._0_4_ = fVar237 + auVar207._0_4_;
        auVar319._4_4_ = fVar253 + auVar207._4_4_;
        auVar319._8_4_ = fVar216 + auVar207._8_4_;
        auVar319._12_4_ = fVar256 + auVar207._12_4_;
        auVar319._16_4_ = fVar217 + auVar207._16_4_;
        auVar319._20_4_ = fVar240 + auVar207._20_4_;
        auVar319._24_4_ = fVar323 + auVar207._24_4_;
        auVar319._28_4_ = fVar347 + auVar207._28_4_;
        fVar237 = fVar238 * 0.0 * auVar358._0_4_;
        fVar253 = fVar259 * 0.0 * auVar358._4_4_;
        auVar30._4_4_ = fVar253;
        auVar30._0_4_ = fVar237;
        fVar216 = fVar218 * 0.0 * auVar358._8_4_;
        auVar30._8_4_ = fVar216;
        fVar238 = fVar262 * 0.0 * auVar358._12_4_;
        auVar30._12_4_ = fVar238;
        fVar256 = fVar219 * 0.0 * auVar358._16_4_;
        auVar30._16_4_ = fVar256;
        fVar217 = fVar220 * 0.0 * auVar358._20_4_;
        auVar30._20_4_ = fVar217;
        fVar240 = fVar222 * 0.0 * auVar358._24_4_;
        auVar30._24_4_ = fVar240;
        auVar30._28_4_ = fVar356;
        auVar324 = vsubps_avx(_local_7e0,auVar28);
        auVar119._4_4_ = fStack_61c;
        auVar119._0_4_ = local_620;
        auVar119._8_4_ = fStack_618;
        auVar119._12_4_ = fStack_614;
        auVar119._16_4_ = fStack_610;
        auVar119._20_4_ = fStack_60c;
        auVar119._24_4_ = fStack_608;
        auVar119._28_4_ = fStack_604;
        auVar359._0_4_ = fVar237 + local_620;
        auVar359._4_4_ = fVar253 + fStack_61c;
        auVar359._8_4_ = fVar216 + fStack_618;
        auVar359._12_4_ = fVar238 + fStack_614;
        auVar359._16_4_ = fVar256 + fStack_610;
        auVar359._20_4_ = fVar217 + fStack_60c;
        auVar359._24_4_ = fVar240 + fStack_608;
        auVar359._28_4_ = fVar356 + fStack_604;
        auVar21 = vsubps_avx(auVar232,auVar29);
        auVar19 = vsubps_avx(auVar207,auVar19);
        auVar20 = vsubps_avx(auVar119,auVar30);
        auVar26 = vsubps_avx(auVar319,auVar266);
        auVar15 = vsubps_avx(auVar359,auVar324);
        auVar31._4_4_ = auVar324._4_4_ * auVar26._4_4_;
        auVar31._0_4_ = auVar324._0_4_ * auVar26._0_4_;
        auVar31._8_4_ = auVar324._8_4_ * auVar26._8_4_;
        auVar31._12_4_ = auVar324._12_4_ * auVar26._12_4_;
        auVar31._16_4_ = auVar324._16_4_ * auVar26._16_4_;
        auVar31._20_4_ = auVar324._20_4_ * auVar26._20_4_;
        auVar31._24_4_ = auVar324._24_4_ * auVar26._24_4_;
        auVar31._28_4_ = fVar356;
        auVar32._4_4_ = auVar266._4_4_ * auVar15._4_4_;
        auVar32._0_4_ = auVar266._0_4_ * auVar15._0_4_;
        auVar32._8_4_ = auVar266._8_4_ * auVar15._8_4_;
        auVar32._12_4_ = auVar266._12_4_ * auVar15._12_4_;
        auVar32._16_4_ = auVar266._16_4_ * auVar15._16_4_;
        auVar32._20_4_ = auVar266._20_4_ * auVar15._20_4_;
        auVar32._24_4_ = auVar266._24_4_ * auVar15._24_4_;
        auVar32._28_4_ = auVar207._28_4_;
        auVar16 = vsubps_avx(auVar32,auVar31);
        auVar33._4_4_ = auVar208._4_4_ * auVar15._4_4_;
        auVar33._0_4_ = auVar208._0_4_ * auVar15._0_4_;
        auVar33._8_4_ = auVar208._8_4_ * auVar15._8_4_;
        auVar33._12_4_ = auVar208._12_4_ * auVar15._12_4_;
        auVar33._16_4_ = auVar208._16_4_ * auVar15._16_4_;
        auVar33._20_4_ = auVar208._20_4_ * auVar15._20_4_;
        auVar33._24_4_ = auVar208._24_4_ * auVar15._24_4_;
        auVar33._28_4_ = auVar15._28_4_;
        auVar207 = vsubps_avx(auVar305,auVar208);
        auVar34._4_4_ = auVar324._4_4_ * auVar207._4_4_;
        auVar34._0_4_ = auVar324._0_4_ * auVar207._0_4_;
        auVar34._8_4_ = auVar324._8_4_ * auVar207._8_4_;
        auVar34._12_4_ = auVar324._12_4_ * auVar207._12_4_;
        auVar34._16_4_ = auVar324._16_4_ * auVar207._16_4_;
        auVar34._20_4_ = auVar324._20_4_ * auVar207._20_4_;
        auVar34._24_4_ = auVar324._24_4_ * auVar207._24_4_;
        auVar34._28_4_ = auVar232._28_4_;
        auVar232 = vsubps_avx(auVar34,auVar33);
        auVar35._4_4_ = auVar207._4_4_ * auVar266._4_4_;
        auVar35._0_4_ = auVar207._0_4_ * auVar266._0_4_;
        auVar35._8_4_ = auVar207._8_4_ * auVar266._8_4_;
        auVar35._12_4_ = auVar207._12_4_ * auVar266._12_4_;
        auVar35._16_4_ = auVar207._16_4_ * auVar266._16_4_;
        auVar35._20_4_ = auVar207._20_4_ * auVar266._20_4_;
        auVar35._24_4_ = auVar207._24_4_ * auVar266._24_4_;
        auVar35._28_4_ = auVar15._28_4_;
        auVar36._4_4_ = auVar208._4_4_ * auVar26._4_4_;
        auVar36._0_4_ = auVar208._0_4_ * auVar26._0_4_;
        auVar36._8_4_ = auVar208._8_4_ * auVar26._8_4_;
        auVar36._12_4_ = auVar208._12_4_ * auVar26._12_4_;
        auVar36._16_4_ = auVar208._16_4_ * auVar26._16_4_;
        auVar36._20_4_ = auVar208._20_4_ * auVar26._20_4_;
        auVar36._24_4_ = auVar208._24_4_ * auVar26._24_4_;
        auVar36._28_4_ = auVar26._28_4_;
        auVar26 = vsubps_avx(auVar36,auVar35);
        auVar149._0_4_ = auVar16._0_4_ * 0.0 + auVar26._0_4_ + auVar232._0_4_ * 0.0;
        auVar149._4_4_ = auVar16._4_4_ * 0.0 + auVar26._4_4_ + auVar232._4_4_ * 0.0;
        auVar149._8_4_ = auVar16._8_4_ * 0.0 + auVar26._8_4_ + auVar232._8_4_ * 0.0;
        auVar149._12_4_ = auVar16._12_4_ * 0.0 + auVar26._12_4_ + auVar232._12_4_ * 0.0;
        auVar149._16_4_ = auVar16._16_4_ * 0.0 + auVar26._16_4_ + auVar232._16_4_ * 0.0;
        auVar149._20_4_ = auVar16._20_4_ * 0.0 + auVar26._20_4_ + auVar232._20_4_ * 0.0;
        auVar149._24_4_ = auVar16._24_4_ * 0.0 + auVar26._24_4_ + auVar232._24_4_ * 0.0;
        auVar149._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar232._28_4_;
        auVar232 = vcmpps_avx(auVar149,ZEXT432(0) << 0x20,2);
        auVar21 = vblendvps_avx(auVar21,_local_900,auVar232);
        auVar19 = vblendvps_avx(auVar19,_local_800,auVar232);
        auVar20 = vblendvps_avx(auVar20,auVar277,auVar232);
        auVar26 = vblendvps_avx(auVar208,auVar305,auVar232);
        auVar15 = vblendvps_avx(auVar266,auVar319,auVar232);
        auVar16 = vblendvps_avx(auVar324,auVar359,auVar232);
        auVar207 = vblendvps_avx(auVar305,auVar208,auVar232);
        auVar208 = vblendvps_avx(auVar319,auVar266,auVar232);
        auVar230 = vpackssdw_avx(auVar185._0_16_,auVar185._16_16_);
        auVar185 = vblendvps_avx(auVar359,auVar324,auVar232);
        auVar207 = vsubps_avx(auVar207,auVar21);
        auVar266 = vsubps_avx(auVar208,auVar19);
        auVar22 = vsubps_avx(auVar185,auVar20);
        auVar185 = vsubps_avx(auVar19,auVar15);
        fVar237 = auVar266._0_4_;
        fVar169 = auVar20._0_4_;
        fVar217 = auVar266._4_4_;
        fVar171 = auVar20._4_4_;
        auVar37._4_4_ = fVar171 * fVar217;
        auVar37._0_4_ = fVar169 * fVar237;
        fVar325 = auVar266._8_4_;
        fVar201 = auVar20._8_4_;
        auVar37._8_4_ = fVar201 * fVar325;
        fVar262 = auVar266._12_4_;
        fVar272 = auVar20._12_4_;
        auVar37._12_4_ = fVar272 * fVar262;
        fVar332 = auVar266._16_4_;
        fVar173 = auVar20._16_4_;
        auVar37._16_4_ = fVar173 * fVar332;
        fVar297 = auVar266._20_4_;
        fVar188 = auVar20._20_4_;
        auVar37._20_4_ = fVar188 * fVar297;
        fVar159 = auVar266._24_4_;
        fVar189 = auVar20._24_4_;
        auVar37._24_4_ = fVar189 * fVar159;
        auVar37._28_4_ = auVar208._28_4_;
        fVar253 = auVar19._0_4_;
        fVar258 = auVar22._0_4_;
        fVar240 = auVar19._4_4_;
        fVar261 = auVar22._4_4_;
        auVar38._4_4_ = fVar261 * fVar240;
        auVar38._0_4_ = fVar258 * fVar253;
        fVar218 = auVar19._8_4_;
        fVar263 = auVar22._8_4_;
        auVar38._8_4_ = fVar263 * fVar218;
        fVar329 = auVar19._12_4_;
        fVar269 = auVar22._12_4_;
        auVar38._12_4_ = fVar269 * fVar329;
        fVar331 = auVar19._16_4_;
        fVar270 = auVar22._16_4_;
        auVar38._16_4_ = fVar270 * fVar331;
        fVar298 = auVar19._20_4_;
        fVar271 = auVar22._20_4_;
        auVar38._20_4_ = fVar271 * fVar298;
        fVar161 = auVar19._24_4_;
        fVar287 = auVar22._24_4_;
        uVar8 = auVar324._28_4_;
        auVar38._24_4_ = fVar287 * fVar161;
        auVar38._28_4_ = uVar8;
        auVar19 = vsubps_avx(auVar38,auVar37);
        fVar216 = auVar21._0_4_;
        fVar259 = auVar21._4_4_;
        auVar39._4_4_ = fVar261 * fVar259;
        auVar39._0_4_ = fVar258 * fVar216;
        fVar326 = auVar21._8_4_;
        auVar39._8_4_ = fVar263 * fVar326;
        fVar327 = auVar21._12_4_;
        auVar39._12_4_ = fVar269 * fVar327;
        fVar288 = auVar21._16_4_;
        auVar39._16_4_ = fVar270 * fVar288;
        fVar222 = auVar21._20_4_;
        auVar39._20_4_ = fVar271 * fVar222;
        fVar163 = auVar21._24_4_;
        auVar39._24_4_ = fVar287 * fVar163;
        auVar39._28_4_ = uVar8;
        fVar238 = auVar207._0_4_;
        auVar350._0_4_ = fVar169 * fVar238;
        fVar323 = auVar207._4_4_;
        auVar350._4_4_ = fVar171 * fVar323;
        fVar221 = auVar207._8_4_;
        auVar350._8_4_ = fVar201 * fVar221;
        fVar330 = auVar207._12_4_;
        auVar350._12_4_ = fVar272 * fVar330;
        fVar220 = auVar207._16_4_;
        auVar350._16_4_ = fVar173 * fVar220;
        fVar191 = auVar207._20_4_;
        auVar350._20_4_ = fVar188 * fVar191;
        fVar165 = auVar207._24_4_;
        auVar350._24_4_ = fVar189 * fVar165;
        auVar350._28_4_ = 0;
        auVar208 = vsubps_avx(auVar350,auVar39);
        auVar40._4_4_ = fVar240 * fVar323;
        auVar40._0_4_ = fVar253 * fVar238;
        auVar40._8_4_ = fVar218 * fVar221;
        auVar40._12_4_ = fVar329 * fVar330;
        auVar40._16_4_ = fVar331 * fVar220;
        auVar40._20_4_ = fVar298 * fVar191;
        auVar40._24_4_ = fVar161 * fVar165;
        auVar40._28_4_ = uVar8;
        auVar41._4_4_ = fVar259 * fVar217;
        auVar41._0_4_ = fVar216 * fVar237;
        auVar41._8_4_ = fVar326 * fVar325;
        auVar41._12_4_ = fVar327 * fVar262;
        auVar41._16_4_ = fVar288 * fVar332;
        auVar41._20_4_ = fVar222 * fVar297;
        auVar41._24_4_ = fVar163 * fVar159;
        auVar41._28_4_ = auVar359._28_4_;
        auVar324 = vsubps_avx(auVar41,auVar40);
        auVar23 = vsubps_avx(auVar20,auVar16);
        fVar256 = auVar324._28_4_ + auVar208._28_4_;
        auVar278._0_4_ = auVar324._0_4_ + auVar208._0_4_ * 0.0 + auVar19._0_4_ * 0.0;
        auVar278._4_4_ = auVar324._4_4_ + auVar208._4_4_ * 0.0 + auVar19._4_4_ * 0.0;
        auVar278._8_4_ = auVar324._8_4_ + auVar208._8_4_ * 0.0 + auVar19._8_4_ * 0.0;
        auVar278._12_4_ = auVar324._12_4_ + auVar208._12_4_ * 0.0 + auVar19._12_4_ * 0.0;
        auVar278._16_4_ = auVar324._16_4_ + auVar208._16_4_ * 0.0 + auVar19._16_4_ * 0.0;
        auVar278._20_4_ = auVar324._20_4_ + auVar208._20_4_ * 0.0 + auVar19._20_4_ * 0.0;
        auVar278._24_4_ = auVar324._24_4_ + auVar208._24_4_ * 0.0 + auVar19._24_4_ * 0.0;
        auVar278._28_4_ = fVar256 + auVar19._28_4_;
        fVar190 = auVar185._0_4_;
        fVar172 = auVar185._4_4_;
        auVar42._4_4_ = fVar172 * auVar16._4_4_;
        auVar42._0_4_ = fVar190 * auVar16._0_4_;
        fVar273 = auVar185._8_4_;
        auVar42._8_4_ = fVar273 * auVar16._8_4_;
        fVar239 = auVar185._12_4_;
        auVar42._12_4_ = fVar239 * auVar16._12_4_;
        fVar241 = auVar185._16_4_;
        auVar42._16_4_ = fVar241 * auVar16._16_4_;
        fVar244 = auVar185._20_4_;
        auVar42._20_4_ = fVar244 * auVar16._20_4_;
        fVar255 = auVar185._24_4_;
        auVar42._24_4_ = fVar255 * auVar16._24_4_;
        auVar42._28_4_ = fVar256;
        fVar256 = auVar23._0_4_;
        fVar215 = auVar23._4_4_;
        auVar43._4_4_ = auVar15._4_4_ * fVar215;
        auVar43._0_4_ = auVar15._0_4_ * fVar256;
        fVar328 = auVar23._8_4_;
        auVar43._8_4_ = auVar15._8_4_ * fVar328;
        fVar219 = auVar23._12_4_;
        auVar43._12_4_ = auVar15._12_4_ * fVar219;
        fVar299 = auVar23._16_4_;
        auVar43._16_4_ = auVar15._16_4_ * fVar299;
        fVar141 = auVar23._20_4_;
        auVar43._20_4_ = auVar15._20_4_ * fVar141;
        fVar167 = auVar23._24_4_;
        auVar43._24_4_ = auVar15._24_4_ * fVar167;
        auVar43._28_4_ = auVar324._28_4_;
        auVar185 = vsubps_avx(auVar43,auVar42);
        auVar208 = vsubps_avx(auVar21,auVar26);
        fVar296 = auVar208._0_4_;
        fVar274 = auVar208._4_4_;
        auVar44._4_4_ = fVar274 * auVar16._4_4_;
        auVar44._0_4_ = fVar296 * auVar16._0_4_;
        fVar281 = auVar208._8_4_;
        auVar44._8_4_ = fVar281 * auVar16._8_4_;
        fVar282 = auVar208._12_4_;
        auVar44._12_4_ = fVar282 * auVar16._12_4_;
        fVar283 = auVar208._16_4_;
        auVar44._16_4_ = fVar283 * auVar16._16_4_;
        fVar284 = auVar208._20_4_;
        auVar44._20_4_ = fVar284 * auVar16._20_4_;
        fVar285 = auVar208._24_4_;
        auVar44._24_4_ = fVar285 * auVar16._24_4_;
        auVar44._28_4_ = auVar16._28_4_;
        auVar45._4_4_ = auVar26._4_4_ * fVar215;
        auVar45._0_4_ = auVar26._0_4_ * fVar256;
        auVar45._8_4_ = auVar26._8_4_ * fVar328;
        auVar45._12_4_ = auVar26._12_4_ * fVar219;
        auVar45._16_4_ = auVar26._16_4_ * fVar299;
        auVar45._20_4_ = auVar26._20_4_ * fVar141;
        auVar45._24_4_ = auVar26._24_4_ * fVar167;
        auVar45._28_4_ = auVar19._28_4_;
        auVar19 = vsubps_avx(auVar44,auVar45);
        auVar46._4_4_ = auVar15._4_4_ * fVar274;
        auVar46._0_4_ = auVar15._0_4_ * fVar296;
        auVar46._8_4_ = auVar15._8_4_ * fVar281;
        auVar46._12_4_ = auVar15._12_4_ * fVar282;
        auVar46._16_4_ = auVar15._16_4_ * fVar283;
        auVar46._20_4_ = auVar15._20_4_ * fVar284;
        auVar46._24_4_ = auVar15._24_4_ * fVar285;
        auVar46._28_4_ = auVar16._28_4_;
        auVar47._4_4_ = auVar26._4_4_ * fVar172;
        auVar47._0_4_ = auVar26._0_4_ * fVar190;
        auVar47._8_4_ = auVar26._8_4_ * fVar273;
        auVar47._12_4_ = auVar26._12_4_ * fVar239;
        auVar47._16_4_ = auVar26._16_4_ * fVar241;
        auVar47._20_4_ = auVar26._20_4_ * fVar244;
        auVar47._24_4_ = auVar26._24_4_ * fVar255;
        auVar47._28_4_ = auVar26._28_4_;
        auVar26 = vsubps_avx(auVar47,auVar46);
        auVar187 = ZEXT864(0) << 0x20;
        auVar234._0_4_ = auVar185._0_4_ * 0.0 + auVar26._0_4_ + auVar19._0_4_ * 0.0;
        auVar234._4_4_ = auVar185._4_4_ * 0.0 + auVar26._4_4_ + auVar19._4_4_ * 0.0;
        auVar234._8_4_ = auVar185._8_4_ * 0.0 + auVar26._8_4_ + auVar19._8_4_ * 0.0;
        auVar234._12_4_ = auVar185._12_4_ * 0.0 + auVar26._12_4_ + auVar19._12_4_ * 0.0;
        auVar234._16_4_ = auVar185._16_4_ * 0.0 + auVar26._16_4_ + auVar19._16_4_ * 0.0;
        auVar234._20_4_ = auVar185._20_4_ * 0.0 + auVar26._20_4_ + auVar19._20_4_ * 0.0;
        auVar234._24_4_ = auVar185._24_4_ * 0.0 + auVar26._24_4_ + auVar19._24_4_ * 0.0;
        auVar234._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar19._28_4_;
        auVar185 = vmaxps_avx(auVar278,auVar234);
        auVar185 = vcmpps_avx(auVar185,ZEXT832(0) << 0x20,2);
        auVar206 = vpackssdw_avx(auVar185._0_16_,auVar185._16_16_);
        auVar230 = vpand_avx(auVar206,auVar230);
        auVar206 = vpmovsxwd_avx(auVar230);
        auVar143 = vpunpckhwd_avx(auVar230,auVar230);
        auVar209._16_16_ = auVar143;
        auVar209._0_16_ = auVar206;
        if ((((((((auVar209 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar209 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar209 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar209 >> 0x7f,0) == '\0') &&
              (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar143 >> 0x3f,0) == '\0') &&
            (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar143[0xf]) {
LAB_00edbd2a:
          auVar213 = ZEXT3264(auVar209);
          auVar157 = ZEXT3264(CONCAT824(uStack_648,
                                        CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
          auVar293._4_4_ = fVar158;
          auVar293._0_4_ = fVar140;
          auVar293._8_4_ = fVar160;
          auVar293._12_4_ = fVar162;
          auVar293._16_4_ = fVar164;
          auVar293._20_4_ = fVar166;
          auVar293._24_4_ = fVar168;
          auVar293._28_4_ = fVar170;
        }
        else {
          auVar48._4_4_ = fVar215 * fVar217;
          auVar48._0_4_ = fVar256 * fVar237;
          auVar48._8_4_ = fVar328 * fVar325;
          auVar48._12_4_ = fVar219 * fVar262;
          auVar48._16_4_ = fVar299 * fVar332;
          auVar48._20_4_ = fVar141 * fVar297;
          auVar48._24_4_ = fVar167 * fVar159;
          auVar48._28_4_ = auVar143._12_4_;
          auVar334._0_4_ = fVar190 * fVar258;
          auVar334._4_4_ = fVar172 * fVar261;
          auVar334._8_4_ = fVar273 * fVar263;
          auVar334._12_4_ = fVar239 * fVar269;
          auVar334._16_4_ = fVar241 * fVar270;
          auVar334._20_4_ = fVar244 * fVar271;
          auVar334._24_4_ = fVar255 * fVar287;
          auVar334._28_4_ = 0;
          auVar185 = vsubps_avx(auVar334,auVar48);
          auVar49._4_4_ = fVar274 * fVar261;
          auVar49._0_4_ = fVar296 * fVar258;
          auVar49._8_4_ = fVar281 * fVar263;
          auVar49._12_4_ = fVar282 * fVar269;
          auVar49._16_4_ = fVar283 * fVar270;
          auVar49._20_4_ = fVar284 * fVar271;
          auVar49._24_4_ = fVar285 * fVar287;
          auVar49._28_4_ = auVar22._28_4_;
          auVar50._4_4_ = fVar215 * fVar323;
          auVar50._0_4_ = fVar256 * fVar238;
          auVar50._8_4_ = fVar328 * fVar221;
          auVar50._12_4_ = fVar219 * fVar330;
          auVar50._16_4_ = fVar299 * fVar220;
          auVar50._20_4_ = fVar141 * fVar191;
          auVar50._24_4_ = fVar167 * fVar165;
          auVar50._28_4_ = auVar23._28_4_;
          auVar26 = vsubps_avx(auVar50,auVar49);
          auVar51._4_4_ = fVar172 * fVar323;
          auVar51._0_4_ = fVar190 * fVar238;
          auVar51._8_4_ = fVar273 * fVar221;
          auVar51._12_4_ = fVar239 * fVar330;
          auVar51._16_4_ = fVar241 * fVar220;
          auVar51._20_4_ = fVar244 * fVar191;
          auVar51._24_4_ = fVar255 * fVar165;
          auVar51._28_4_ = auVar207._28_4_;
          auVar52._4_4_ = fVar274 * fVar217;
          auVar52._0_4_ = fVar296 * fVar237;
          auVar52._8_4_ = fVar281 * fVar325;
          auVar52._12_4_ = fVar282 * fVar262;
          auVar52._16_4_ = fVar283 * fVar332;
          auVar52._20_4_ = fVar284 * fVar297;
          auVar52._24_4_ = fVar285 * fVar159;
          auVar52._28_4_ = auVar278._28_4_;
          auVar15 = vsubps_avx(auVar52,auVar51);
          auVar279._0_4_ = auVar185._0_4_ * 0.0 + auVar15._0_4_ + auVar26._0_4_ * 0.0;
          auVar279._4_4_ = auVar185._4_4_ * 0.0 + auVar15._4_4_ + auVar26._4_4_ * 0.0;
          auVar279._8_4_ = auVar185._8_4_ * 0.0 + auVar15._8_4_ + auVar26._8_4_ * 0.0;
          auVar279._12_4_ = auVar185._12_4_ * 0.0 + auVar15._12_4_ + auVar26._12_4_ * 0.0;
          auVar279._16_4_ = auVar185._16_4_ * 0.0 + auVar15._16_4_ + auVar26._16_4_ * 0.0;
          auVar279._20_4_ = auVar185._20_4_ * 0.0 + auVar15._20_4_ + auVar26._20_4_ * 0.0;
          auVar279._24_4_ = auVar185._24_4_ * 0.0 + auVar15._24_4_ + auVar26._24_4_ * 0.0;
          auVar279._28_4_ = auVar278._28_4_ + auVar15._28_4_ + auVar207._28_4_;
          auVar19 = vrcpps_avx(auVar279);
          fVar237 = auVar19._0_4_;
          fVar238 = auVar19._4_4_;
          auVar53._4_4_ = auVar279._4_4_ * fVar238;
          auVar53._0_4_ = auVar279._0_4_ * fVar237;
          fVar256 = auVar19._8_4_;
          auVar53._8_4_ = auVar279._8_4_ * fVar256;
          fVar217 = auVar19._12_4_;
          auVar53._12_4_ = auVar279._12_4_ * fVar217;
          fVar323 = auVar19._16_4_;
          auVar53._16_4_ = auVar279._16_4_ * fVar323;
          fVar215 = auVar19._20_4_;
          auVar53._20_4_ = auVar279._20_4_ * fVar215;
          fVar325 = auVar19._24_4_;
          auVar53._24_4_ = auVar279._24_4_ * fVar325;
          auVar53._28_4_ = auVar23._28_4_;
          auVar335._8_4_ = 0x3f800000;
          auVar335._0_8_ = &DAT_3f8000003f800000;
          auVar335._12_4_ = 0x3f800000;
          auVar335._16_4_ = 0x3f800000;
          auVar335._20_4_ = 0x3f800000;
          auVar335._24_4_ = 0x3f800000;
          auVar335._28_4_ = 0x3f800000;
          auVar16 = vsubps_avx(auVar335,auVar53);
          fVar237 = auVar16._0_4_ * fVar237 + fVar237;
          fVar238 = auVar16._4_4_ * fVar238 + fVar238;
          fVar256 = auVar16._8_4_ * fVar256 + fVar256;
          fVar217 = auVar16._12_4_ * fVar217 + fVar217;
          fVar323 = auVar16._16_4_ * fVar323 + fVar323;
          fVar215 = auVar16._20_4_ * fVar215 + fVar215;
          fVar325 = auVar16._24_4_ * fVar325 + fVar325;
          auVar54._4_4_ =
               (auVar185._4_4_ * fVar259 + auVar26._4_4_ * fVar240 + auVar15._4_4_ * fVar171) *
               fVar238;
          auVar54._0_4_ =
               (auVar185._0_4_ * fVar216 + auVar26._0_4_ * fVar253 + auVar15._0_4_ * fVar169) *
               fVar237;
          auVar54._8_4_ =
               (auVar185._8_4_ * fVar326 + auVar26._8_4_ * fVar218 + auVar15._8_4_ * fVar201) *
               fVar256;
          auVar54._12_4_ =
               (auVar185._12_4_ * fVar327 + auVar26._12_4_ * fVar329 + auVar15._12_4_ * fVar272) *
               fVar217;
          auVar54._16_4_ =
               (auVar185._16_4_ * fVar288 + auVar26._16_4_ * fVar331 + auVar15._16_4_ * fVar173) *
               fVar323;
          auVar54._20_4_ =
               (auVar185._20_4_ * fVar222 + auVar26._20_4_ * fVar298 + auVar15._20_4_ * fVar188) *
               fVar215;
          auVar54._24_4_ =
               (auVar185._24_4_ * fVar163 + auVar26._24_4_ * fVar161 + auVar15._24_4_ * fVar189) *
               fVar325;
          auVar54._28_4_ = auVar21._28_4_ + auVar266._28_4_ + auVar20._28_4_;
          auVar206 = vpermilps_avx(ZEXT416(uVar9),0);
          auVar210._16_16_ = auVar206;
          auVar210._0_16_ = auVar206;
          auVar185 = vcmpps_avx(auVar210,auVar54,2);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar249._4_4_ = uVar8;
          auVar249._0_4_ = uVar8;
          auVar249._8_4_ = uVar8;
          auVar249._12_4_ = uVar8;
          auVar249._16_4_ = uVar8;
          auVar249._20_4_ = uVar8;
          auVar249._24_4_ = uVar8;
          auVar249._28_4_ = uVar8;
          auVar21 = vcmpps_avx(auVar54,auVar249,2);
          auVar185 = vandps_avx(auVar21,auVar185);
          auVar206 = vpackssdw_avx(auVar185._0_16_,auVar185._16_16_);
          auVar230 = vpand_avx(auVar230,auVar206);
          auVar206 = vpmovsxwd_avx(auVar230);
          auVar143 = vpshufd_avx(auVar230,0xee);
          auVar143 = vpmovsxwd_avx(auVar143);
          auVar209._16_16_ = auVar143;
          auVar209._0_16_ = auVar206;
          if ((((((((auVar209 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar209 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar209 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar209 >> 0x7f,0) == '\0') &&
                (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar143 >> 0x3f,0) == '\0') &&
              (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar143[0xf]) goto LAB_00edbd2a;
          auVar185 = vcmpps_avx(ZEXT832(0) << 0x20,auVar279,4);
          auVar206 = vpackssdw_avx(auVar185._0_16_,auVar185._16_16_);
          auVar230 = vpand_avx(auVar230,auVar206);
          auVar206 = vpmovsxwd_avx(auVar230);
          auVar230 = vpunpckhwd_avx(auVar230,auVar230);
          auVar213 = ZEXT1664(auVar230);
          auVar267._16_16_ = auVar230;
          auVar267._0_16_ = auVar206;
          auVar157 = ZEXT3264(CONCAT824(uStack_648,
                                        CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
          auVar293._4_4_ = fVar158;
          auVar293._0_4_ = fVar140;
          auVar293._8_4_ = fVar160;
          auVar293._12_4_ = fVar162;
          auVar293._16_4_ = fVar164;
          auVar293._20_4_ = fVar166;
          auVar293._24_4_ = fVar168;
          auVar293._28_4_ = fVar170;
          if ((((((((auVar267 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar267 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar267 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar267 >> 0x7f,0) != '\0') ||
                (auVar267 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar230 >> 0x3f,0) != '\0') ||
              (auVar267 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar230[0xf] < '\0') {
            auVar211._0_4_ = auVar278._0_4_ * fVar237;
            auVar211._4_4_ = auVar278._4_4_ * fVar238;
            auVar211._8_4_ = auVar278._8_4_ * fVar256;
            auVar211._12_4_ = auVar278._12_4_ * fVar217;
            auVar211._16_4_ = auVar278._16_4_ * fVar323;
            auVar211._20_4_ = auVar278._20_4_ * fVar215;
            auVar211._24_4_ = auVar278._24_4_ * fVar325;
            auVar211._28_4_ = 0;
            auVar55._4_4_ = auVar234._4_4_ * fVar238;
            auVar55._0_4_ = auVar234._0_4_ * fVar237;
            auVar55._8_4_ = auVar234._8_4_ * fVar256;
            auVar55._12_4_ = auVar234._12_4_ * fVar217;
            auVar55._16_4_ = auVar234._16_4_ * fVar323;
            auVar55._20_4_ = auVar234._20_4_ * fVar215;
            auVar55._24_4_ = auVar234._24_4_ * fVar325;
            auVar55._28_4_ = auVar16._28_4_ + auVar19._28_4_;
            auVar250._8_4_ = 0x3f800000;
            auVar250._0_8_ = &DAT_3f8000003f800000;
            auVar250._12_4_ = 0x3f800000;
            auVar250._16_4_ = 0x3f800000;
            auVar250._20_4_ = 0x3f800000;
            auVar250._24_4_ = 0x3f800000;
            auVar250._28_4_ = 0x3f800000;
            auVar185 = vsubps_avx(auVar250,auVar211);
            local_e0 = vblendvps_avx(auVar185,auVar211,auVar232);
            auVar185 = vsubps_avx(auVar250,auVar55);
            auVar213 = ZEXT3264(auVar185);
            _local_540 = vblendvps_avx(auVar185,auVar55,auVar232);
            auVar157 = ZEXT3264(auVar267);
            local_360 = auVar54;
          }
        }
        auVar322 = ZEXT3264(local_720);
        auVar308 = ZEXT3264(auVar303);
        auVar185 = auVar157._0_32_;
        if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar185 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar185 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar185 >> 0x7f,0) != '\0') ||
              (auVar157 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar185 >> 0xbf,0) != '\0') ||
            (auVar157 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar157[0x1f] < '\0') {
          auVar21 = vsubps_avx(auVar358,auVar293);
          auVar213 = ZEXT3264(local_e0);
          fVar253 = auVar293._0_4_ + auVar21._0_4_ * local_e0._0_4_;
          fVar216 = auVar293._4_4_ + auVar21._4_4_ * local_e0._4_4_;
          fVar238 = auVar293._8_4_ + auVar21._8_4_ * local_e0._8_4_;
          fVar256 = auVar293._12_4_ + auVar21._12_4_ * local_e0._12_4_;
          fVar217 = auVar293._16_4_ + auVar21._16_4_ * local_e0._16_4_;
          fVar240 = auVar293._20_4_ + auVar21._20_4_ * local_e0._20_4_;
          fVar259 = auVar293._24_4_ + auVar21._24_4_ * local_e0._24_4_;
          fVar323 = auVar293._28_4_ + auVar21._28_4_;
          fVar237 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar56._4_4_ = (fVar216 + fVar216) * fVar237;
          auVar56._0_4_ = (fVar253 + fVar253) * fVar237;
          auVar56._8_4_ = (fVar238 + fVar238) * fVar237;
          auVar56._12_4_ = (fVar256 + fVar256) * fVar237;
          auVar56._16_4_ = (fVar217 + fVar217) * fVar237;
          auVar56._20_4_ = (fVar240 + fVar240) * fVar237;
          auVar56._24_4_ = (fVar259 + fVar259) * fVar237;
          auVar56._28_4_ = fVar323 + fVar323;
          auVar21 = vcmpps_avx(local_360,auVar56,6);
          auVar19 = auVar185 & auVar21;
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0x7f,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar19 >> 0xbf,0) != '\0') ||
              (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar19[0x1f] < '\0') {
            local_420 = vandps_avx(auVar21,auVar185);
            local_4c0._0_4_ = (float)local_540._0_4_ + (float)local_540._0_4_ + -1.0;
            local_4c0._4_4_ = (float)local_540._4_4_ + (float)local_540._4_4_ + -1.0;
            fStack_4b8 = (float)uStack_538 + (float)uStack_538 + -1.0;
            fStack_4b4 = uStack_538._4_4_ + uStack_538._4_4_ + -1.0;
            fStack_4b0 = (float)uStack_530 + (float)uStack_530 + -1.0;
            fStack_4ac = uStack_530._4_4_ + uStack_530._4_4_ + -1.0;
            fStack_4a8 = (float)uStack_528 + (float)uStack_528 + -1.0;
            fStack_4a4 = uStack_528._4_4_ + uStack_528._4_4_ + -1.0;
            local_4e0 = local_e0;
            local_4a0 = local_360;
            local_480 = 0;
            local_670._0_8_ = auVar231._0_8_;
            local_670._8_8_ = auVar231._8_8_;
            local_460 = local_670._0_8_;
            uStack_458 = local_670._8_8_;
            local_5f0._0_8_ = auVar17._0_8_;
            local_5f0._8_8_ = auVar17._8_8_;
            local_450 = local_5f0._0_8_;
            uStack_448 = local_5f0._8_8_;
            local_600._0_8_ = auVar18._0_8_;
            local_600._8_8_ = auVar18._8_8_;
            local_440 = local_600._0_8_;
            uStack_438 = local_600._8_8_;
            local_540._4_4_ = local_4c0._4_4_;
            local_540._0_4_ = local_4c0._0_4_;
            uStack_538._0_4_ = fStack_4b8;
            uStack_538._4_4_ = fStack_4b4;
            uStack_530._0_4_ = fStack_4b0;
            uStack_530._4_4_ = fStack_4ac;
            auVar179 = _local_540;
            uStack_528._0_4_ = fStack_4a8;
            uStack_528._4_4_ = fStack_4a4;
            auVar185 = _local_540;
            _local_540 = auVar185;
            if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              bVar130 = false;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar130 = true, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar194._0_4_ = 1.0 / local_5c0;
              auVar194._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar230 = vshufps_avx(auVar194,auVar194,0);
              local_400[0] = auVar230._0_4_ * (local_e0._0_4_ + 0.0);
              local_400[1] = auVar230._4_4_ * (local_e0._4_4_ + 1.0);
              local_400[2] = auVar230._8_4_ * (local_e0._8_4_ + 2.0);
              local_400[3] = auVar230._12_4_ * (local_e0._12_4_ + 3.0);
              fStack_3f0 = auVar230._0_4_ * (local_e0._16_4_ + 4.0);
              fStack_3ec = auVar230._4_4_ * (local_e0._20_4_ + 5.0);
              fStack_3e8 = auVar230._8_4_ * (local_e0._24_4_ + 6.0);
              fStack_3e4 = local_e0._28_4_ + 7.0;
              uStack_530 = auVar179._16_8_;
              uStack_528 = auVar185._24_8_;
              local_3e0 = local_540;
              uStack_3d8 = uStack_538;
              uStack_3d0 = uStack_530;
              uStack_3c8 = uStack_528;
              local_3c0 = local_360;
              iVar131 = vmovmskps_avx(local_420);
              local_920 = CONCAT44((int)((ulong)context >> 0x20),iVar131);
              uVar134 = 0;
              if (local_920 != 0) {
                for (; (local_920 >> uVar134 & 1) == 0; uVar134 = uVar134 + 1) {
                }
              }
              bVar130 = iVar131 != 0;
              if (bVar130) {
                auVar230 = vshufps_avx(ZEXT416(uVar135),ZEXT416(uVar135),0);
                register0x00001210 = auVar230;
                _local_740 = auVar230;
                auVar230 = vshufps_avx(ZEXT416(uVar133),ZEXT416(uVar133),0);
                _auStack_6b0 = auVar230;
                _local_6c0 = auVar230;
                local_6e0 = (float)*(undefined8 *)*local_780;
                fStack_6dc = (float)((ulong)*(undefined8 *)*local_780 >> 0x20);
                fStack_6d8 = (float)*(undefined8 *)(*local_780 + 8);
                fStack_6d4 = (float)((ulong)*(undefined8 *)(*local_780 + 8) >> 0x20);
                fStack_6d0 = (float)*local_788;
                fStack_6cc = (float)((ulong)*local_788 >> 0x20);
                fStack_6c8 = (float)local_788[1];
                fStack_6c4 = (float)((ulong)local_788[1] >> 0x20);
                _local_700 = auVar303;
                _local_520 = *pauVar1;
                local_47c = uVar11;
                do {
                  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_220 = local_400[uVar134];
                  local_200 = *(undefined4 *)((long)&local_3e0 + uVar134 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar134 * 4);
                  fVar253 = 1.0 - local_220;
                  fVar237 = local_220 * fVar253 + local_220 * fVar253;
                  auVar230 = ZEXT416((uint)(local_220 * local_220 * 3.0));
                  auVar230 = vshufps_avx(auVar230,auVar230,0);
                  local_800._0_4_ = auVar18._0_4_;
                  local_800._4_4_ = auVar18._4_4_;
                  uStack_7f8._0_4_ = auVar18._8_4_;
                  uStack_7f8._4_4_ = auVar18._12_4_;
                  auVar206 = ZEXT416((uint)((fVar237 - local_220 * local_220) * 3.0));
                  auVar206 = vshufps_avx(auVar206,auVar206,0);
                  local_900._0_4_ = auVar17._0_4_;
                  local_900._4_4_ = auVar17._4_4_;
                  fStack_8f8 = auVar17._8_4_;
                  fStack_8f4 = auVar17._12_4_;
                  auVar143 = ZEXT416((uint)((fVar253 * fVar253 - fVar237) * 3.0));
                  auVar143 = vshufps_avx(auVar143,auVar143,0);
                  local_7e0._0_4_ = auVar231._0_4_;
                  local_7e0._4_4_ = auVar231._4_4_;
                  fStack_7d8 = auVar231._8_4_;
                  fStack_7d4 = auVar231._12_4_;
                  local_770.context = context->user;
                  auVar144 = ZEXT416((uint)(fVar253 * fVar253 * -3.0));
                  auVar144 = vshufps_avx(auVar144,auVar144,0);
                  auVar195._0_4_ =
                       local_970 * auVar144._0_4_ +
                       auVar143._0_4_ * (float)local_7e0._0_4_ +
                       auVar230._0_4_ * (float)local_800._0_4_ +
                       auVar206._0_4_ * (float)local_900._0_4_;
                  auVar195._4_4_ =
                       fStack_96c * auVar144._4_4_ +
                       auVar143._4_4_ * (float)local_7e0._4_4_ +
                       auVar230._4_4_ * (float)local_800._4_4_ +
                       auVar206._4_4_ * (float)local_900._4_4_;
                  auVar195._8_4_ =
                       fStack_968 * auVar144._8_4_ +
                       auVar143._8_4_ * fStack_7d8 +
                       auVar230._8_4_ * (float)uStack_7f8 + auVar206._8_4_ * fStack_8f8;
                  auVar195._12_4_ =
                       fStack_964 * auVar144._12_4_ +
                       auVar143._12_4_ * fStack_7d4 +
                       auVar230._12_4_ * uStack_7f8._4_4_ + auVar206._12_4_ * fStack_8f4;
                  local_270 = vshufps_avx(auVar195,auVar195,0);
                  local_280[0] = (RTCHitN)local_270[0];
                  local_280[1] = (RTCHitN)local_270[1];
                  local_280[2] = (RTCHitN)local_270[2];
                  local_280[3] = (RTCHitN)local_270[3];
                  local_280[4] = (RTCHitN)local_270[4];
                  local_280[5] = (RTCHitN)local_270[5];
                  local_280[6] = (RTCHitN)local_270[6];
                  local_280[7] = (RTCHitN)local_270[7];
                  local_280[8] = (RTCHitN)local_270[8];
                  local_280[9] = (RTCHitN)local_270[9];
                  local_280[10] = (RTCHitN)local_270[10];
                  local_280[0xb] = (RTCHitN)local_270[0xb];
                  local_280[0xc] = (RTCHitN)local_270[0xc];
                  local_280[0xd] = (RTCHitN)local_270[0xd];
                  local_280[0xe] = (RTCHitN)local_270[0xe];
                  local_280[0xf] = (RTCHitN)local_270[0xf];
                  local_250 = vshufps_avx(auVar195,auVar195,0x55);
                  auVar213 = ZEXT1664(local_250);
                  local_260 = local_250;
                  local_230 = vshufps_avx(auVar195,auVar195,0xaa);
                  local_240 = local_230;
                  fStack_21c = local_220;
                  fStack_218 = local_220;
                  fStack_214 = local_220;
                  fStack_210 = local_220;
                  fStack_20c = local_220;
                  fStack_208 = local_220;
                  fStack_204 = local_220;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_6c0;
                  uStack_1d8 = uStack_6b8;
                  uStack_1d0 = auStack_6b0;
                  uStack_1c8 = uStack_6a8;
                  local_1c0 = local_740;
                  uStack_1b8 = uStack_738;
                  uStack_1b0 = uStack_730;
                  uStack_1a8 = uStack_728;
                  auVar185 = vcmpps_avx(auVar187._0_32_,auVar187._0_32_,0xf);
                  local_778[1] = auVar185;
                  *local_778 = auVar185;
                  local_1a0 = (local_770.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_770.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_7c0 = CONCAT44(fStack_6dc,local_6e0);
                  uStack_7b8 = CONCAT44(fStack_6d4,fStack_6d8);
                  uStack_7b0 = CONCAT44(fStack_6cc,fStack_6d0);
                  uStack_7a8 = CONCAT44(fStack_6c4,fStack_6c8);
                  local_770.valid = (int *)&local_7c0;
                  local_770.geometryUserPtr = *(void **)(local_640._0_8_ + 0x18);
                  local_770.hit = local_280;
                  local_770.N = 8;
                  local_770.ray = (RTCRayN *)ray;
                  if (*(code **)(local_640._0_8_ + 0x48) != (code *)0x0) {
                    auVar213 = ZEXT1664(local_250);
                    (**(code **)(local_640._0_8_ + 0x48))(&local_770);
                    auVar308 = ZEXT3264(_local_700);
                    auVar322 = ZEXT3264(local_720);
                    auVar187 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar109._8_8_ = uStack_7b8;
                  auVar109._0_8_ = local_7c0;
                  auVar230 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar109);
                  auVar113._8_8_ = uStack_7a8;
                  auVar113._0_8_ = uStack_7b0;
                  auVar206 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar113);
                  auVar150._16_16_ = auVar206;
                  auVar150._0_16_ = auVar230;
                  auVar21 = auVar185 & ~auVar150;
                  if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar21 >> 0x7f,0) == '\0') &&
                        (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar21 >> 0xbf,0) == '\0') &&
                      (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar21[0x1f]) {
                    auVar151._0_4_ = auVar230._0_4_ ^ auVar185._0_4_;
                    auVar151._4_4_ = auVar230._4_4_ ^ auVar185._4_4_;
                    auVar151._8_4_ = auVar230._8_4_ ^ auVar185._8_4_;
                    auVar151._12_4_ = auVar230._12_4_ ^ auVar185._12_4_;
                    auVar151._16_4_ = auVar206._0_4_ ^ auVar185._16_4_;
                    auVar151._20_4_ = auVar206._4_4_ ^ auVar185._20_4_;
                    auVar151._24_4_ = auVar206._8_4_ ^ auVar185._24_4_;
                    auVar151._28_4_ = auVar206._12_4_ ^ auVar185._28_4_;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_640._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar213 = ZEXT1664(auVar213._0_16_);
                      (*p_Var13)(&local_770);
                      auVar308 = ZEXT3264(_local_700);
                      auVar322 = ZEXT3264(local_720);
                      auVar187 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar110._8_8_ = uStack_7b8;
                    auVar110._0_8_ = local_7c0;
                    auVar230 = vpcmpeqd_avx((undefined1  [16])0x0,auVar110);
                    auVar114._8_8_ = uStack_7a8;
                    auVar114._0_8_ = uStack_7b0;
                    auVar206 = vpcmpeqd_avx((undefined1  [16])0x0,auVar114);
                    auVar181._16_16_ = auVar206;
                    auVar181._0_16_ = auVar230;
                    auVar151._0_4_ = auVar230._0_4_ ^ auVar185._0_4_;
                    auVar151._4_4_ = auVar230._4_4_ ^ auVar185._4_4_;
                    auVar151._8_4_ = auVar230._8_4_ ^ auVar185._8_4_;
                    auVar151._12_4_ = auVar230._12_4_ ^ auVar185._12_4_;
                    auVar151._16_4_ = auVar206._0_4_ ^ auVar185._16_4_;
                    auVar151._20_4_ = auVar206._4_4_ ^ auVar185._20_4_;
                    auVar151._24_4_ = auVar206._8_4_ ^ auVar185._24_4_;
                    auVar151._28_4_ = auVar206._12_4_ ^ auVar185._28_4_;
                    auVar198._8_4_ = 0xff800000;
                    auVar198._0_8_ = 0xff800000ff800000;
                    auVar198._12_4_ = 0xff800000;
                    auVar198._16_4_ = 0xff800000;
                    auVar198._20_4_ = 0xff800000;
                    auVar198._24_4_ = 0xff800000;
                    auVar198._28_4_ = 0xff800000;
                    auVar185 = vblendvps_avx(auVar198,*(undefined1 (*) [32])(local_770.ray + 0x100),
                                             auVar181);
                    *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar185;
                  }
                  auVar303 = auVar308._0_32_;
                  if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar151 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar151 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar151 >> 0x7f,0) != '\0') ||
                        (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar151 >> 0xbf,0) != '\0') ||
                      (auVar151 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar151[0x1f] < '\0') break;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                  local_920 = local_920 ^ 1L << (uVar134 & 0x3f);
                  uVar134 = 0;
                  if (local_920 != 0) {
                    for (; (local_920 >> uVar134 & 1) == 0; uVar134 = uVar134 + 1) {
                    }
                  }
                  bVar130 = local_920 != 0;
                } while (bVar130);
              }
            }
            goto LAB_00eda768;
          }
        }
        bVar130 = false;
      }
LAB_00eda768:
      auVar187 = ZEXT1664(auVar248);
      if (8 < (int)uVar11) {
        _local_520 = vpshufd_avx(ZEXT416(uVar11),0);
        auVar230 = vshufps_avx(auVar248,auVar248,0);
        local_640._16_16_ = auVar230;
        local_640._0_16_ = auVar230;
        auVar230 = vpermilps_avx(ZEXT416(uVar9),0);
        local_100._16_16_ = auVar230;
        local_100._0_16_ = auVar230;
        auVar146._0_4_ = 1.0 / local_5c0;
        auVar146._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar230 = vshufps_avx(auVar146,auVar146,0);
        register0x00001210 = auVar230;
        _local_160 = auVar230;
        auVar230 = vshufps_avx(ZEXT416(uVar135),ZEXT416(uVar135),0);
        local_120._16_16_ = auVar230;
        local_120._0_16_ = auVar230;
        auVar230 = vshufps_avx(ZEXT416((uint)local_5e0._0_4_),ZEXT416((uint)local_5e0._0_4_),0);
        local_140._16_16_ = auVar230;
        local_140._0_16_ = auVar230;
        auVar157 = ZEXT3264(local_140);
        lVar137 = 8;
        fVar237 = (float)local_6a0._0_4_;
        fVar253 = (float)local_6a0._4_4_;
        fVar216 = fStack_698;
        fVar238 = fStack_694;
        fVar256 = fStack_690;
        fVar217 = fStack_68c;
        fVar240 = fStack_688;
        fVar259 = fStack_684;
        _local_700 = auVar303;
        do {
          auVar18 = local_5f0;
          auVar17 = local_600;
          pauVar2 = (undefined1 (*) [28])(bezier_basis0 + lVar137 * 4 + lVar132);
          fVar323 = *(float *)*pauVar2;
          fVar215 = *(float *)(*pauVar2 + 4);
          fVar325 = *(float *)(*pauVar2 + 8);
          fVar218 = *(float *)(*pauVar2 + 0xc);
          fVar326 = *(float *)(*pauVar2 + 0x10);
          fVar221 = *(float *)(*pauVar2 + 0x14);
          fVar328 = *(float *)(*pauVar2 + 0x18);
          auVar126 = *pauVar2;
          pauVar3 = (undefined1 (*) [28])(lVar132 + 0x2227768 + lVar137 * 4);
          fVar262 = *(float *)*pauVar3;
          fVar329 = *(float *)(*pauVar3 + 4);
          fVar327 = *(float *)(*pauVar3 + 8);
          fVar330 = *(float *)(*pauVar3 + 0xc);
          fVar219 = *(float *)(*pauVar3 + 0x10);
          fVar332 = *(float *)(*pauVar3 + 0x14);
          fVar331 = *(float *)(*pauVar3 + 0x18);
          auVar125 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar132 + 0x2227bec + lVar137 * 4);
          fVar288 = *(float *)*pauVar3;
          fVar220 = *(float *)(*pauVar3 + 4);
          fVar299 = *(float *)(*pauVar3 + 8);
          fVar297 = *(float *)(*pauVar3 + 0xc);
          fVar298 = *(float *)(*pauVar3 + 0x10);
          fVar222 = *(float *)(*pauVar3 + 0x14);
          fVar191 = *(float *)(*pauVar3 + 0x18);
          auVar123 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar132 + 0x2228070 + lVar137 * 4);
          fVar141 = *(float *)*pauVar3;
          fVar159 = *(float *)(*pauVar3 + 4);
          fVar161 = *(float *)(*pauVar3 + 8);
          fVar163 = *(float *)(*pauVar3 + 0xc);
          fVar165 = *(float *)(*pauVar3 + 0x10);
          fVar167 = *(float *)(*pauVar3 + 0x14);
          fVar169 = *(float *)(*pauVar3 + 0x18);
          auVar122 = *pauVar3;
          fVar158 = auVar322._0_4_;
          fVar160 = auVar322._4_4_;
          fVar162 = auVar322._8_4_;
          fVar164 = auVar322._12_4_;
          fVar166 = auVar322._16_4_;
          fVar168 = auVar322._20_4_;
          fVar170 = auVar322._24_4_;
          fVar272 = auVar213._28_4_;
          fVar201 = fVar272 + *(float *)pauVar3[1];
          fVar171 = fVar272 + fVar272 + auVar157._28_4_;
          fVar140 = fVar272 + fVar201;
          auVar212._0_4_ =
               (float)local_580._0_4_ * fVar323 +
               (float)local_340._0_4_ * fVar262 +
               fVar288 * fVar237 + (float)local_5a0._0_4_ * fVar141;
          auVar212._4_4_ =
               (float)local_580._4_4_ * fVar215 +
               (float)local_340._4_4_ * fVar329 +
               fVar220 * fVar253 + (float)local_5a0._4_4_ * fVar159;
          auVar212._8_4_ =
               fStack_578 * fVar325 +
               fStack_338 * fVar327 + fVar299 * fVar216 + fStack_598 * fVar161;
          auVar212._12_4_ =
               fStack_574 * fVar218 +
               fStack_334 * fVar330 + fVar297 * fVar238 + fStack_594 * fVar163;
          auVar212._16_4_ =
               fStack_570 * fVar326 +
               fStack_330 * fVar219 + fVar298 * fVar256 + fStack_590 * fVar165;
          auVar212._20_4_ =
               fStack_56c * fVar221 +
               fStack_32c * fVar332 + fVar222 * fVar217 + fStack_58c * fVar167;
          auVar212._24_4_ =
               fStack_568 * fVar328 +
               fStack_328 * fVar331 + fVar191 * fVar240 + fStack_588 * fVar169;
          auVar212._28_4_ = fVar201 + fVar171;
          auVar213 = ZEXT3264(auVar212);
          auVar199._0_4_ =
               (float)local_2c0._0_4_ * fVar323 +
               (float)local_2a0._0_4_ * fVar262 + fVar243 * fVar288 + fVar158 * fVar141;
          auVar199._4_4_ =
               (float)local_2c0._4_4_ * fVar215 +
               (float)local_2a0._4_4_ * fVar329 + fVar254 * fVar220 + fVar160 * fVar159;
          auVar199._8_4_ =
               fStack_2b8 * fVar325 + fStack_298 * fVar327 + fVar257 * fVar299 + fVar162 * fVar161;
          auVar199._12_4_ =
               fStack_2b4 * fVar218 + fStack_294 * fVar330 + fVar260 * fVar297 + fVar164 * fVar163;
          auVar199._16_4_ =
               fStack_2b0 * fVar326 + fStack_290 * fVar219 + fVar243 * fVar298 + fVar166 * fVar165;
          auVar199._20_4_ =
               fStack_2ac * fVar221 + fStack_28c * fVar332 + fVar254 * fVar222 + fVar168 * fVar167;
          auVar199._24_4_ =
               fStack_2a8 * fVar328 + fStack_288 * fVar331 + fVar257 * fVar191 + fVar170 * fVar169;
          auVar199._28_4_ = fVar171 + fVar272 + fVar272 + auVar187._28_4_;
          fVar141 = fVar323 * (float)local_320._0_4_ +
                    fVar262 * (float)local_300._0_4_ +
                    fVar288 * (float)local_2e0._0_4_ + (float)local_80._0_4_ * fVar141;
          fVar159 = fVar215 * (float)local_320._4_4_ +
                    fVar329 * (float)local_300._4_4_ +
                    fVar220 * (float)local_2e0._4_4_ + (float)local_80._4_4_ * fVar159;
          fVar161 = fVar325 * fStack_318 +
                    fVar327 * fStack_2f8 + fVar299 * fStack_2d8 + fStack_78 * fVar161;
          fVar163 = fVar218 * fStack_314 +
                    fVar330 * fStack_2f4 + fVar297 * fStack_2d4 + fStack_74 * fVar163;
          fVar165 = fVar326 * fStack_310 +
                    fVar219 * fStack_2f0 + fVar298 * fStack_2d0 + fStack_70 * fVar165;
          fVar167 = fVar221 * fStack_30c +
                    fVar332 * fStack_2ec + fVar222 * fStack_2cc + fStack_6c * fVar167;
          fVar169 = fVar328 * fStack_308 +
                    fVar331 * fStack_2e8 + fVar191 * fStack_2c8 + fStack_68 * fVar169;
          fVar171 = fVar171 + fVar140;
          auVar179 = *(undefined1 (*) [24])(bezier_basis1 + lVar137 * 4 + lVar132);
          uVar104 = *(undefined8 *)((undefined1 (*) [24])(bezier_basis1 + lVar137 * 4 + lVar132))[1]
          ;
          pauVar3 = (undefined1 (*) [28])(lVar132 + 0x2229b88 + lVar137 * 4);
          fVar262 = *(float *)*pauVar3;
          fVar329 = *(float *)(*pauVar3 + 4);
          fVar327 = *(float *)(*pauVar3 + 8);
          fVar330 = *(float *)(*pauVar3 + 0xc);
          fVar219 = *(float *)(*pauVar3 + 0x10);
          fVar332 = *(float *)(*pauVar3 + 0x14);
          fVar331 = *(float *)(*pauVar3 + 0x18);
          auVar127 = *pauVar3;
          auVar185 = *(undefined1 (*) [32])(lVar132 + 0x222a00c + lVar137 * 4);
          pfVar4 = (float *)(lVar132 + 0x222a490 + lVar137 * 4);
          fVar288 = *pfVar4;
          fVar220 = pfVar4[1];
          fVar299 = pfVar4[2];
          fVar297 = pfVar4[3];
          fVar298 = pfVar4[4];
          fVar222 = pfVar4[5];
          fVar191 = pfVar4[6];
          auVar157 = ZEXT3264(auVar185);
          fVar323 = auVar185._0_4_;
          fVar215 = auVar185._4_4_;
          fVar325 = auVar185._8_4_;
          fVar218 = auVar185._12_4_;
          fVar326 = auVar185._16_4_;
          fVar221 = auVar185._20_4_;
          fVar328 = auVar185._24_4_;
          fVar272 = fVar259 + fStack_64;
          fVar201 = fVar259 + fVar259 + fVar140;
          local_960 = auVar179._0_4_;
          fStack_95c = auVar179._4_4_;
          fStack_958 = auVar179._8_4_;
          fStack_954 = auVar179._12_4_;
          fStack_950 = auVar179._16_4_;
          fStack_94c = auVar179._20_4_;
          fStack_948 = (float)uVar104;
          fStack_944 = (float)((ulong)uVar104 >> 0x20);
          auVar294._0_4_ =
               (float)local_580._0_4_ * local_960 +
               (float)local_340._0_4_ * fVar262 +
               fVar237 * fVar323 + (float)local_5a0._0_4_ * fVar288;
          auVar294._4_4_ =
               (float)local_580._4_4_ * fStack_95c +
               (float)local_340._4_4_ * fVar329 +
               fVar253 * fVar215 + (float)local_5a0._4_4_ * fVar220;
          auVar294._8_4_ =
               fStack_578 * fStack_958 +
               fStack_338 * fVar327 + fVar216 * fVar325 + fStack_598 * fVar299;
          auVar294._12_4_ =
               fStack_574 * fStack_954 +
               fStack_334 * fVar330 + fVar238 * fVar218 + fStack_594 * fVar297;
          auVar294._16_4_ =
               fStack_570 * fStack_950 +
               fStack_330 * fVar219 + fVar256 * fVar326 + fStack_590 * fVar298;
          auVar294._20_4_ =
               fStack_56c * fStack_94c +
               fStack_32c * fVar332 + fVar217 * fVar221 + fStack_58c * fVar222;
          auVar294._24_4_ =
               fStack_568 * fStack_948 +
               fStack_328 * fVar331 + fVar240 * fVar328 + fStack_588 * fVar191;
          auVar294._28_4_ = fVar272 + fVar201;
          auVar251._0_4_ =
               (float)local_2c0._0_4_ * local_960 +
               (float)local_2a0._0_4_ * fVar262 + fVar243 * fVar323 + fVar158 * fVar288;
          auVar251._4_4_ =
               (float)local_2c0._4_4_ * fStack_95c +
               (float)local_2a0._4_4_ * fVar329 + fVar254 * fVar215 + fVar160 * fVar220;
          auVar251._8_4_ =
               fStack_2b8 * fStack_958 +
               fStack_298 * fVar327 + fVar257 * fVar325 + fVar162 * fVar299;
          auVar251._12_4_ =
               fStack_2b4 * fStack_954 +
               fStack_294 * fVar330 + fVar260 * fVar218 + fVar164 * fVar297;
          auVar251._16_4_ =
               fStack_2b0 * fStack_950 +
               fStack_290 * fVar219 + fVar243 * fVar326 + fVar166 * fVar298;
          auVar251._20_4_ =
               fStack_2ac * fStack_94c +
               fStack_28c * fVar332 + fVar254 * fVar221 + fVar168 * fVar222;
          auVar251._24_4_ =
               fStack_2a8 * fStack_948 +
               fStack_288 * fVar331 + fVar257 * fVar328 + fVar170 * fVar191;
          auVar251._28_4_ = fVar201 + fVar259 + fVar259 + *(float *)pauVar2[1];
          auVar280._0_4_ =
               fVar262 * (float)local_300._0_4_ +
               fVar323 * (float)local_2e0._0_4_ + (float)local_80._0_4_ * fVar288 +
               local_960 * (float)local_320._0_4_;
          auVar280._4_4_ =
               fVar329 * (float)local_300._4_4_ +
               fVar215 * (float)local_2e0._4_4_ + (float)local_80._4_4_ * fVar220 +
               fStack_95c * (float)local_320._4_4_;
          auVar280._8_4_ =
               fVar327 * fStack_2f8 + fVar325 * fStack_2d8 + fStack_78 * fVar299 +
               fStack_958 * fStack_318;
          auVar280._12_4_ =
               fVar330 * fStack_2f4 + fVar218 * fStack_2d4 + fStack_74 * fVar297 +
               fStack_954 * fStack_314;
          auVar280._16_4_ =
               fVar219 * fStack_2f0 + fVar326 * fStack_2d0 + fStack_70 * fVar298 +
               fStack_950 * fStack_310;
          auVar280._20_4_ =
               fVar332 * fStack_2ec + fVar221 * fStack_2cc + fStack_6c * fVar222 +
               fStack_94c * fStack_30c;
          auVar280._24_4_ =
               fVar331 * fStack_2e8 + fVar328 * fStack_2c8 + fStack_68 * fVar191 +
               fStack_948 * fStack_308;
          auVar280._28_4_ = fVar259 + fVar272 + fVar201;
          auVar19 = vsubps_avx(auVar294,auVar212);
          auVar20 = vsubps_avx(auVar251,auVar199);
          fVar259 = auVar19._0_4_;
          fVar262 = auVar19._4_4_;
          auVar57._4_4_ = fVar262 * auVar199._4_4_;
          auVar57._0_4_ = fVar259 * auVar199._0_4_;
          fVar329 = auVar19._8_4_;
          auVar57._8_4_ = fVar329 * auVar199._8_4_;
          fVar327 = auVar19._12_4_;
          auVar57._12_4_ = fVar327 * auVar199._12_4_;
          fVar330 = auVar19._16_4_;
          auVar57._16_4_ = fVar330 * auVar199._16_4_;
          fVar219 = auVar19._20_4_;
          auVar57._20_4_ = fVar219 * auVar199._20_4_;
          fVar332 = auVar19._24_4_;
          auVar57._24_4_ = fVar332 * auVar199._24_4_;
          auVar57._28_4_ = fVar201;
          fVar237 = auVar20._0_4_;
          fVar253 = auVar20._4_4_;
          auVar58._4_4_ = fVar253 * auVar212._4_4_;
          auVar58._0_4_ = fVar237 * auVar212._0_4_;
          fVar216 = auVar20._8_4_;
          auVar58._8_4_ = fVar216 * auVar212._8_4_;
          fVar238 = auVar20._12_4_;
          auVar58._12_4_ = fVar238 * auVar212._12_4_;
          fVar256 = auVar20._16_4_;
          auVar58._16_4_ = fVar256 * auVar212._16_4_;
          fVar217 = auVar20._20_4_;
          auVar58._20_4_ = fVar217 * auVar212._20_4_;
          fVar240 = auVar20._24_4_;
          auVar58._24_4_ = fVar240 * auVar212._24_4_;
          auVar58._28_4_ = auVar251._28_4_;
          auVar26 = vsubps_avx(auVar57,auVar58);
          auVar108._4_4_ = fVar159;
          auVar108._0_4_ = fVar141;
          auVar108._8_4_ = fVar161;
          auVar108._12_4_ = fVar163;
          auVar108._16_4_ = fVar165;
          auVar108._20_4_ = fVar167;
          auVar108._24_4_ = fVar169;
          auVar108._28_4_ = fVar171;
          auVar21 = vmaxps_avx(auVar108,auVar280);
          auVar59._4_4_ = auVar21._4_4_ * auVar21._4_4_ * (fVar262 * fVar262 + fVar253 * fVar253);
          auVar59._0_4_ = auVar21._0_4_ * auVar21._0_4_ * (fVar259 * fVar259 + fVar237 * fVar237);
          auVar59._8_4_ = auVar21._8_4_ * auVar21._8_4_ * (fVar329 * fVar329 + fVar216 * fVar216);
          auVar59._12_4_ = auVar21._12_4_ * auVar21._12_4_ * (fVar327 * fVar327 + fVar238 * fVar238)
          ;
          auVar59._16_4_ = auVar21._16_4_ * auVar21._16_4_ * (fVar330 * fVar330 + fVar256 * fVar256)
          ;
          auVar59._20_4_ = auVar21._20_4_ * auVar21._20_4_ * (fVar219 * fVar219 + fVar217 * fVar217)
          ;
          auVar59._24_4_ = auVar21._24_4_ * auVar21._24_4_ * (fVar332 * fVar332 + fVar240 * fVar240)
          ;
          auVar59._28_4_ = fVar272 + auVar251._28_4_;
          auVar60._4_4_ = auVar26._4_4_ * auVar26._4_4_;
          auVar60._0_4_ = auVar26._0_4_ * auVar26._0_4_;
          auVar60._8_4_ = auVar26._8_4_ * auVar26._8_4_;
          auVar60._12_4_ = auVar26._12_4_ * auVar26._12_4_;
          auVar60._16_4_ = auVar26._16_4_ * auVar26._16_4_;
          auVar60._20_4_ = auVar26._20_4_ * auVar26._20_4_;
          auVar60._24_4_ = auVar26._24_4_ * auVar26._24_4_;
          auVar60._28_4_ = auVar26._28_4_;
          auVar21 = vcmpps_avx(auVar60,auVar59,2);
          local_480 = (uint)lVar137;
          auVar231 = vpshufd_avx(ZEXT416(local_480),0);
          auVar230 = vpor_avx(auVar231,_DAT_01ff0cf0);
          auVar231 = vpor_avx(auVar231,_DAT_02020ea0);
          auVar230 = vpcmpgtd_avx(_local_520,auVar230);
          auVar231 = vpcmpgtd_avx(_local_520,auVar231);
          auVar182._16_16_ = auVar231;
          auVar182._0_16_ = auVar230;
          auVar187 = ZEXT3264(auVar182);
          auVar26 = auVar182 & auVar21;
          fVar237 = (float)local_6a0._0_4_;
          fVar253 = (float)local_6a0._4_4_;
          fVar216 = fStack_698;
          fVar238 = fStack_694;
          fVar256 = fStack_690;
          fVar217 = fStack_68c;
          fVar240 = fStack_688;
          fVar259 = fStack_684;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
            auVar322 = ZEXT3264(auVar322._0_32_);
          }
          else {
            local_800._0_4_ = auVar127._0_4_;
            local_800._4_4_ = auVar127._4_4_;
            uStack_7f8._0_4_ = auVar127._8_4_;
            uStack_7f8._4_4_ = auVar127._12_4_;
            fStack_7f0 = auVar127._16_4_;
            fStack_7ec = auVar127._20_4_;
            fStack_7e8 = auVar127._24_4_;
            local_6e0 = local_960 * (float)local_700._0_4_ +
                        (float)local_a0._0_4_ * (float)local_800._0_4_ +
                        (float)local_c0._0_4_ * fVar323 + fVar202 * fVar288;
            fStack_6dc = fStack_95c * (float)local_700._4_4_ +
                         (float)local_a0._4_4_ * (float)local_800._4_4_ +
                         (float)local_c0._4_4_ * fVar215 + fVar223 * fVar220;
            fStack_6d8 = fStack_958 * fStack_6f8 +
                         fStack_98 * (float)uStack_7f8 + fStack_b8 * fVar325 + fVar242 * fVar299;
            fStack_6d4 = fStack_954 * fStack_6f4 +
                         fStack_94 * uStack_7f8._4_4_ + fStack_b4 * fVar218 + fVar214 * fVar297;
            fStack_6d0 = fStack_950 * fStack_6f0 +
                         fStack_90 * fStack_7f0 + fStack_b0 * fVar326 + fVar202 * fVar298;
            fStack_6cc = fStack_94c * fStack_6ec +
                         fStack_8c * fStack_7ec + fStack_ac * fVar221 + fVar223 * fVar222;
            fStack_6c8 = fStack_948 * fStack_6e8 +
                         fStack_88 * fStack_7e8 + fStack_a8 * fVar328 + fVar242 * fVar191;
            fStack_6c4 = fStack_564 + auVar185._28_4_ + auVar231._12_4_ + 0.0;
            local_6c0._0_4_ = auVar125._0_4_;
            local_6c0._4_4_ = auVar125._4_4_;
            uStack_6b8._0_4_ = auVar125._8_4_;
            uStack_6b8._4_4_ = auVar125._12_4_;
            auStack_6b0._0_4_ = auVar125._16_4_;
            auStack_6b0._4_4_ = auVar125._20_4_;
            uStack_6a8._0_4_ = auVar125._24_4_;
            local_7e0._0_4_ = auVar123._0_4_;
            local_7e0._4_4_ = auVar123._4_4_;
            fStack_7d8 = auVar123._8_4_;
            fStack_7d4 = auVar123._12_4_;
            fStack_7d0 = auVar123._16_4_;
            fStack_7cc = auVar123._20_4_;
            fStack_7c8 = auVar123._24_4_;
            local_900._0_4_ = auVar122._0_4_;
            local_900._4_4_ = auVar122._4_4_;
            fStack_8f8 = auVar122._8_4_;
            fStack_8f4 = auVar122._12_4_;
            fStack_8f0 = auVar122._16_4_;
            fStack_8ec = auVar122._20_4_;
            fStack_8e8 = auVar122._24_4_;
            pfVar4 = (float *)(lVar132 + 0x2228dfc + lVar137 * 4);
            fVar323 = *pfVar4;
            fVar215 = pfVar4[1];
            fVar325 = pfVar4[2];
            fVar218 = pfVar4[3];
            fVar326 = pfVar4[4];
            fVar221 = pfVar4[5];
            fVar328 = pfVar4[6];
            pfVar5 = (float *)(lVar132 + 0x2229280 + lVar137 * 4);
            fVar262 = *pfVar5;
            fVar329 = pfVar5[1];
            fVar327 = pfVar5[2];
            fVar330 = pfVar5[3];
            fVar219 = pfVar5[4];
            fVar332 = pfVar5[5];
            fVar331 = pfVar5[6];
            pfVar6 = (float *)(lVar132 + 0x2228978 + lVar137 * 4);
            fVar288 = *pfVar6;
            fVar220 = pfVar6[1];
            fVar299 = pfVar6[2];
            fVar297 = pfVar6[3];
            fVar298 = pfVar6[4];
            fVar222 = pfVar6[5];
            fVar191 = pfVar6[6];
            fVar172 = pfVar4[7] + pfVar5[7];
            fStack_5a4 = pfVar5[7] + fStack_944 + 0.0;
            fVar273 = fStack_944 + fStack_284 + fStack_944 + 0.0;
            pfVar4 = (float *)(lVar132 + 0x22284f4 + lVar137 * 4);
            fVar201 = *pfVar4;
            fVar272 = pfVar4[1];
            fVar140 = pfVar4[2];
            fVar173 = pfVar4[3];
            fVar188 = pfVar4[4];
            fVar189 = pfVar4[5];
            fVar190 = pfVar4[6];
            local_620 = fVar201 * (float)local_580._0_4_ +
                        fVar288 * (float)local_340._0_4_ +
                        (float)local_6a0._0_4_ * fVar323 + (float)local_5a0._0_4_ * fVar262;
            fStack_61c = fVar272 * (float)local_580._4_4_ +
                         fVar220 * (float)local_340._4_4_ +
                         (float)local_6a0._4_4_ * fVar215 + (float)local_5a0._4_4_ * fVar329;
            fStack_618 = fVar140 * fStack_578 +
                         fVar299 * fStack_338 + fStack_698 * fVar325 + fStack_598 * fVar327;
            fStack_614 = fVar173 * fStack_574 +
                         fVar297 * fStack_334 + fStack_694 * fVar218 + fStack_594 * fVar330;
            fStack_610 = fVar188 * fStack_570 +
                         fVar298 * fStack_330 + fStack_690 * fVar326 + fStack_590 * fVar219;
            fStack_60c = fVar189 * fStack_56c +
                         fVar222 * fStack_32c + fStack_68c * fVar221 + fStack_58c * fVar332;
            fStack_608 = fVar190 * fStack_568 +
                         fVar191 * fStack_328 + fStack_688 * fVar328 + fStack_588 * fVar331;
            fStack_604 = fVar172 + fStack_5a4;
            local_5c0 = (float)local_2c0._0_4_ * fVar201 +
                        fVar243 * fVar323 + fVar158 * fVar262 + (float)local_2a0._0_4_ * fVar288;
            fStack_5bc = (float)local_2c0._4_4_ * fVar272 +
                         fVar254 * fVar215 + fVar160 * fVar329 + (float)local_2a0._4_4_ * fVar220;
            fStack_5b8 = fStack_2b8 * fVar140 +
                         fVar257 * fVar325 + fVar162 * fVar327 + fStack_298 * fVar299;
            fStack_5b4 = fStack_2b4 * fVar173 +
                         fVar260 * fVar218 + fVar164 * fVar330 + fStack_294 * fVar297;
            fStack_5b0 = fStack_2b0 * fVar188 +
                         fVar243 * fVar326 + fVar166 * fVar219 + fStack_290 * fVar298;
            fStack_5ac = fStack_2ac * fVar189 +
                         fVar254 * fVar221 + fVar168 * fVar332 + fStack_28c * fVar222;
            fStack_5a8 = fStack_2a8 * fVar190 +
                         fVar257 * fVar328 + fVar170 * fVar331 + fStack_288 * fVar191;
            fStack_5a4 = fStack_5a4 + fVar273;
            auVar341._0_4_ =
                 fVar288 * (float)local_a0._0_4_ +
                 (float)local_c0._0_4_ * fVar323 + fVar202 * fVar262 +
                 fVar201 * (float)local_700._0_4_;
            auVar341._4_4_ =
                 fVar220 * (float)local_a0._4_4_ +
                 (float)local_c0._4_4_ * fVar215 + fVar223 * fVar329 +
                 fVar272 * (float)local_700._4_4_;
            auVar341._8_4_ =
                 fVar299 * fStack_98 + fStack_b8 * fVar325 + fVar242 * fVar327 +
                 fVar140 * fStack_6f8;
            auVar341._12_4_ =
                 fVar297 * fStack_94 + fStack_b4 * fVar218 + fVar214 * fVar330 +
                 fVar173 * fStack_6f4;
            auVar341._16_4_ =
                 fVar298 * fStack_90 + fStack_b0 * fVar326 + fVar202 * fVar219 +
                 fVar188 * fStack_6f0;
            auVar341._20_4_ =
                 fVar222 * fStack_8c + fStack_ac * fVar221 + fVar223 * fVar332 +
                 fVar189 * fStack_6ec;
            auVar341._24_4_ =
                 fVar191 * fStack_88 + fStack_a8 * fVar328 + fVar242 * fVar331 +
                 fVar190 * fStack_6e8;
            auVar341._28_4_ = pfVar6[7] + fVar172 + fVar273;
            pfVar4 = (float *)(lVar132 + 0x222b21c + lVar137 * 4);
            fVar323 = *pfVar4;
            fVar215 = pfVar4[1];
            fVar325 = pfVar4[2];
            fVar218 = pfVar4[3];
            fVar326 = pfVar4[4];
            fVar221 = pfVar4[5];
            fVar328 = pfVar4[6];
            pfVar5 = (float *)(lVar132 + 0x222b6a0 + lVar137 * 4);
            fVar262 = *pfVar5;
            fVar329 = pfVar5[1];
            fVar327 = pfVar5[2];
            fVar330 = pfVar5[3];
            fVar219 = pfVar5[4];
            fVar332 = pfVar5[5];
            fVar331 = pfVar5[6];
            pfVar6 = (float *)(lVar132 + 0x222ad98 + lVar137 * 4);
            fVar288 = *pfVar6;
            fVar220 = pfVar6[1];
            fVar299 = pfVar6[2];
            fVar297 = pfVar6[3];
            fVar298 = pfVar6[4];
            fVar222 = pfVar6[5];
            fVar191 = pfVar6[6];
            pfVar7 = (float *)(lVar132 + 0x222a914 + lVar137 * 4);
            fVar201 = *pfVar7;
            fVar272 = pfVar7[1];
            fVar140 = pfVar7[2];
            fVar173 = pfVar7[3];
            fVar188 = pfVar7[4];
            fVar189 = pfVar7[5];
            fVar190 = pfVar7[6];
            auVar306._0_4_ =
                 fVar201 * (float)local_580._0_4_ +
                 fVar288 * (float)local_340._0_4_ +
                 (float)local_6a0._0_4_ * fVar323 + (float)local_5a0._0_4_ * fVar262;
            auVar306._4_4_ =
                 fVar272 * (float)local_580._4_4_ +
                 fVar220 * (float)local_340._4_4_ +
                 (float)local_6a0._4_4_ * fVar215 + (float)local_5a0._4_4_ * fVar329;
            auVar306._8_4_ =
                 fVar140 * fStack_578 +
                 fVar299 * fStack_338 + fStack_698 * fVar325 + fStack_598 * fVar327;
            auVar306._12_4_ =
                 fVar173 * fStack_574 +
                 fVar297 * fStack_334 + fStack_694 * fVar218 + fStack_594 * fVar330;
            auVar306._16_4_ =
                 fVar188 * fStack_570 +
                 fVar298 * fStack_330 + fStack_690 * fVar326 + fStack_590 * fVar219;
            auVar306._20_4_ =
                 fVar189 * fStack_56c +
                 fVar222 * fStack_32c + fStack_68c * fVar221 + fStack_58c * fVar332;
            auVar306._24_4_ =
                 fVar190 * fStack_568 +
                 fVar191 * fStack_328 + fStack_688 * fVar328 + fStack_588 * fVar331;
            auVar306._28_4_ = fStack_2a4 + fStack_2a4 + fStack_584 + fStack_5a4;
            auVar336._0_4_ =
                 fVar201 * (float)local_2c0._0_4_ +
                 (float)local_2a0._0_4_ * fVar288 + fVar243 * fVar323 + fVar262 * fVar158;
            auVar336._4_4_ =
                 fVar272 * (float)local_2c0._4_4_ +
                 (float)local_2a0._4_4_ * fVar220 + fVar254 * fVar215 + fVar329 * fVar160;
            auVar336._8_4_ =
                 fVar140 * fStack_2b8 + fStack_298 * fVar299 + fVar257 * fVar325 + fVar327 * fVar162
            ;
            auVar336._12_4_ =
                 fVar173 * fStack_2b4 + fStack_294 * fVar297 + fVar260 * fVar218 + fVar330 * fVar164
            ;
            auVar336._16_4_ =
                 fVar188 * fStack_2b0 + fStack_290 * fVar298 + fVar243 * fVar326 + fVar219 * fVar166
            ;
            auVar336._20_4_ =
                 fVar189 * fStack_2ac + fStack_28c * fVar222 + fVar254 * fVar221 + fVar332 * fVar168
            ;
            auVar336._24_4_ =
                 fVar190 * fStack_2a8 + fStack_288 * fVar191 + fVar257 * fVar328 + fVar331 * fVar170
            ;
            auVar336._28_4_ = fStack_2a4 + fStack_2a4 + fStack_684 + fStack_5a4;
            auVar252._8_4_ = 0x7fffffff;
            auVar252._0_8_ = 0x7fffffff7fffffff;
            auVar252._12_4_ = 0x7fffffff;
            auVar252._16_4_ = 0x7fffffff;
            auVar252._20_4_ = 0x7fffffff;
            auVar252._24_4_ = 0x7fffffff;
            auVar252._28_4_ = 0x7fffffff;
            auVar120._4_4_ = fStack_61c;
            auVar120._0_4_ = local_620;
            auVar120._8_4_ = fStack_618;
            auVar120._12_4_ = fStack_614;
            auVar120._16_4_ = fStack_610;
            auVar120._20_4_ = fStack_60c;
            auVar120._24_4_ = fStack_608;
            auVar120._28_4_ = fStack_604;
            auVar185 = vandps_avx(auVar120,auVar252);
            auVar121._4_4_ = fStack_5bc;
            auVar121._0_4_ = local_5c0;
            auVar121._8_4_ = fStack_5b8;
            auVar121._12_4_ = fStack_5b4;
            auVar121._16_4_ = fStack_5b0;
            auVar121._20_4_ = fStack_5ac;
            auVar121._24_4_ = fStack_5a8;
            auVar121._28_4_ = fStack_5a4;
            auVar26 = vandps_avx(auVar121,auVar252);
            auVar26 = vmaxps_avx(auVar185,auVar26);
            auVar185 = vandps_avx(auVar341,auVar252);
            auVar26 = vmaxps_avx(auVar26,auVar185);
            auVar26 = vcmpps_avx(auVar26,local_640,1);
            auVar15 = vblendvps_avx(auVar120,auVar19,auVar26);
            auVar152._0_4_ =
                 fVar201 * (float)local_700._0_4_ +
                 fVar288 * (float)local_a0._0_4_ +
                 fVar202 * fVar262 + (float)local_c0._0_4_ * fVar323;
            auVar152._4_4_ =
                 fVar272 * (float)local_700._4_4_ +
                 fVar220 * (float)local_a0._4_4_ +
                 fVar223 * fVar329 + (float)local_c0._4_4_ * fVar215;
            auVar152._8_4_ =
                 fVar140 * fStack_6f8 +
                 fVar299 * fStack_98 + fVar242 * fVar327 + fStack_b8 * fVar325;
            auVar152._12_4_ =
                 fVar173 * fStack_6f4 +
                 fVar297 * fStack_94 + fVar214 * fVar330 + fStack_b4 * fVar218;
            auVar152._16_4_ =
                 fVar188 * fStack_6f0 +
                 fVar298 * fStack_90 + fVar202 * fVar219 + fStack_b0 * fVar326;
            auVar152._20_4_ =
                 fVar189 * fStack_6ec +
                 fVar222 * fStack_8c + fVar223 * fVar332 + fStack_ac * fVar221;
            auVar152._24_4_ =
                 fVar190 * fStack_6e8 +
                 fVar191 * fStack_88 + fVar242 * fVar331 + fStack_a8 * fVar328;
            auVar152._28_4_ = auVar185._28_4_ + pfVar6[7] + pfVar5[7] + pfVar4[7];
            auVar16 = vblendvps_avx(auVar121,auVar20,auVar26);
            auVar185 = vandps_avx(auVar306,auVar252);
            auVar26 = vandps_avx(auVar336,auVar252);
            auVar207 = vmaxps_avx(auVar185,auVar26);
            auVar185 = vandps_avx(auVar152,auVar252);
            auVar185 = vmaxps_avx(auVar207,auVar185);
            local_740._0_4_ = auVar126._0_4_;
            local_740._4_4_ = auVar126._4_4_;
            uStack_738._0_4_ = auVar126._8_4_;
            uStack_738._4_4_ = auVar126._12_4_;
            uStack_730._0_4_ = auVar126._16_4_;
            uStack_730._4_4_ = auVar126._20_4_;
            uStack_728._0_4_ = auVar126._24_4_;
            auVar26 = vcmpps_avx(auVar185,local_640,1);
            auVar185 = vblendvps_avx(auVar306,auVar19,auVar26);
            auVar153._0_4_ =
                 (float)local_700._0_4_ * (float)local_740._0_4_ +
                 (float)local_a0._0_4_ * (float)local_6c0._0_4_ +
                 (float)local_c0._0_4_ * (float)local_7e0._0_4_ + fVar202 * (float)local_900._0_4_;
            auVar153._4_4_ =
                 (float)local_700._4_4_ * (float)local_740._4_4_ +
                 (float)local_a0._4_4_ * (float)local_6c0._4_4_ +
                 (float)local_c0._4_4_ * (float)local_7e0._4_4_ + fVar223 * (float)local_900._4_4_;
            auVar153._8_4_ =
                 fStack_6f8 * (float)uStack_738 +
                 fStack_98 * (float)uStack_6b8 + fStack_b8 * fStack_7d8 + fVar242 * fStack_8f8;
            auVar153._12_4_ =
                 fStack_6f4 * uStack_738._4_4_ +
                 fStack_94 * uStack_6b8._4_4_ + fStack_b4 * fStack_7d4 + fVar214 * fStack_8f4;
            auVar153._16_4_ =
                 fStack_6f0 * (float)uStack_730 +
                 fStack_90 * (float)auStack_6b0._0_4_ +
                 fStack_b0 * fStack_7d0 + fVar202 * fStack_8f0;
            auVar153._20_4_ =
                 fStack_6ec * uStack_730._4_4_ +
                 fStack_8c * (float)auStack_6b0._4_4_ +
                 fStack_ac * fStack_7cc + fVar223 * fStack_8ec;
            auVar153._24_4_ =
                 fStack_6e8 * (float)uStack_728 +
                 fStack_88 * (float)uStack_6a8 + fStack_a8 * fStack_7c8 + fVar242 * fStack_8e8;
            auVar153._28_4_ = auVar207._28_4_ + fStack_6c4 + auVar231._12_4_ + 0.0;
            auVar26 = vblendvps_avx(auVar336,auVar20,auVar26);
            fVar172 = auVar15._0_4_;
            fVar273 = auVar15._4_4_;
            fVar239 = auVar15._8_4_;
            fVar241 = auVar15._12_4_;
            fVar244 = auVar15._16_4_;
            fVar255 = auVar15._20_4_;
            fVar258 = auVar15._24_4_;
            fVar261 = auVar15._28_4_;
            fVar288 = auVar185._0_4_;
            fVar299 = auVar185._4_4_;
            fVar298 = auVar185._8_4_;
            fVar191 = auVar185._12_4_;
            fVar272 = auVar185._16_4_;
            fVar158 = auVar185._20_4_;
            fVar162 = auVar185._24_4_;
            fVar323 = auVar16._0_4_;
            fVar325 = auVar16._4_4_;
            fVar326 = auVar16._8_4_;
            fVar328 = auVar16._12_4_;
            fVar329 = auVar16._16_4_;
            fVar330 = auVar16._20_4_;
            fVar332 = auVar16._24_4_;
            auVar320._0_4_ = fVar323 * fVar323 + fVar172 * fVar172;
            auVar320._4_4_ = fVar325 * fVar325 + fVar273 * fVar273;
            auVar320._8_4_ = fVar326 * fVar326 + fVar239 * fVar239;
            auVar320._12_4_ = fVar328 * fVar328 + fVar241 * fVar241;
            auVar320._16_4_ = fVar329 * fVar329 + fVar244 * fVar244;
            auVar320._20_4_ = fVar330 * fVar330 + fVar255 * fVar255;
            auVar320._24_4_ = fVar332 * fVar332 + fVar258 * fVar258;
            auVar320._28_4_ = auVar19._28_4_ + fVar214;
            auVar19 = vrsqrtps_avx(auVar320);
            fVar215 = auVar19._0_4_;
            fVar218 = auVar19._4_4_;
            auVar61._4_4_ = fVar218 * 1.5;
            auVar61._0_4_ = fVar215 * 1.5;
            fVar221 = auVar19._8_4_;
            auVar61._8_4_ = fVar221 * 1.5;
            fVar262 = auVar19._12_4_;
            auVar61._12_4_ = fVar262 * 1.5;
            fVar327 = auVar19._16_4_;
            auVar61._16_4_ = fVar327 * 1.5;
            fVar219 = auVar19._20_4_;
            auVar61._20_4_ = fVar219 * 1.5;
            fVar331 = auVar19._24_4_;
            auVar61._24_4_ = fVar331 * 1.5;
            auVar61._28_4_ = auVar336._28_4_;
            auVar62._4_4_ = fVar218 * fVar218 * fVar218 * auVar320._4_4_ * 0.5;
            auVar62._0_4_ = fVar215 * fVar215 * fVar215 * auVar320._0_4_ * 0.5;
            auVar62._8_4_ = fVar221 * fVar221 * fVar221 * auVar320._8_4_ * 0.5;
            auVar62._12_4_ = fVar262 * fVar262 * fVar262 * auVar320._12_4_ * 0.5;
            auVar62._16_4_ = fVar327 * fVar327 * fVar327 * auVar320._16_4_ * 0.5;
            auVar62._20_4_ = fVar219 * fVar219 * fVar219 * auVar320._20_4_ * 0.5;
            auVar62._24_4_ = fVar331 * fVar331 * fVar331 * auVar320._24_4_ * 0.5;
            auVar62._28_4_ = auVar320._28_4_;
            auVar15 = vsubps_avx(auVar61,auVar62);
            fVar166 = auVar15._0_4_;
            fVar168 = auVar15._4_4_;
            fVar170 = auVar15._8_4_;
            fVar173 = auVar15._12_4_;
            fVar188 = auVar15._16_4_;
            fVar189 = auVar15._20_4_;
            fVar190 = auVar15._24_4_;
            fVar215 = auVar26._0_4_;
            fVar218 = auVar26._4_4_;
            fVar221 = auVar26._8_4_;
            fVar262 = auVar26._12_4_;
            fVar327 = auVar26._16_4_;
            fVar219 = auVar26._20_4_;
            fVar331 = auVar26._24_4_;
            auVar295._0_4_ = fVar215 * fVar215 + fVar288 * fVar288;
            auVar295._4_4_ = fVar218 * fVar218 + fVar299 * fVar299;
            auVar295._8_4_ = fVar221 * fVar221 + fVar298 * fVar298;
            auVar295._12_4_ = fVar262 * fVar262 + fVar191 * fVar191;
            auVar295._16_4_ = fVar327 * fVar327 + fVar272 * fVar272;
            auVar295._20_4_ = fVar219 * fVar219 + fVar158 * fVar158;
            auVar295._24_4_ = fVar331 * fVar331 + fVar162 * fVar162;
            auVar295._28_4_ = auVar19._28_4_ + auVar185._28_4_;
            auVar185 = vrsqrtps_avx(auVar295);
            fVar220 = auVar185._0_4_;
            fVar297 = auVar185._4_4_;
            auVar63._4_4_ = fVar297 * 1.5;
            auVar63._0_4_ = fVar220 * 1.5;
            fVar222 = auVar185._8_4_;
            auVar63._8_4_ = fVar222 * 1.5;
            fVar201 = auVar185._12_4_;
            auVar63._12_4_ = fVar201 * 1.5;
            fVar140 = auVar185._16_4_;
            auVar63._16_4_ = fVar140 * 1.5;
            fVar160 = auVar185._20_4_;
            auVar63._20_4_ = fVar160 * 1.5;
            fVar164 = auVar185._24_4_;
            auVar63._24_4_ = fVar164 * 1.5;
            auVar63._28_4_ = auVar336._28_4_;
            auVar64._4_4_ = fVar297 * fVar297 * fVar297 * auVar295._4_4_ * 0.5;
            auVar64._0_4_ = fVar220 * fVar220 * fVar220 * auVar295._0_4_ * 0.5;
            auVar64._8_4_ = fVar222 * fVar222 * fVar222 * auVar295._8_4_ * 0.5;
            auVar64._12_4_ = fVar201 * fVar201 * fVar201 * auVar295._12_4_ * 0.5;
            auVar64._16_4_ = fVar140 * fVar140 * fVar140 * auVar295._16_4_ * 0.5;
            auVar64._20_4_ = fVar160 * fVar160 * fVar160 * auVar295._20_4_ * 0.5;
            auVar64._24_4_ = fVar164 * fVar164 * fVar164 * auVar295._24_4_ * 0.5;
            auVar64._28_4_ = auVar295._28_4_;
            auVar19 = vsubps_avx(auVar63,auVar64);
            fVar220 = auVar19._0_4_;
            fVar297 = auVar19._4_4_;
            fVar222 = auVar19._8_4_;
            fVar201 = auVar19._12_4_;
            fVar140 = auVar19._16_4_;
            fVar160 = auVar19._20_4_;
            fVar164 = auVar19._24_4_;
            fVar323 = fVar141 * fVar166 * fVar323;
            fVar325 = fVar159 * fVar168 * fVar325;
            auVar65._4_4_ = fVar325;
            auVar65._0_4_ = fVar323;
            fVar326 = fVar161 * fVar170 * fVar326;
            auVar65._8_4_ = fVar326;
            fVar328 = fVar163 * fVar173 * fVar328;
            auVar65._12_4_ = fVar328;
            fVar329 = fVar165 * fVar188 * fVar329;
            auVar65._16_4_ = fVar329;
            fVar330 = fVar167 * fVar189 * fVar330;
            auVar65._20_4_ = fVar330;
            fVar332 = fVar169 * fVar190 * fVar332;
            auVar65._24_4_ = fVar332;
            auVar65._28_4_ = auVar185._28_4_;
            local_740._4_4_ = fVar325 + auVar212._4_4_;
            local_740._0_4_ = fVar323 + auVar212._0_4_;
            uStack_738._0_4_ = fVar326 + auVar212._8_4_;
            uStack_738._4_4_ = fVar328 + auVar212._12_4_;
            uStack_730._0_4_ = fVar329 + auVar212._16_4_;
            uStack_730._4_4_ = fVar330 + auVar212._20_4_;
            uStack_728._0_4_ = fVar332 + auVar212._24_4_;
            uStack_728._4_4_ = auVar185._28_4_ + auVar212._28_4_;
            fVar323 = fVar141 * fVar166 * -fVar172;
            fVar325 = fVar159 * fVar168 * -fVar273;
            auVar66._4_4_ = fVar325;
            auVar66._0_4_ = fVar323;
            fVar326 = fVar161 * fVar170 * -fVar239;
            auVar66._8_4_ = fVar326;
            fVar328 = fVar163 * fVar173 * -fVar241;
            auVar66._12_4_ = fVar328;
            fVar329 = fVar165 * fVar188 * -fVar244;
            auVar66._16_4_ = fVar329;
            fVar330 = fVar167 * fVar189 * -fVar255;
            auVar66._20_4_ = fVar330;
            fVar332 = fVar169 * fVar190 * -fVar258;
            auVar66._24_4_ = fVar332;
            auVar66._28_4_ = -fVar261;
            local_900._4_4_ = auVar199._4_4_ + fVar325;
            local_900._0_4_ = auVar199._0_4_ + fVar323;
            fStack_8f8 = auVar199._8_4_ + fVar326;
            fStack_8f4 = auVar199._12_4_ + fVar328;
            fStack_8f0 = auVar199._16_4_ + fVar329;
            fStack_8ec = auVar199._20_4_ + fVar330;
            fStack_8e8 = auVar199._24_4_ + fVar332;
            fStack_8e4 = auVar199._28_4_ + -fVar261;
            fVar323 = fVar166 * 0.0 * fVar141;
            fVar325 = fVar168 * 0.0 * fVar159;
            auVar67._4_4_ = fVar325;
            auVar67._0_4_ = fVar323;
            fVar326 = fVar170 * 0.0 * fVar161;
            auVar67._8_4_ = fVar326;
            fVar328 = fVar173 * 0.0 * fVar163;
            auVar67._12_4_ = fVar328;
            fVar329 = fVar188 * 0.0 * fVar165;
            auVar67._16_4_ = fVar329;
            fVar330 = fVar189 * 0.0 * fVar167;
            auVar67._20_4_ = fVar330;
            fVar332 = fVar190 * 0.0 * fVar169;
            auVar67._24_4_ = fVar332;
            auVar67._28_4_ = fVar261;
            auVar185 = vsubps_avx(auVar212,auVar65);
            auVar360._0_4_ = fVar323 + auVar153._0_4_;
            auVar360._4_4_ = fVar325 + auVar153._4_4_;
            auVar360._8_4_ = fVar326 + auVar153._8_4_;
            auVar360._12_4_ = fVar328 + auVar153._12_4_;
            auVar360._16_4_ = fVar329 + auVar153._16_4_;
            auVar360._20_4_ = fVar330 + auVar153._20_4_;
            auVar360._24_4_ = fVar332 + auVar153._24_4_;
            auVar360._28_4_ = fVar261 + auVar153._28_4_;
            fVar323 = auVar280._0_4_ * fVar220 * fVar215;
            fVar215 = auVar280._4_4_ * fVar297 * fVar218;
            auVar68._4_4_ = fVar215;
            auVar68._0_4_ = fVar323;
            fVar325 = auVar280._8_4_ * fVar222 * fVar221;
            auVar68._8_4_ = fVar325;
            fVar218 = auVar280._12_4_ * fVar201 * fVar262;
            auVar68._12_4_ = fVar218;
            fVar326 = auVar280._16_4_ * fVar140 * fVar327;
            auVar68._16_4_ = fVar326;
            fVar221 = auVar280._20_4_ * fVar160 * fVar219;
            auVar68._20_4_ = fVar221;
            fVar328 = auVar280._24_4_ * fVar164 * fVar331;
            auVar68._24_4_ = fVar328;
            auVar68._28_4_ = fVar171;
            auVar358 = vsubps_avx(auVar199,auVar66);
            auVar342._0_4_ = auVar294._0_4_ + fVar323;
            auVar342._4_4_ = auVar294._4_4_ + fVar215;
            auVar342._8_4_ = auVar294._8_4_ + fVar325;
            auVar342._12_4_ = auVar294._12_4_ + fVar218;
            auVar342._16_4_ = auVar294._16_4_ + fVar326;
            auVar342._20_4_ = auVar294._20_4_ + fVar221;
            auVar342._24_4_ = auVar294._24_4_ + fVar328;
            auVar342._28_4_ = auVar294._28_4_ + fVar171;
            fVar323 = fVar220 * -fVar288 * auVar280._0_4_;
            fVar215 = fVar297 * -fVar299 * auVar280._4_4_;
            auVar69._4_4_ = fVar215;
            auVar69._0_4_ = fVar323;
            fVar325 = fVar222 * -fVar298 * auVar280._8_4_;
            auVar69._8_4_ = fVar325;
            fVar218 = fVar201 * -fVar191 * auVar280._12_4_;
            auVar69._12_4_ = fVar218;
            fVar326 = fVar140 * -fVar272 * auVar280._16_4_;
            auVar69._16_4_ = fVar326;
            fVar221 = fVar160 * -fVar158 * auVar280._20_4_;
            auVar69._20_4_ = fVar221;
            fVar328 = fVar164 * -fVar162 * auVar280._24_4_;
            auVar69._24_4_ = fVar328;
            auVar69._28_4_ = auVar212._28_4_;
            auVar22 = vsubps_avx(auVar153,auVar67);
            auVar235._0_4_ = auVar251._0_4_ + fVar323;
            auVar235._4_4_ = auVar251._4_4_ + fVar215;
            auVar235._8_4_ = auVar251._8_4_ + fVar325;
            auVar235._12_4_ = auVar251._12_4_ + fVar218;
            auVar235._16_4_ = auVar251._16_4_ + fVar326;
            auVar235._20_4_ = auVar251._20_4_ + fVar221;
            auVar235._24_4_ = auVar251._24_4_ + fVar328;
            auVar235._28_4_ = auVar251._28_4_ + auVar212._28_4_;
            fVar323 = fVar220 * 0.0 * auVar280._0_4_;
            fVar215 = fVar297 * 0.0 * auVar280._4_4_;
            auVar70._4_4_ = fVar215;
            auVar70._0_4_ = fVar323;
            fVar325 = fVar222 * 0.0 * auVar280._8_4_;
            auVar70._8_4_ = fVar325;
            fVar218 = fVar201 * 0.0 * auVar280._12_4_;
            auVar70._12_4_ = fVar218;
            fVar326 = fVar140 * 0.0 * auVar280._16_4_;
            auVar70._16_4_ = fVar326;
            fVar221 = fVar160 * 0.0 * auVar280._20_4_;
            auVar70._20_4_ = fVar221;
            fVar328 = fVar164 * 0.0 * auVar280._24_4_;
            auVar70._24_4_ = fVar328;
            auVar70._28_4_ = auVar153._28_4_;
            auVar26 = vsubps_avx(auVar294,auVar68);
            auVar118._4_4_ = fStack_6dc;
            auVar118._0_4_ = local_6e0;
            auVar118._8_4_ = fStack_6d8;
            auVar118._12_4_ = fStack_6d4;
            auVar118._16_4_ = fStack_6d0;
            auVar118._20_4_ = fStack_6cc;
            auVar118._24_4_ = fStack_6c8;
            auVar118._28_4_ = fStack_6c4;
            auVar307._0_4_ = local_6e0 + fVar323;
            auVar307._4_4_ = fStack_6dc + fVar215;
            auVar307._8_4_ = fStack_6d8 + fVar325;
            auVar307._12_4_ = fStack_6d4 + fVar218;
            auVar307._16_4_ = fStack_6d0 + fVar326;
            auVar307._20_4_ = fStack_6cc + fVar221;
            auVar307._24_4_ = fStack_6c8 + fVar328;
            auVar307._28_4_ = fStack_6c4 + auVar153._28_4_;
            auVar15 = vsubps_avx(auVar251,auVar69);
            auVar16 = vsubps_avx(auVar118,auVar70);
            auVar207 = vsubps_avx(auVar235,auVar358);
            auVar208 = vsubps_avx(auVar307,auVar22);
            auVar71._4_4_ = auVar22._4_4_ * auVar207._4_4_;
            auVar71._0_4_ = auVar22._0_4_ * auVar207._0_4_;
            auVar71._8_4_ = auVar22._8_4_ * auVar207._8_4_;
            auVar71._12_4_ = auVar22._12_4_ * auVar207._12_4_;
            auVar71._16_4_ = auVar22._16_4_ * auVar207._16_4_;
            auVar71._20_4_ = auVar22._20_4_ * auVar207._20_4_;
            auVar71._24_4_ = auVar22._24_4_ * auVar207._24_4_;
            auVar71._28_4_ = auVar336._28_4_;
            auVar72._4_4_ = auVar358._4_4_ * auVar208._4_4_;
            auVar72._0_4_ = auVar358._0_4_ * auVar208._0_4_;
            auVar72._8_4_ = auVar358._8_4_ * auVar208._8_4_;
            auVar72._12_4_ = auVar358._12_4_ * auVar208._12_4_;
            auVar72._16_4_ = auVar358._16_4_ * auVar208._16_4_;
            auVar72._20_4_ = auVar358._20_4_ * auVar208._20_4_;
            auVar72._24_4_ = auVar358._24_4_ * auVar208._24_4_;
            auVar72._28_4_ = auVar251._28_4_;
            auVar232 = vsubps_avx(auVar72,auVar71);
            auVar73._4_4_ = auVar185._4_4_ * auVar208._4_4_;
            auVar73._0_4_ = auVar185._0_4_ * auVar208._0_4_;
            auVar73._8_4_ = auVar185._8_4_ * auVar208._8_4_;
            auVar73._12_4_ = auVar185._12_4_ * auVar208._12_4_;
            auVar73._16_4_ = auVar185._16_4_ * auVar208._16_4_;
            auVar73._20_4_ = auVar185._20_4_ * auVar208._20_4_;
            auVar73._24_4_ = auVar185._24_4_ * auVar208._24_4_;
            auVar73._28_4_ = auVar208._28_4_;
            auVar208 = vsubps_avx(auVar342,auVar185);
            auVar74._4_4_ = auVar22._4_4_ * auVar208._4_4_;
            auVar74._0_4_ = auVar22._0_4_ * auVar208._0_4_;
            auVar74._8_4_ = auVar22._8_4_ * auVar208._8_4_;
            auVar74._12_4_ = auVar22._12_4_ * auVar208._12_4_;
            auVar74._16_4_ = auVar22._16_4_ * auVar208._16_4_;
            auVar74._20_4_ = auVar22._20_4_ * auVar208._20_4_;
            auVar74._24_4_ = auVar22._24_4_ * auVar208._24_4_;
            auVar74._28_4_ = auVar19._28_4_;
            auVar266 = vsubps_avx(auVar74,auVar73);
            auVar75._4_4_ = auVar358._4_4_ * auVar208._4_4_;
            auVar75._0_4_ = auVar358._0_4_ * auVar208._0_4_;
            auVar75._8_4_ = auVar358._8_4_ * auVar208._8_4_;
            auVar75._12_4_ = auVar358._12_4_ * auVar208._12_4_;
            auVar75._16_4_ = auVar358._16_4_ * auVar208._16_4_;
            auVar75._20_4_ = auVar358._20_4_ * auVar208._20_4_;
            auVar75._24_4_ = auVar358._24_4_ * auVar208._24_4_;
            auVar75._28_4_ = auVar19._28_4_;
            auVar76._4_4_ = auVar185._4_4_ * auVar207._4_4_;
            auVar76._0_4_ = auVar185._0_4_ * auVar207._0_4_;
            auVar76._8_4_ = auVar185._8_4_ * auVar207._8_4_;
            auVar76._12_4_ = auVar185._12_4_ * auVar207._12_4_;
            auVar76._16_4_ = auVar185._16_4_ * auVar207._16_4_;
            auVar76._20_4_ = auVar185._20_4_ * auVar207._20_4_;
            auVar76._24_4_ = auVar185._24_4_ * auVar207._24_4_;
            auVar76._28_4_ = auVar207._28_4_;
            auVar19 = vsubps_avx(auVar76,auVar75);
            auVar183._0_4_ = auVar232._0_4_ * 0.0 + auVar19._0_4_ + auVar266._0_4_ * 0.0;
            auVar183._4_4_ = auVar232._4_4_ * 0.0 + auVar19._4_4_ + auVar266._4_4_ * 0.0;
            auVar183._8_4_ = auVar232._8_4_ * 0.0 + auVar19._8_4_ + auVar266._8_4_ * 0.0;
            auVar183._12_4_ = auVar232._12_4_ * 0.0 + auVar19._12_4_ + auVar266._12_4_ * 0.0;
            auVar183._16_4_ = auVar232._16_4_ * 0.0 + auVar19._16_4_ + auVar266._16_4_ * 0.0;
            auVar183._20_4_ = auVar232._20_4_ * 0.0 + auVar19._20_4_ + auVar266._20_4_ * 0.0;
            auVar183._24_4_ = auVar232._24_4_ * 0.0 + auVar19._24_4_ + auVar266._24_4_ * 0.0;
            auVar183._28_4_ = auVar232._28_4_ + auVar19._28_4_ + auVar266._28_4_;
            auVar324 = vcmpps_avx(auVar183,ZEXT832(0) << 0x20,2);
            auVar19 = vblendvps_avx(auVar26,_local_740,auVar324);
            auVar213 = ZEXT3264(auVar19);
            auVar26 = vblendvps_avx(auVar15,_local_900,auVar324);
            auVar15 = vblendvps_avx(auVar16,auVar360,auVar324);
            auVar16 = vblendvps_avx(auVar185,auVar342,auVar324);
            auVar207 = vblendvps_avx(auVar358,auVar235,auVar324);
            auVar208 = vblendvps_avx(auVar22,auVar307,auVar324);
            auVar232 = vblendvps_avx(auVar342,auVar185,auVar324);
            auVar266 = vblendvps_avx(auVar235,auVar358,auVar324);
            auVar303 = vblendvps_avx(auVar307,auVar22,auVar324);
            auVar185 = vandps_avx(auVar21,auVar182);
            auVar232 = vsubps_avx(auVar232,auVar19);
            auVar23 = vsubps_avx(auVar266,auVar26);
            auVar303 = vsubps_avx(auVar303,auVar15);
            auVar24 = vsubps_avx(auVar26,auVar207);
            fVar323 = auVar23._0_4_;
            fVar274 = auVar15._0_4_;
            fVar262 = auVar23._4_4_;
            fVar281 = auVar15._4_4_;
            auVar77._4_4_ = fVar281 * fVar262;
            auVar77._0_4_ = fVar274 * fVar323;
            fVar288 = auVar23._8_4_;
            fVar282 = auVar15._8_4_;
            auVar77._8_4_ = fVar282 * fVar288;
            fVar201 = auVar23._12_4_;
            fVar283 = auVar15._12_4_;
            auVar77._12_4_ = fVar283 * fVar201;
            fVar166 = auVar23._16_4_;
            fVar284 = auVar15._16_4_;
            auVar77._16_4_ = fVar284 * fVar166;
            fVar172 = auVar23._20_4_;
            fVar285 = auVar15._20_4_;
            auVar77._20_4_ = fVar285 * fVar172;
            fVar261 = auVar23._24_4_;
            fVar286 = auVar15._24_4_;
            auVar77._24_4_ = fVar286 * fVar261;
            auVar77._28_4_ = auVar266._28_4_;
            fVar215 = auVar26._0_4_;
            fVar301 = auVar303._0_4_;
            fVar329 = auVar26._4_4_;
            fVar310 = auVar303._4_4_;
            auVar78._4_4_ = fVar310 * fVar329;
            auVar78._0_4_ = fVar301 * fVar215;
            fVar220 = auVar26._8_4_;
            fVar312 = auVar303._8_4_;
            auVar78._8_4_ = fVar312 * fVar220;
            fVar272 = auVar26._12_4_;
            fVar314 = auVar303._12_4_;
            auVar78._12_4_ = fVar314 * fVar272;
            fVar168 = auVar26._16_4_;
            fVar315 = auVar303._16_4_;
            auVar78._16_4_ = fVar315 * fVar168;
            fVar273 = auVar26._20_4_;
            fVar316 = auVar303._20_4_;
            auVar78._20_4_ = fVar316 * fVar273;
            fVar263 = auVar26._24_4_;
            fVar317 = auVar303._24_4_;
            uVar8 = auVar358._28_4_;
            auVar78._24_4_ = fVar317 * fVar263;
            auVar78._28_4_ = uVar8;
            auVar266 = vsubps_avx(auVar78,auVar77);
            fVar325 = auVar19._0_4_;
            fVar327 = auVar19._4_4_;
            auVar79._4_4_ = fVar310 * fVar327;
            auVar79._0_4_ = fVar301 * fVar325;
            fVar299 = auVar19._8_4_;
            auVar79._8_4_ = fVar312 * fVar299;
            fVar140 = auVar19._12_4_;
            auVar79._12_4_ = fVar314 * fVar140;
            fVar170 = auVar19._16_4_;
            auVar79._16_4_ = fVar315 * fVar170;
            fVar239 = auVar19._20_4_;
            auVar79._20_4_ = fVar316 * fVar239;
            fVar269 = auVar19._24_4_;
            auVar79._24_4_ = fVar317 * fVar269;
            auVar79._28_4_ = uVar8;
            fVar218 = auVar232._0_4_;
            fVar330 = auVar232._4_4_;
            auVar80._4_4_ = fVar281 * fVar330;
            auVar80._0_4_ = fVar274 * fVar218;
            fVar297 = auVar232._8_4_;
            auVar80._8_4_ = fVar282 * fVar297;
            fVar158 = auVar232._12_4_;
            auVar80._12_4_ = fVar283 * fVar158;
            fVar173 = auVar232._16_4_;
            auVar80._16_4_ = fVar284 * fVar173;
            fVar241 = auVar232._20_4_;
            auVar80._20_4_ = fVar285 * fVar241;
            fVar270 = auVar232._24_4_;
            auVar80._24_4_ = fVar286 * fVar270;
            auVar80._28_4_ = auVar342._28_4_;
            auVar358 = vsubps_avx(auVar80,auVar79);
            auVar81._4_4_ = fVar329 * fVar330;
            auVar81._0_4_ = fVar215 * fVar218;
            auVar81._8_4_ = fVar220 * fVar297;
            auVar81._12_4_ = fVar272 * fVar158;
            auVar81._16_4_ = fVar168 * fVar173;
            auVar81._20_4_ = fVar273 * fVar241;
            auVar81._24_4_ = fVar263 * fVar270;
            auVar81._28_4_ = uVar8;
            auVar82._4_4_ = fVar327 * fVar262;
            auVar82._0_4_ = fVar325 * fVar323;
            auVar82._8_4_ = fVar299 * fVar288;
            auVar82._12_4_ = fVar140 * fVar201;
            auVar82._16_4_ = fVar170 * fVar166;
            auVar82._20_4_ = fVar239 * fVar172;
            auVar82._24_4_ = fVar269 * fVar261;
            auVar82._28_4_ = auVar22._28_4_;
            auVar22 = vsubps_avx(auVar82,auVar81);
            auVar25 = vsubps_avx(auVar15,auVar208);
            fVar221 = auVar22._28_4_ + auVar358._28_4_;
            auVar321._0_4_ = auVar22._0_4_ + auVar358._0_4_ * 0.0 + auVar266._0_4_ * 0.0;
            auVar321._4_4_ = auVar22._4_4_ + auVar358._4_4_ * 0.0 + auVar266._4_4_ * 0.0;
            auVar321._8_4_ = auVar22._8_4_ + auVar358._8_4_ * 0.0 + auVar266._8_4_ * 0.0;
            auVar321._12_4_ = auVar22._12_4_ + auVar358._12_4_ * 0.0 + auVar266._12_4_ * 0.0;
            auVar321._16_4_ = auVar22._16_4_ + auVar358._16_4_ * 0.0 + auVar266._16_4_ * 0.0;
            auVar321._20_4_ = auVar22._20_4_ + auVar358._20_4_ * 0.0 + auVar266._20_4_ * 0.0;
            auVar321._24_4_ = auVar22._24_4_ + auVar358._24_4_ * 0.0 + auVar266._24_4_ * 0.0;
            auVar321._28_4_ = fVar221 + auVar266._28_4_;
            fVar326 = auVar24._0_4_;
            fVar219 = auVar24._4_4_;
            auVar83._4_4_ = auVar208._4_4_ * fVar219;
            auVar83._0_4_ = auVar208._0_4_ * fVar326;
            fVar298 = auVar24._8_4_;
            auVar83._8_4_ = auVar208._8_4_ * fVar298;
            fVar160 = auVar24._12_4_;
            auVar83._12_4_ = auVar208._12_4_ * fVar160;
            fVar188 = auVar24._16_4_;
            auVar83._16_4_ = auVar208._16_4_ * fVar188;
            fVar244 = auVar24._20_4_;
            auVar83._20_4_ = auVar208._20_4_ * fVar244;
            fVar271 = auVar24._24_4_;
            auVar83._24_4_ = auVar208._24_4_ * fVar271;
            auVar83._28_4_ = fVar221;
            fVar221 = auVar25._0_4_;
            fVar332 = auVar25._4_4_;
            auVar84._4_4_ = auVar207._4_4_ * fVar332;
            auVar84._0_4_ = auVar207._0_4_ * fVar221;
            fVar222 = auVar25._8_4_;
            auVar84._8_4_ = auVar207._8_4_ * fVar222;
            fVar162 = auVar25._12_4_;
            auVar84._12_4_ = auVar207._12_4_ * fVar162;
            fVar189 = auVar25._16_4_;
            auVar84._16_4_ = auVar207._16_4_ * fVar189;
            fVar255 = auVar25._20_4_;
            auVar84._20_4_ = auVar207._20_4_ * fVar255;
            fVar287 = auVar25._24_4_;
            auVar84._24_4_ = auVar207._24_4_ * fVar287;
            auVar84._28_4_ = auVar22._28_4_;
            auVar358 = vsubps_avx(auVar84,auVar83);
            auVar22 = vsubps_avx(auVar19,auVar16);
            fVar328 = auVar22._0_4_;
            fVar331 = auVar22._4_4_;
            auVar85._4_4_ = auVar208._4_4_ * fVar331;
            auVar85._0_4_ = auVar208._0_4_ * fVar328;
            fVar191 = auVar22._8_4_;
            auVar85._8_4_ = auVar208._8_4_ * fVar191;
            fVar164 = auVar22._12_4_;
            auVar85._12_4_ = auVar208._12_4_ * fVar164;
            fVar190 = auVar22._16_4_;
            auVar85._16_4_ = auVar208._16_4_ * fVar190;
            fVar258 = auVar22._20_4_;
            auVar85._20_4_ = auVar208._20_4_ * fVar258;
            fVar296 = auVar22._24_4_;
            auVar85._24_4_ = auVar208._24_4_ * fVar296;
            auVar85._28_4_ = auVar208._28_4_;
            auVar86._4_4_ = fVar332 * auVar16._4_4_;
            auVar86._0_4_ = fVar221 * auVar16._0_4_;
            auVar86._8_4_ = fVar222 * auVar16._8_4_;
            auVar86._12_4_ = fVar162 * auVar16._12_4_;
            auVar86._16_4_ = fVar189 * auVar16._16_4_;
            auVar86._20_4_ = fVar255 * auVar16._20_4_;
            auVar86._24_4_ = fVar287 * auVar16._24_4_;
            auVar86._28_4_ = auVar266._28_4_;
            auVar208 = vsubps_avx(auVar85,auVar86);
            auVar87._4_4_ = auVar207._4_4_ * fVar331;
            auVar87._0_4_ = auVar207._0_4_ * fVar328;
            auVar87._8_4_ = auVar207._8_4_ * fVar191;
            auVar87._12_4_ = auVar207._12_4_ * fVar164;
            auVar87._16_4_ = auVar207._16_4_ * fVar190;
            auVar87._20_4_ = auVar207._20_4_ * fVar258;
            auVar87._24_4_ = auVar207._24_4_ * fVar296;
            auVar87._28_4_ = auVar207._28_4_;
            auVar88._4_4_ = fVar219 * auVar16._4_4_;
            auVar88._0_4_ = fVar326 * auVar16._0_4_;
            auVar88._8_4_ = fVar298 * auVar16._8_4_;
            auVar88._12_4_ = fVar160 * auVar16._12_4_;
            auVar88._16_4_ = fVar188 * auVar16._16_4_;
            auVar88._20_4_ = fVar244 * auVar16._20_4_;
            auVar88._24_4_ = fVar271 * auVar16._24_4_;
            auVar88._28_4_ = auVar16._28_4_;
            auVar16 = vsubps_avx(auVar88,auVar87);
            auVar154._0_4_ = auVar358._0_4_ * 0.0 + auVar16._0_4_ + auVar208._0_4_ * 0.0;
            auVar154._4_4_ = auVar358._4_4_ * 0.0 + auVar16._4_4_ + auVar208._4_4_ * 0.0;
            auVar154._8_4_ = auVar358._8_4_ * 0.0 + auVar16._8_4_ + auVar208._8_4_ * 0.0;
            auVar154._12_4_ = auVar358._12_4_ * 0.0 + auVar16._12_4_ + auVar208._12_4_ * 0.0;
            auVar154._16_4_ = auVar358._16_4_ * 0.0 + auVar16._16_4_ + auVar208._16_4_ * 0.0;
            auVar154._20_4_ = auVar358._20_4_ * 0.0 + auVar16._20_4_ + auVar208._20_4_ * 0.0;
            auVar154._24_4_ = auVar358._24_4_ * 0.0 + auVar16._24_4_ + auVar208._24_4_ * 0.0;
            auVar154._28_4_ = auVar208._28_4_ + auVar16._28_4_ + auVar208._28_4_;
            auVar157 = ZEXT3264(auVar154);
            auVar16 = vmaxps_avx(auVar321,auVar154);
            auVar16 = vcmpps_avx(auVar16,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar207 = auVar185 & auVar16;
            if ((((((((auVar207 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar207 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar207 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar207 >> 0x7f,0) == '\0') &&
                  (auVar207 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar207 >> 0xbf,0) == '\0') &&
                (auVar207 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar207[0x1f]) {
LAB_00edbd1c:
              auVar187 = ZEXT3264(CONCAT824(uStack_648,
                                            CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
              auVar338._4_4_ = fVar159;
              auVar338._0_4_ = fVar141;
              auVar338._8_4_ = fVar161;
              auVar338._12_4_ = fVar163;
              auVar338._16_4_ = fVar165;
              auVar338._20_4_ = fVar167;
              auVar338._24_4_ = fVar169;
              auVar338._28_4_ = fVar171;
            }
            else {
              auVar207 = vandps_avx(auVar16,auVar185);
              auVar89._4_4_ = fVar332 * fVar262;
              auVar89._0_4_ = fVar221 * fVar323;
              auVar89._8_4_ = fVar222 * fVar288;
              auVar89._12_4_ = fVar162 * fVar201;
              auVar89._16_4_ = fVar189 * fVar166;
              auVar89._20_4_ = fVar255 * fVar172;
              auVar89._24_4_ = fVar287 * fVar261;
              auVar89._28_4_ = auVar185._28_4_;
              auVar90._4_4_ = fVar219 * fVar310;
              auVar90._0_4_ = fVar326 * fVar301;
              auVar90._8_4_ = fVar298 * fVar312;
              auVar90._12_4_ = fVar160 * fVar314;
              auVar90._16_4_ = fVar188 * fVar315;
              auVar90._20_4_ = fVar244 * fVar316;
              auVar90._24_4_ = fVar271 * fVar317;
              auVar90._28_4_ = auVar16._28_4_;
              auVar16 = vsubps_avx(auVar90,auVar89);
              auVar91._4_4_ = fVar331 * fVar310;
              auVar91._0_4_ = fVar328 * fVar301;
              auVar91._8_4_ = fVar191 * fVar312;
              auVar91._12_4_ = fVar164 * fVar314;
              auVar91._16_4_ = fVar190 * fVar315;
              auVar91._20_4_ = fVar258 * fVar316;
              auVar91._24_4_ = fVar296 * fVar317;
              auVar91._28_4_ = auVar303._28_4_;
              auVar92._4_4_ = fVar332 * fVar330;
              auVar92._0_4_ = fVar221 * fVar218;
              auVar92._8_4_ = fVar222 * fVar297;
              auVar92._12_4_ = fVar162 * fVar158;
              auVar92._16_4_ = fVar189 * fVar173;
              auVar92._20_4_ = fVar255 * fVar241;
              auVar92._24_4_ = fVar287 * fVar270;
              auVar92._28_4_ = auVar25._28_4_;
              auVar208 = vsubps_avx(auVar92,auVar91);
              auVar93._4_4_ = fVar219 * fVar330;
              auVar93._0_4_ = fVar326 * fVar218;
              auVar93._8_4_ = fVar298 * fVar297;
              auVar93._12_4_ = fVar160 * fVar158;
              auVar93._16_4_ = fVar188 * fVar173;
              auVar93._20_4_ = fVar244 * fVar241;
              auVar93._24_4_ = fVar271 * fVar270;
              auVar93._28_4_ = auVar232._28_4_;
              auVar94._4_4_ = fVar331 * fVar262;
              auVar94._0_4_ = fVar328 * fVar323;
              auVar94._8_4_ = fVar191 * fVar288;
              auVar94._12_4_ = fVar164 * fVar201;
              auVar94._16_4_ = fVar190 * fVar166;
              auVar94._20_4_ = fVar258 * fVar172;
              auVar94._24_4_ = fVar296 * fVar261;
              auVar94._28_4_ = auVar23._28_4_;
              auVar266 = vsubps_avx(auVar94,auVar93);
              auVar184._0_4_ = auVar16._0_4_ * 0.0 + auVar266._0_4_ + auVar208._0_4_ * 0.0;
              auVar184._4_4_ = auVar16._4_4_ * 0.0 + auVar266._4_4_ + auVar208._4_4_ * 0.0;
              auVar184._8_4_ = auVar16._8_4_ * 0.0 + auVar266._8_4_ + auVar208._8_4_ * 0.0;
              auVar184._12_4_ = auVar16._12_4_ * 0.0 + auVar266._12_4_ + auVar208._12_4_ * 0.0;
              auVar184._16_4_ = auVar16._16_4_ * 0.0 + auVar266._16_4_ + auVar208._16_4_ * 0.0;
              auVar184._20_4_ = auVar16._20_4_ * 0.0 + auVar266._20_4_ + auVar208._20_4_ * 0.0;
              auVar184._24_4_ = auVar16._24_4_ * 0.0 + auVar266._24_4_ + auVar208._24_4_ * 0.0;
              auVar184._28_4_ = auVar23._28_4_ + auVar266._28_4_ + auVar232._28_4_;
              auVar185 = vrcpps_avx(auVar184);
              fVar323 = auVar185._0_4_;
              fVar218 = auVar185._4_4_;
              auVar95._4_4_ = auVar184._4_4_ * fVar218;
              auVar95._0_4_ = auVar184._0_4_ * fVar323;
              fVar326 = auVar185._8_4_;
              auVar95._8_4_ = auVar184._8_4_ * fVar326;
              fVar221 = auVar185._12_4_;
              auVar95._12_4_ = auVar184._12_4_ * fVar221;
              fVar328 = auVar185._16_4_;
              auVar95._16_4_ = auVar184._16_4_ * fVar328;
              fVar262 = auVar185._20_4_;
              auVar95._20_4_ = auVar184._20_4_ * fVar262;
              fVar330 = auVar185._24_4_;
              auVar95._24_4_ = auVar184._24_4_ * fVar330;
              auVar95._28_4_ = auVar25._28_4_;
              auVar337._8_4_ = 0x3f800000;
              auVar337._0_8_ = &DAT_3f8000003f800000;
              auVar337._12_4_ = 0x3f800000;
              auVar337._16_4_ = 0x3f800000;
              auVar337._20_4_ = 0x3f800000;
              auVar337._24_4_ = 0x3f800000;
              auVar337._28_4_ = 0x3f800000;
              auVar185 = vsubps_avx(auVar337,auVar95);
              fVar323 = auVar185._0_4_ * fVar323 + fVar323;
              fVar218 = auVar185._4_4_ * fVar218 + fVar218;
              fVar326 = auVar185._8_4_ * fVar326 + fVar326;
              fVar221 = auVar185._12_4_ * fVar221 + fVar221;
              fVar328 = auVar185._16_4_ * fVar328 + fVar328;
              fVar262 = auVar185._20_4_ * fVar262 + fVar262;
              fVar330 = auVar185._24_4_ * fVar330 + fVar330;
              auVar96._4_4_ =
                   (fVar327 * auVar16._4_4_ + auVar208._4_4_ * fVar329 + auVar266._4_4_ * fVar281) *
                   fVar218;
              auVar96._0_4_ =
                   (fVar325 * auVar16._0_4_ + auVar208._0_4_ * fVar215 + auVar266._0_4_ * fVar274) *
                   fVar323;
              auVar96._8_4_ =
                   (fVar299 * auVar16._8_4_ + auVar208._8_4_ * fVar220 + auVar266._8_4_ * fVar282) *
                   fVar326;
              auVar96._12_4_ =
                   (fVar140 * auVar16._12_4_ + auVar208._12_4_ * fVar272 + auVar266._12_4_ * fVar283
                   ) * fVar221;
              auVar96._16_4_ =
                   (fVar170 * auVar16._16_4_ + auVar208._16_4_ * fVar168 + auVar266._16_4_ * fVar284
                   ) * fVar328;
              auVar96._20_4_ =
                   (fVar239 * auVar16._20_4_ + auVar208._20_4_ * fVar273 + auVar266._20_4_ * fVar285
                   ) * fVar262;
              auVar96._24_4_ =
                   (fVar269 * auVar16._24_4_ + auVar208._24_4_ * fVar263 + auVar266._24_4_ * fVar286
                   ) * fVar330;
              auVar96._28_4_ = auVar19._28_4_ + auVar26._28_4_ + auVar15._28_4_;
              auVar213 = ZEXT3264(auVar96);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar236._4_4_ = uVar8;
              auVar236._0_4_ = uVar8;
              auVar236._8_4_ = uVar8;
              auVar236._12_4_ = uVar8;
              auVar236._16_4_ = uVar8;
              auVar236._20_4_ = uVar8;
              auVar236._24_4_ = uVar8;
              auVar236._28_4_ = uVar8;
              auVar185 = vcmpps_avx(local_100,auVar96,2);
              auVar19 = vcmpps_avx(auVar96,auVar236,2);
              auVar185 = vandps_avx(auVar185,auVar19);
              auVar26 = auVar207 & auVar185;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar26 >> 0x7f,0) == '\0') &&
                    (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0xbf,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar26[0x1f]) goto LAB_00edbd1c;
              auVar185 = vandps_avx(auVar207,auVar185);
              auVar26 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar184,4);
              auVar15 = auVar185 & auVar26;
              auVar187 = ZEXT3264(CONCAT824(uStack_648,
                                            CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
              auVar338._4_4_ = fVar159;
              auVar338._0_4_ = fVar141;
              auVar338._8_4_ = fVar161;
              auVar338._12_4_ = fVar163;
              auVar338._16_4_ = fVar165;
              auVar338._20_4_ = fVar167;
              auVar338._24_4_ = fVar169;
              auVar338._28_4_ = fVar171;
              if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar15 >> 0x7f,0) != '\0') ||
                    (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0xbf,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar15[0x1f] < '\0') {
                auVar185 = vandps_avx(auVar26,auVar185);
                auVar187 = ZEXT3264(auVar185);
                auVar97._4_4_ = fVar218 * auVar321._4_4_;
                auVar97._0_4_ = fVar323 * auVar321._0_4_;
                auVar97._8_4_ = fVar326 * auVar321._8_4_;
                auVar97._12_4_ = fVar221 * auVar321._12_4_;
                auVar97._16_4_ = fVar328 * auVar321._16_4_;
                auVar97._20_4_ = fVar262 * auVar321._20_4_;
                auVar97._24_4_ = fVar330 * auVar321._24_4_;
                auVar97._28_4_ = auVar19._28_4_;
                auVar98._4_4_ = auVar154._4_4_ * fVar218;
                auVar98._0_4_ = auVar154._0_4_ * fVar323;
                auVar98._8_4_ = auVar154._8_4_ * fVar326;
                auVar98._12_4_ = auVar154._12_4_ * fVar221;
                auVar98._16_4_ = auVar154._16_4_ * fVar328;
                auVar98._20_4_ = auVar154._20_4_ * fVar262;
                auVar98._24_4_ = auVar154._24_4_ * fVar330;
                auVar98._28_4_ = auVar154._28_4_;
                auVar268._8_4_ = 0x3f800000;
                auVar268._0_8_ = &DAT_3f8000003f800000;
                auVar268._12_4_ = 0x3f800000;
                auVar268._16_4_ = 0x3f800000;
                auVar268._20_4_ = 0x3f800000;
                auVar268._24_4_ = 0x3f800000;
                auVar268._28_4_ = 0x3f800000;
                auVar185 = vsubps_avx(auVar268,auVar97);
                local_380 = vblendvps_avx(auVar185,auVar97,auVar324);
                auVar185 = vsubps_avx(auVar268,auVar98);
                _local_560 = vblendvps_avx(auVar185,auVar98,auVar324);
                auVar157 = ZEXT3264(_local_560);
                local_3a0 = auVar96;
              }
            }
            auVar185 = auVar187._0_32_;
            auVar322 = ZEXT3264(local_720);
            local_5e0 = auVar20;
            if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar185 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar185 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar185 >> 0x7f,0) != '\0') ||
                  (auVar187 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar185 >> 0xbf,0) != '\0') ||
                (auVar187 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar187[0x1f] < '\0') {
              auVar19 = vsubps_avx(auVar280,auVar338);
              auVar213 = ZEXT3264(local_380);
              fVar215 = auVar338._0_4_ + auVar19._0_4_ * local_380._0_4_;
              fVar325 = auVar338._4_4_ + auVar19._4_4_ * local_380._4_4_;
              fVar218 = auVar338._8_4_ + auVar19._8_4_ * local_380._8_4_;
              fVar326 = auVar338._12_4_ + auVar19._12_4_ * local_380._12_4_;
              fVar221 = auVar338._16_4_ + auVar19._16_4_ * local_380._16_4_;
              fVar328 = auVar338._20_4_ + auVar19._20_4_ * local_380._20_4_;
              fVar262 = auVar338._24_4_ + auVar19._24_4_ * local_380._24_4_;
              fVar329 = auVar338._28_4_ + auVar19._28_4_;
              fVar323 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar99._4_4_ = (fVar325 + fVar325) * fVar323;
              auVar99._0_4_ = (fVar215 + fVar215) * fVar323;
              auVar99._8_4_ = (fVar218 + fVar218) * fVar323;
              auVar99._12_4_ = (fVar326 + fVar326) * fVar323;
              auVar99._16_4_ = (fVar221 + fVar221) * fVar323;
              auVar99._20_4_ = (fVar328 + fVar328) * fVar323;
              auVar99._24_4_ = (fVar262 + fVar262) * fVar323;
              auVar99._28_4_ = fVar329 + fVar329;
              auVar19 = vcmpps_avx(local_3a0,auVar99,6);
              auVar157 = ZEXT3264(auVar19);
              auVar20 = auVar185 & auVar19;
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0x7f,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0xbf,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar20[0x1f] < '\0') {
                local_420 = vandps_avx(auVar19,auVar185);
                auVar157 = ZEXT3264(local_420);
                auVar177._0_8_ =
                     CONCAT44((float)local_560._4_4_ + (float)local_560._4_4_ + -1.0,
                              (float)local_560._0_4_ + (float)local_560._0_4_ + -1.0);
                auVar177._8_4_ = (float)uStack_558 + (float)uStack_558 + -1.0;
                auVar177._12_4_ = uStack_558._4_4_ + uStack_558._4_4_ + -1.0;
                auVar179._16_4_ = (float)uStack_550 + (float)uStack_550 + -1.0;
                auVar179._0_16_ = auVar177;
                auVar179._20_4_ = uStack_550._4_4_ + uStack_550._4_4_ + -1.0;
                fStack_4a8 = (float)uStack_548 + (float)uStack_548 + -1.0;
                _local_4c0 = auVar179;
                fStack_4a4 = uStack_548._4_4_ + uStack_548._4_4_ + -1.0;
                auVar187 = ZEXT3264(_local_4c0);
                local_4e0 = local_380;
                local_4a0 = local_3a0;
                local_460 = local_670._0_8_;
                uStack_458 = local_670._8_8_;
                local_450 = local_5f0._0_8_;
                uStack_448 = local_5f0._8_8_;
                local_440 = local_600._0_8_;
                uStack_438 = local_600._8_8_;
                pGVar12 = (context->scene->geometries).items[uVar135].ptr;
                _local_560 = _local_4c0;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar136 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar136 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar178._0_4_ = (float)(int)local_480;
                  auVar178._4_8_ = SUB128(ZEXT812(0),4);
                  auVar178._12_4_ = 0;
                  auVar230 = vshufps_avx(auVar178,auVar178,0);
                  local_400[0] = (auVar230._0_4_ + local_380._0_4_ + 0.0) * (float)local_160._0_4_;
                  local_400[1] = (auVar230._4_4_ + local_380._4_4_ + 1.0) * (float)local_160._4_4_;
                  local_400[2] = (auVar230._8_4_ + local_380._8_4_ + 2.0) * fStack_158;
                  local_400[3] = (auVar230._12_4_ + local_380._12_4_ + 3.0) * fStack_154;
                  fStack_3f0 = (auVar230._0_4_ + local_380._16_4_ + 4.0) * fStack_150;
                  fStack_3ec = (auVar230._4_4_ + local_380._20_4_ + 5.0) * fStack_14c;
                  fStack_3e8 = (auVar230._8_4_ + local_380._24_4_ + 6.0) * fStack_148;
                  fStack_3e4 = auVar230._12_4_ + (float)local_380._28_4_ + 7.0;
                  uStack_558 = auVar177._8_8_;
                  uStack_550 = auVar179._16_8_;
                  uStack_548 = local_4c0._24_8_;
                  local_3e0 = auVar177._0_8_;
                  uStack_3d8 = uStack_558;
                  uStack_3d0 = uStack_550;
                  uStack_3c8 = uStack_548;
                  auVar187 = ZEXT3264(local_3a0);
                  local_3c0 = local_3a0;
                  iVar131 = vmovmskps_avx(local_420);
                  local_920 = CONCAT44((int)((ulong)context->args >> 0x20),iVar131);
                  lVar14 = 0;
                  if (local_920 != 0) {
                    for (; (local_920 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                    }
                  }
                  local_8e0 = (uint)lVar14;
                  uStack_8dc = (undefined4)((ulong)lVar14 >> 0x20);
                  local_740._0_4_ = (int)CONCAT71((int7)(local_920 >> 8),iVar131 != 0);
                  if (iVar131 != 0) {
                    _auStack_6b0 = auVar21._16_16_;
                    _local_6c0 = local_670;
                    auVar230 = *local_780;
                    uVar104 = *local_788;
                    uVar105 = local_788[1];
                    local_47c = uVar11;
                    local_470 = uVar128;
                    uStack_468 = uVar129;
                    do {
                      uVar133 = *(uint *)(ray + k * 4 + 0x100);
                      lVar14 = CONCAT44(uStack_8dc,local_8e0);
                      local_220 = local_400[lVar14];
                      local_200 = *(undefined4 *)((long)&local_3e0 + lVar14 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + lVar14 * 4)
                      ;
                      fVar253 = 1.0 - local_220;
                      fVar237 = local_220 * fVar253 + local_220 * fVar253;
                      auVar231 = ZEXT416((uint)(local_220 * local_220 * 3.0));
                      auVar231 = vshufps_avx(auVar231,auVar231,0);
                      local_900._0_4_ = auVar17._0_4_;
                      local_900._4_4_ = auVar17._4_4_;
                      fStack_8f8 = auVar17._8_4_;
                      fStack_8f4 = auVar17._12_4_;
                      auVar248 = ZEXT416((uint)((fVar237 - local_220 * local_220) * 3.0));
                      auVar248 = vshufps_avx(auVar248,auVar248,0);
                      local_7e0._0_4_ = auVar18._0_4_;
                      local_7e0._4_4_ = auVar18._4_4_;
                      fStack_7d8 = auVar18._8_4_;
                      fStack_7d4 = auVar18._12_4_;
                      auVar206 = ZEXT416((uint)((fVar253 * fVar253 - fVar237) * 3.0));
                      auVar206 = vshufps_avx(auVar206,auVar206,0);
                      local_770.context = context->user;
                      auVar143 = ZEXT416((uint)(fVar253 * fVar253 * -3.0));
                      auVar143 = vshufps_avx(auVar143,auVar143,0);
                      auVar196._0_4_ =
                           auVar143._0_4_ * local_970 +
                           auVar206._0_4_ * (float)local_6c0._0_4_ +
                           auVar231._0_4_ * (float)local_900._0_4_ +
                           auVar248._0_4_ * (float)local_7e0._0_4_;
                      auVar196._4_4_ =
                           auVar143._4_4_ * fStack_96c +
                           auVar206._4_4_ * (float)local_6c0._4_4_ +
                           auVar231._4_4_ * (float)local_900._4_4_ +
                           auVar248._4_4_ * (float)local_7e0._4_4_;
                      auVar196._8_4_ =
                           auVar143._8_4_ * fStack_968 +
                           auVar206._8_4_ * (float)uStack_6b8 +
                           auVar231._8_4_ * fStack_8f8 + auVar248._8_4_ * fStack_7d8;
                      auVar196._12_4_ =
                           auVar143._12_4_ * fStack_964 +
                           auVar206._12_4_ * uStack_6b8._4_4_ +
                           auVar231._12_4_ * fStack_8f4 + auVar248._12_4_ * fStack_7d4;
                      local_270 = vshufps_avx(auVar196,auVar196,0);
                      local_280[0] = (RTCHitN)local_270[0];
                      local_280[1] = (RTCHitN)local_270[1];
                      local_280[2] = (RTCHitN)local_270[2];
                      local_280[3] = (RTCHitN)local_270[3];
                      local_280[4] = (RTCHitN)local_270[4];
                      local_280[5] = (RTCHitN)local_270[5];
                      local_280[6] = (RTCHitN)local_270[6];
                      local_280[7] = (RTCHitN)local_270[7];
                      local_280[8] = (RTCHitN)local_270[8];
                      local_280[9] = (RTCHitN)local_270[9];
                      local_280[10] = (RTCHitN)local_270[10];
                      local_280[0xb] = (RTCHitN)local_270[0xb];
                      local_280[0xc] = (RTCHitN)local_270[0xc];
                      local_280[0xd] = (RTCHitN)local_270[0xd];
                      local_280[0xe] = (RTCHitN)local_270[0xe];
                      local_280[0xf] = (RTCHitN)local_270[0xf];
                      local_250 = vshufps_avx(auVar196,auVar196,0x55);
                      auVar213 = ZEXT1664(local_250);
                      local_260 = local_250;
                      local_230 = vshufps_avx(auVar196,auVar196,0xaa);
                      local_240 = local_230;
                      fStack_21c = local_220;
                      fStack_218 = local_220;
                      fStack_214 = local_220;
                      fStack_210 = local_220;
                      fStack_20c = local_220;
                      fStack_208 = local_220;
                      fStack_204 = local_220;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_140._0_8_;
                      uStack_1d8 = local_140._8_8_;
                      uStack_1d0 = local_140._16_8_;
                      uStack_1c8 = local_140._24_8_;
                      local_1c0 = local_120._0_8_;
                      uStack_1b8 = local_120._8_8_;
                      uStack_1b0 = local_120._16_8_;
                      uStack_1a8 = local_120._24_8_;
                      auVar185 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                      local_778[1] = auVar185;
                      *local_778 = auVar185;
                      local_1a0 = (local_770.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_770.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_800 = auVar230._0_8_;
                      uStack_7f8 = auVar230._8_8_;
                      local_7c0 = local_800;
                      uStack_7b8 = uStack_7f8;
                      local_770.valid = (int *)&local_7c0;
                      local_770.geometryUserPtr = pGVar12->userPtr;
                      local_770.hit = local_280;
                      local_770.N = 8;
                      uStack_7b0 = uVar104;
                      uStack_7a8 = uVar105;
                      local_770.ray = (RTCRayN *)ray;
                      if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar213 = ZEXT1664(local_250);
                        (*pGVar12->occlusionFilterN)(&local_770);
                      }
                      auVar111._8_8_ = uStack_7b8;
                      auVar111._0_8_ = local_7c0;
                      auVar231 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar111);
                      auVar115._8_8_ = uStack_7a8;
                      auVar115._0_8_ = uStack_7b0;
                      auVar248 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar115);
                      auVar187 = ZEXT1664(auVar248);
                      auVar155._16_16_ = auVar248;
                      auVar155._0_16_ = auVar231;
                      auVar21 = auVar185 & ~auVar155;
                      local_960 = auVar185._0_4_;
                      fStack_95c = auVar185._4_4_;
                      fStack_958 = auVar185._8_4_;
                      fStack_954 = auVar185._12_4_;
                      fStack_950 = auVar185._16_4_;
                      fStack_94c = auVar185._20_4_;
                      fStack_948 = auVar185._24_4_;
                      fStack_944 = auVar185._28_4_;
                      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar21 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar21 >> 0x7f,0) == '\0') &&
                            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar21 >> 0xbf,0) == '\0') &&
                          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar21[0x1f]) {
                        auVar156._0_4_ = auVar231._0_4_ ^ (uint)local_960;
                        auVar156._4_4_ = auVar231._4_4_ ^ (uint)fStack_95c;
                        auVar156._8_4_ = auVar231._8_4_ ^ (uint)fStack_958;
                        auVar156._12_4_ = auVar231._12_4_ ^ (uint)fStack_954;
                        auVar156._16_4_ = auVar248._0_4_ ^ (uint)fStack_950;
                        auVar156._20_4_ = auVar248._4_4_ ^ (uint)fStack_94c;
                        auVar156._24_4_ = auVar248._8_4_ ^ (uint)fStack_948;
                        auVar156._28_4_ = auVar248._12_4_ ^ (uint)fStack_944;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          (*p_Var13)(&local_770);
                        }
                        auVar112._8_8_ = uStack_7b8;
                        auVar112._0_8_ = local_7c0;
                        auVar231 = vpcmpeqd_avx((undefined1  [16])0x0,auVar112);
                        auVar116._8_8_ = uStack_7a8;
                        auVar116._0_8_ = uStack_7b0;
                        auVar248 = vpcmpeqd_avx((undefined1  [16])0x0,auVar116);
                        auVar186._16_16_ = auVar248;
                        auVar186._0_16_ = auVar231;
                        auVar156._0_4_ = auVar231._0_4_ ^ (uint)local_960;
                        auVar156._4_4_ = auVar231._4_4_ ^ (uint)fStack_95c;
                        auVar156._8_4_ = auVar231._8_4_ ^ (uint)fStack_958;
                        auVar156._12_4_ = auVar231._12_4_ ^ (uint)fStack_954;
                        auVar156._16_4_ = auVar248._0_4_ ^ (uint)fStack_950;
                        auVar156._20_4_ = auVar248._4_4_ ^ (uint)fStack_94c;
                        auVar156._24_4_ = auVar248._8_4_ ^ (uint)fStack_948;
                        auVar156._28_4_ = auVar248._12_4_ ^ (uint)fStack_944;
                        auVar200._8_4_ = 0xff800000;
                        auVar200._0_8_ = 0xff800000ff800000;
                        auVar200._12_4_ = 0xff800000;
                        auVar200._16_4_ = 0xff800000;
                        auVar200._20_4_ = 0xff800000;
                        auVar200._24_4_ = 0xff800000;
                        auVar200._28_4_ = 0xff800000;
                        auVar185 = vblendvps_avx(auVar200,*(undefined1 (*) [32])
                                                           (local_770.ray + 0x100),auVar186);
                        auVar187 = ZEXT3264(auVar185);
                        *(undefined1 (*) [32])(local_770.ray + 0x100) = auVar185;
                      }
                      auVar157 = ZEXT3264(auVar156);
                      if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar156 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar156 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar156 >> 0x7f,0) != '\0') ||
                            (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar156 >> 0xbf,0) != '\0') ||
                          (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar156[0x1f] < '\0') break;
                      auVar157 = ZEXT464(uVar133);
                      *(uint *)(ray + k * 4 + 0x100) = uVar133;
                      local_920 = local_920 ^ 1L << ((ulong)local_8e0 & 0x3f);
                      lVar14 = 0;
                      if (local_920 != 0) {
                        for (; (local_920 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                        }
                      }
                      local_8e0 = (uint)lVar14;
                      uStack_8dc = (undefined4)((ulong)lVar14 >> 0x20);
                      local_740._0_4_ = (int)CONCAT71((int7)(local_920 >> 8),local_920 != 0);
                    } while (local_920 != 0);
                  }
                  bVar136 = local_740[0] & 1;
                  auVar322 = ZEXT3264(local_720);
                }
                bVar130 = (bool)(bVar130 | bVar136);
                fVar237 = (float)local_6a0._0_4_;
                fVar253 = (float)local_6a0._4_4_;
                fVar216 = fStack_698;
                fVar238 = fStack_694;
                fVar256 = fStack_690;
                fVar217 = fStack_68c;
                fVar240 = fStack_688;
                fVar259 = fStack_684;
              }
            }
          }
          lVar137 = lVar137 + 8;
        } while ((int)lVar137 < (int)uVar11);
      }
      if (bVar130 != false) {
        return bVar139;
      }
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar145._4_4_ = uVar8;
      auVar145._0_4_ = uVar8;
      auVar145._8_4_ = uVar8;
      auVar145._12_4_ = uVar8;
      auVar230 = vcmpps_avx(local_4f0,auVar145,2);
      uVar133 = vmovmskps_avx(auVar230);
      uVar133 = (uint)uVar138 & uVar133;
      bVar139 = uVar133 != 0;
    } while (bVar139);
  }
  return bVar139;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }